

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [12];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  uint uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  uint uVar109;
  long lVar110;
  long lVar111;
  undefined4 uVar112;
  undefined8 unaff_R13;
  uint uVar113;
  uint uVar114;
  bool bVar115;
  __m128 a;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar122 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar125 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar144;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar160 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar174;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar180 [16];
  float fVar178;
  float fVar179;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar196;
  float fVar200;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar186 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar201;
  float fVar222;
  float fVar223;
  undefined1 auVar202 [16];
  float fVar224;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar228;
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar243 [32];
  float fVar252;
  float fVar254;
  float fVar256;
  float fVar258;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar257;
  undefined1 auVar240 [28];
  float fVar250;
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar249 [64];
  float fVar259;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar260;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [28];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar282;
  float fVar296;
  undefined1 auVar284 [16];
  float fVar283;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar287 [28];
  float fVar292;
  float fVar294;
  float fVar298;
  float fVar300;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar304;
  float fVar305;
  undefined1 auVar306 [28];
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar330 [32];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  float s;
  float fVar365;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float fVar335;
  float fVar344;
  float fVar345;
  undefined1 auVar336 [16];
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar346;
  float fVar350;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar351;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [64];
  float fVar369;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar384;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  undefined1 auVar388 [16];
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar398;
  float fVar401;
  float fVar407;
  float fVar410;
  float fVar413;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  float fVar399;
  float fVar400;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar411;
  float fVar412;
  float fVar414;
  float fVar415;
  float fVar416;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float fVar417;
  undefined1 auVar418 [16];
  float fVar425;
  float fVar426;
  float fVar428;
  float fVar429;
  float fVar430;
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  float fVar427;
  undefined1 auVar423 [32];
  undefined1 auVar431 [16];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  float fVar435;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  undefined1 auVar436 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_cc8;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 (*local_ab0) [16];
  ulong local_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 auStack_a70 [16];
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 auStack_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  RTCHitN local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 local_760 [16];
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  undefined1 auStack_740 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar397 [64];
  undefined1 auVar424 [64];
  
  PVar18 = prim[1];
  uVar106 = (ulong)(byte)PVar18;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 6)));
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 10)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 10)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 6)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 10)));
  lVar110 = uVar106 * 0x25;
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xf + 6)));
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xf + 10)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x11 + 6)));
  _local_960 = ZEXT1632(auVar34);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x11 + 10)));
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar36 = vsubps_avx(auVar29,*(undefined1 (*) [16])(prim + lVar110 + 6));
  fVar8 = *(float *)(prim + lVar110 + 0x12);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1a + 6)));
  auVar336._0_4_ = fVar8 * auVar30._0_4_;
  auVar336._4_4_ = fVar8 * auVar30._4_4_;
  auVar336._8_4_ = fVar8 * auVar30._8_4_;
  auVar336._12_4_ = fVar8 * auVar30._12_4_;
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1a + 10)));
  auVar389._16_16_ = auVar147;
  auVar389._0_16_ = auVar31;
  auVar126._16_16_ = auVar202;
  auVar126._0_16_ = auVar209;
  auVar241._16_16_ = auVar119;
  auVar241._0_16_ = auVar206;
  auVar354._16_16_ = auVar149;
  auVar354._0_16_ = auVar148;
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1b + 6)));
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1b + 10)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1c + 6)));
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x1c + 10)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar273 = vcvtdq2ps_avx(auVar241);
  auVar127._16_16_ = auVar33;
  auVar127._0_16_ = auVar32;
  _local_980 = vcvtdq2ps_avx(auVar127);
  auVar242._16_16_ = auVar121;
  auVar242._0_16_ = auVar34;
  auVar25 = vcvtdq2ps_avx(auVar242);
  auVar419._16_16_ = auVar30;
  auVar419._0_16_ = auVar29;
  auVar288._16_16_ = auVar147;
  auVar288._0_16_ = auVar31;
  auVar432._16_16_ = auVar202;
  auVar432._0_16_ = auVar209;
  auVar29 = vshufps_avx(auVar336,auVar336,0x55);
  auVar30 = vshufps_avx(auVar336,auVar336,0xaa);
  fVar201 = auVar30._0_4_;
  fVar144 = auVar30._4_4_;
  fVar174 = auVar30._8_4_;
  fVar222 = auVar30._12_4_;
  fVar224 = auVar29._0_4_;
  fVar228 = auVar29._4_4_;
  fVar225 = auVar29._8_4_;
  fVar226 = auVar29._12_4_;
  fVar177 = auVar121._12_4_ + 0.0;
  auVar202 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar110 + 0x16)) *
                           *(float *)(prim + lVar110 + 0x1a)));
  _local_a80 = ZEXT1632(auVar202);
  auVar360 = vcvtdq2ps_avx(auVar389);
  auVar26 = vcvtdq2ps_avx(auVar354);
  auVar27 = vcvtdq2ps_avx(auVar419);
  auVar373 = vcvtdq2ps_avx(auVar288);
  auVar28 = vcvtdq2ps_avx(auVar432);
  auVar29 = vshufps_avx(auVar336,auVar336,0);
  fVar179 = auVar29._0_4_;
  fVar223 = auVar29._4_4_;
  fVar175 = auVar29._8_4_;
  fVar176 = auVar29._12_4_;
  auVar390._0_4_ = fVar179 * auVar360._0_4_ + fVar224 * auVar126._0_4_ + fVar201 * auVar273._0_4_;
  auVar390._4_4_ = fVar223 * auVar360._4_4_ + fVar228 * auVar126._4_4_ + fVar144 * auVar273._4_4_;
  auVar390._8_4_ = fVar175 * auVar360._8_4_ + fVar225 * auVar126._8_4_ + fVar174 * auVar273._8_4_;
  auVar390._12_4_ =
       fVar176 * auVar360._12_4_ + fVar226 * auVar126._12_4_ + fVar222 * auVar273._12_4_;
  auVar390._16_4_ =
       fVar179 * auVar360._16_4_ + fVar224 * auVar126._16_4_ + fVar201 * auVar273._16_4_;
  auVar390._20_4_ =
       fVar223 * auVar360._20_4_ + fVar228 * auVar126._20_4_ + fVar144 * auVar273._20_4_;
  auVar390._24_4_ =
       fVar175 * auVar360._24_4_ + fVar225 * auVar126._24_4_ + fVar174 * auVar273._24_4_;
  auVar390._28_4_ = fVar177 + 0.0;
  auVar355._0_4_ = fVar179 * auVar26._0_4_ + fVar224 * local_980._0_4_ + auVar25._0_4_ * fVar201;
  auVar355._4_4_ = fVar223 * auVar26._4_4_ + fVar228 * local_980._4_4_ + auVar25._4_4_ * fVar144;
  auVar355._8_4_ = fVar175 * auVar26._8_4_ + fVar225 * local_980._8_4_ + auVar25._8_4_ * fVar174;
  auVar355._12_4_ = fVar176 * auVar26._12_4_ + fVar226 * local_980._12_4_ + auVar25._12_4_ * fVar222
  ;
  auVar355._16_4_ = fVar179 * auVar26._16_4_ + fVar224 * local_980._16_4_ + auVar25._16_4_ * fVar201
  ;
  auVar355._20_4_ = fVar223 * auVar26._20_4_ + fVar228 * local_980._20_4_ + auVar25._20_4_ * fVar144
  ;
  auVar355._24_4_ = fVar175 * auVar26._24_4_ + fVar225 * local_980._24_4_ + auVar25._24_4_ * fVar174
  ;
  auVar355._28_4_ = fVar177 + auVar121._12_4_ + 0.0;
  auVar289._0_4_ = fVar179 * auVar27._0_4_ + fVar224 * auVar373._0_4_ + auVar28._0_4_ * fVar201;
  auVar289._4_4_ = fVar223 * auVar27._4_4_ + fVar228 * auVar373._4_4_ + auVar28._4_4_ * fVar144;
  auVar289._8_4_ = fVar175 * auVar27._8_4_ + fVar225 * auVar373._8_4_ + auVar28._8_4_ * fVar174;
  auVar289._12_4_ = fVar176 * auVar27._12_4_ + fVar226 * auVar373._12_4_ + auVar28._12_4_ * fVar222;
  auVar289._16_4_ = fVar179 * auVar27._16_4_ + fVar224 * auVar373._16_4_ + auVar28._16_4_ * fVar201;
  auVar289._20_4_ = fVar223 * auVar27._20_4_ + fVar228 * auVar373._20_4_ + auVar28._20_4_ * fVar144;
  auVar289._24_4_ = fVar175 * auVar27._24_4_ + fVar225 * auVar373._24_4_ + auVar28._24_4_ * fVar174;
  auVar289._28_4_ = fVar177 + fVar222 + 0.0;
  auVar99._4_4_ = fVar8 * auVar36._4_4_;
  auVar99._0_4_ = fVar8 * auVar36._0_4_;
  auVar99._8_4_ = fVar8 * auVar36._8_4_;
  auVar99._12_4_ = fVar8 * auVar36._12_4_;
  auVar29 = vshufps_avx(auVar99,auVar99,0x55);
  auVar30 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar253 = auVar30._0_4_;
  fVar255 = auVar30._4_4_;
  fVar257 = auVar30._8_4_;
  fVar260 = auVar30._12_4_;
  fVar8 = auVar29._0_4_;
  fVar174 = auVar29._4_4_;
  fVar179 = auVar29._8_4_;
  fVar176 = auVar29._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar106 * 7 + 6);
  auVar29 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar106 * 7 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar106 * 0xb + 0xe);
  auVar147 = vpmovsxwd_avx(auVar147);
  auVar209 = vshufps_avx(auVar99,auVar99,0);
  fVar384 = auVar209._0_4_;
  fVar385 = auVar209._4_4_;
  fVar398 = auVar209._8_4_;
  fVar325 = auVar209._12_4_;
  auVar161._0_4_ = fVar384 * auVar360._0_4_ + auVar126._0_4_ * fVar8 + fVar253 * auVar273._0_4_;
  auVar161._4_4_ = fVar385 * auVar360._4_4_ + auVar126._4_4_ * fVar174 + fVar255 * auVar273._4_4_;
  auVar161._8_4_ = fVar398 * auVar360._8_4_ + auVar126._8_4_ * fVar179 + fVar257 * auVar273._8_4_;
  auVar161._12_4_ =
       fVar325 * auVar360._12_4_ + auVar126._12_4_ * fVar176 + fVar260 * auVar273._12_4_;
  auVar161._16_4_ = fVar384 * auVar360._16_4_ + auVar126._16_4_ * fVar8 + fVar253 * auVar273._16_4_;
  auVar161._20_4_ =
       fVar385 * auVar360._20_4_ + auVar126._20_4_ * fVar174 + fVar255 * auVar273._20_4_;
  auVar161._24_4_ =
       fVar398 * auVar360._24_4_ + auVar126._24_4_ * fVar179 + fVar257 * auVar273._24_4_;
  auVar161._28_4_ = fVar176 + auVar273._28_4_ + 0.0;
  fStack_a50 = fVar8 * local_980._16_4_ + auVar25._16_4_ * fVar253 + fVar384 * auVar26._16_4_;
  fStack_a4c = fVar174 * local_980._20_4_ + auVar25._20_4_ * fVar255 + fVar385 * auVar26._20_4_;
  fStack_a48 = fVar179 * local_980._24_4_ + auVar25._24_4_ * fVar257 + fVar398 * auVar26._24_4_;
  fStack_a44 = auVar126._28_4_ + auVar25._28_4_ + fVar176;
  auVar326._8_4_ = 0x7fffffff;
  auVar326._0_8_ = 0x7fffffff7fffffff;
  auVar326._12_4_ = 0x7fffffff;
  auVar326._16_4_ = 0x7fffffff;
  auVar326._20_4_ = 0x7fffffff;
  auVar326._24_4_ = 0x7fffffff;
  auVar326._28_4_ = 0x7fffffff;
  auVar128._8_4_ = 0x219392ef;
  auVar128._0_8_ = 0x219392ef219392ef;
  auVar128._12_4_ = 0x219392ef;
  auVar128._16_4_ = 0x219392ef;
  auVar128._20_4_ = 0x219392ef;
  auVar128._24_4_ = 0x219392ef;
  auVar128._28_4_ = 0x219392ef;
  auVar126 = vandps_avx(auVar390,auVar326);
  auVar126 = vcmpps_avx(auVar126,auVar128,1);
  auVar273 = vblendvps_avx(auVar390,auVar128,auVar126);
  auVar126 = vandps_avx(auVar355,auVar326);
  auVar126 = vcmpps_avx(auVar126,auVar128,1);
  auVar360 = vblendvps_avx(auVar355,auVar128,auVar126);
  auVar126 = vandps_avx(auVar326,auVar289);
  auVar24 = vcmpps_avx(auVar126,auVar128,1);
  auVar126 = vblendvps_avx(auVar289,auVar128,auVar24);
  auVar35 = vrcpps_avx(auVar273);
  auVar187._0_4_ = auVar373._0_4_ * fVar8 + auVar28._0_4_ * fVar253 + fVar384 * auVar27._0_4_;
  auVar187._4_4_ = auVar373._4_4_ * fVar174 + auVar28._4_4_ * fVar255 + fVar385 * auVar27._4_4_;
  auVar187._8_4_ = auVar373._8_4_ * fVar179 + auVar28._8_4_ * fVar257 + fVar398 * auVar27._8_4_;
  auVar187._12_4_ = auVar373._12_4_ * fVar176 + auVar28._12_4_ * fVar260 + fVar325 * auVar27._12_4_;
  auVar187._16_4_ = auVar373._16_4_ * fVar8 + auVar28._16_4_ * fVar253 + fVar384 * auVar27._16_4_;
  auVar187._20_4_ = auVar373._20_4_ * fVar174 + auVar28._20_4_ * fVar255 + fVar385 * auVar27._20_4_;
  auVar187._24_4_ = auVar373._24_4_ * fVar179 + auVar28._24_4_ * fVar257 + fVar398 * auVar27._24_4_;
  auVar187._28_4_ = fVar176 + fVar260 + auVar24._28_4_;
  fVar201 = auVar35._0_4_;
  fVar222 = auVar35._4_4_;
  auVar24._4_4_ = auVar273._4_4_ * fVar222;
  auVar24._0_4_ = auVar273._0_4_ * fVar201;
  fVar223 = auVar35._8_4_;
  auVar24._8_4_ = auVar273._8_4_ * fVar223;
  fVar224 = auVar35._12_4_;
  auVar24._12_4_ = auVar273._12_4_ * fVar224;
  fVar225 = auVar35._16_4_;
  auVar24._16_4_ = auVar273._16_4_ * fVar225;
  fVar226 = auVar35._20_4_;
  auVar24._20_4_ = auVar273._20_4_ * fVar226;
  fVar227 = auVar35._24_4_;
  auVar24._24_4_ = auVar273._24_4_ * fVar227;
  auVar24._28_4_ = auVar273._28_4_;
  auVar129._8_4_ = 0x3f800000;
  auVar129._0_8_ = 0x3f8000003f800000;
  auVar129._12_4_ = 0x3f800000;
  auVar129._16_4_ = 0x3f800000;
  auVar129._20_4_ = 0x3f800000;
  auVar129._24_4_ = 0x3f800000;
  auVar129._28_4_ = 0x3f800000;
  auVar27 = vsubps_avx(auVar129,auVar24);
  auVar24 = vrcpps_avx(auVar360);
  fVar201 = fVar201 + fVar201 * auVar27._0_4_;
  fVar222 = fVar222 + fVar222 * auVar27._4_4_;
  fVar223 = fVar223 + fVar223 * auVar27._8_4_;
  fVar224 = fVar224 + fVar224 * auVar27._12_4_;
  fVar225 = fVar225 + fVar225 * auVar27._16_4_;
  fVar226 = fVar226 + fVar226 * auVar27._20_4_;
  fVar227 = fVar227 + fVar227 * auVar27._24_4_;
  fVar259 = auVar24._0_4_;
  fVar276 = auVar24._4_4_;
  auVar273._4_4_ = fVar276 * auVar360._4_4_;
  auVar273._0_4_ = fVar259 * auVar360._0_4_;
  fVar277 = auVar24._8_4_;
  auVar273._8_4_ = fVar277 * auVar360._8_4_;
  fVar278 = auVar24._12_4_;
  auVar273._12_4_ = fVar278 * auVar360._12_4_;
  fVar279 = auVar24._16_4_;
  auVar273._16_4_ = fVar279 * auVar360._16_4_;
  fVar280 = auVar24._20_4_;
  auVar273._20_4_ = fVar280 * auVar360._20_4_;
  fVar281 = auVar24._24_4_;
  auVar273._24_4_ = fVar281 * auVar360._24_4_;
  auVar273._28_4_ = auVar35._28_4_;
  auVar360 = vsubps_avx(auVar129,auVar273);
  auVar273 = vrcpps_avx(auVar126);
  fVar259 = fVar259 + fVar259 * auVar360._0_4_;
  fVar276 = fVar276 + fVar276 * auVar360._4_4_;
  fVar277 = fVar277 + fVar277 * auVar360._8_4_;
  fVar278 = fVar278 + fVar278 * auVar360._12_4_;
  fVar279 = fVar279 + fVar279 * auVar360._16_4_;
  fVar280 = fVar280 + fVar280 * auVar360._20_4_;
  fVar281 = fVar281 + fVar281 * auVar360._24_4_;
  fVar282 = auVar273._0_4_;
  fVar292 = auVar273._4_4_;
  auVar373._4_4_ = fVar292 * auVar126._4_4_;
  auVar373._0_4_ = fVar282 * auVar126._0_4_;
  fVar294 = auVar273._8_4_;
  auVar373._8_4_ = fVar294 * auVar126._8_4_;
  fVar296 = auVar273._12_4_;
  auVar373._12_4_ = fVar296 * auVar126._12_4_;
  fVar298 = auVar273._16_4_;
  auVar373._16_4_ = fVar298 * auVar126._16_4_;
  fVar300 = auVar273._20_4_;
  auVar373._20_4_ = fVar300 * auVar126._20_4_;
  fVar302 = auVar273._24_4_;
  auVar373._24_4_ = fVar302 * auVar126._24_4_;
  auVar373._28_4_ = auVar360._28_4_;
  auVar126 = vsubps_avx(auVar129,auVar373);
  fVar282 = fVar282 + fVar282 * auVar126._0_4_;
  fVar292 = fVar292 + fVar292 * auVar126._4_4_;
  fVar294 = fVar294 + fVar294 * auVar126._8_4_;
  fVar296 = fVar296 + fVar296 * auVar126._12_4_;
  fVar298 = fVar298 + fVar298 * auVar126._16_4_;
  fVar300 = fVar300 + fVar300 * auVar126._20_4_;
  fVar302 = fVar302 + fVar302 * auVar126._24_4_;
  auVar209 = vpermilps_avx(auVar202,0);
  auVar307._16_16_ = auVar30;
  auVar307._0_16_ = auVar29;
  auVar126 = vcvtdq2ps_avx(auVar307);
  auVar327._16_16_ = auVar147;
  auVar327._0_16_ = auVar31;
  auVar273 = vcvtdq2ps_avx(auVar327);
  auVar273 = vsubps_avx(auVar273,auVar126);
  fVar144 = auVar209._0_4_;
  fVar177 = auVar209._4_4_;
  fVar175 = auVar209._8_4_;
  fVar228 = auVar209._12_4_;
  auVar308._0_4_ = auVar273._0_4_ * fVar144 + auVar126._0_4_;
  auVar308._4_4_ = auVar273._4_4_ * fVar177 + auVar126._4_4_;
  auVar308._8_4_ = auVar273._8_4_ * fVar175 + auVar126._8_4_;
  auVar308._12_4_ = auVar273._12_4_ * fVar228 + auVar126._12_4_;
  auVar308._16_4_ = auVar273._16_4_ * fVar144 + auVar126._16_4_;
  auVar308._20_4_ = auVar273._20_4_ * fVar177 + auVar126._20_4_;
  auVar308._24_4_ = auVar273._24_4_ * fVar175 + auVar126._24_4_;
  auVar308._28_4_ = auVar273._28_4_ + auVar126._28_4_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar106 * 9 + 6);
  auVar29 = vpmovsxwd_avx(auVar209);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar106 * 9 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar202);
  auVar328._16_16_ = auVar30;
  auVar328._0_16_ = auVar29;
  auVar126 = vcvtdq2ps_avx(auVar328);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar106 * 0xd + 6);
  auVar29 = vpmovsxwd_avx(auVar206);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar106 * 0xd + 0xe);
  auVar30 = vpmovsxwd_avx(auVar119);
  auVar337._16_16_ = auVar30;
  auVar337._0_16_ = auVar29;
  auVar273 = vcvtdq2ps_avx(auVar337);
  auVar273 = vsubps_avx(auVar273,auVar126);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar106 * 0x12 + 6);
  auVar29 = vpmovsxwd_avx(auVar148);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar106 * 0x12 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar149);
  auVar329._0_4_ = auVar126._0_4_ + auVar273._0_4_ * fVar144;
  auVar329._4_4_ = auVar126._4_4_ + auVar273._4_4_ * fVar177;
  auVar329._8_4_ = auVar126._8_4_ + auVar273._8_4_ * fVar175;
  auVar329._12_4_ = auVar126._12_4_ + auVar273._12_4_ * fVar228;
  auVar329._16_4_ = auVar126._16_4_ + auVar273._16_4_ * fVar144;
  auVar329._20_4_ = auVar126._20_4_ + auVar273._20_4_ * fVar177;
  auVar329._24_4_ = auVar126._24_4_ + auVar273._24_4_ * fVar175;
  auVar329._28_4_ = auVar126._28_4_ + auVar273._28_4_;
  auVar338._16_16_ = auVar30;
  auVar338._0_16_ = auVar29;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar106 * 0x16 + 6);
  auVar29 = vpmovsxwd_avx(auVar32);
  auVar126 = vcvtdq2ps_avx(auVar338);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar106 * 0x16 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar33);
  auVar356._16_16_ = auVar30;
  auVar356._0_16_ = auVar29;
  auVar273 = vcvtdq2ps_avx(auVar356);
  auVar273 = vsubps_avx(auVar273,auVar126);
  auVar339._0_4_ = auVar126._0_4_ + auVar273._0_4_ * fVar144;
  auVar339._4_4_ = auVar126._4_4_ + auVar273._4_4_ * fVar177;
  auVar339._8_4_ = auVar126._8_4_ + auVar273._8_4_ * fVar175;
  auVar339._12_4_ = auVar126._12_4_ + auVar273._12_4_ * fVar228;
  auVar339._16_4_ = auVar126._16_4_ + auVar273._16_4_ * fVar144;
  auVar339._20_4_ = auVar126._20_4_ + auVar273._20_4_ * fVar177;
  auVar339._24_4_ = auVar126._24_4_ + auVar273._24_4_ * fVar175;
  auVar339._28_4_ = auVar126._28_4_ + auVar273._28_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar106 * 0x14 + 6);
  auVar29 = vpmovsxwd_avx(auVar34);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar106 * 0x14 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar121);
  auVar357._16_16_ = auVar30;
  auVar357._0_16_ = auVar29;
  auVar126 = vcvtdq2ps_avx(auVar357);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar106 * 0x18 + 6);
  auVar29 = vpmovsxwd_avx(auVar36);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar106 * 0x18 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar9);
  auVar370._16_16_ = auVar30;
  auVar370._0_16_ = auVar29;
  auVar273 = vcvtdq2ps_avx(auVar370);
  auVar273 = vsubps_avx(auVar273,auVar126);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar106 * 0x1d + 6);
  auVar29 = vpmovsxwd_avx(auVar10);
  auVar358._0_4_ = auVar126._0_4_ + auVar273._0_4_ * fVar144;
  auVar358._4_4_ = auVar126._4_4_ + auVar273._4_4_ * fVar177;
  auVar358._8_4_ = auVar126._8_4_ + auVar273._8_4_ * fVar175;
  auVar358._12_4_ = auVar126._12_4_ + auVar273._12_4_ * fVar228;
  auVar358._16_4_ = auVar126._16_4_ + auVar273._16_4_ * fVar144;
  auVar358._20_4_ = auVar126._20_4_ + auVar273._20_4_ * fVar177;
  auVar358._24_4_ = auVar126._24_4_ + auVar273._24_4_ * fVar175;
  auVar358._28_4_ = auVar126._28_4_ + auVar273._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 * 0x1d + 0xe);
  auVar30 = vpmovsxwd_avx(auVar11);
  auVar371._16_16_ = auVar30;
  auVar371._0_16_ = auVar29;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar106 * 0x21 + 6);
  auVar29 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar106 * 0x21 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar13);
  auVar391._16_16_ = auVar30;
  auVar391._0_16_ = auVar29;
  auVar126 = vcvtdq2ps_avx(auVar371);
  auVar273 = vcvtdq2ps_avx(auVar391);
  auVar273 = vsubps_avx(auVar273,auVar126);
  auVar372._0_4_ = auVar126._0_4_ + auVar273._0_4_ * fVar144;
  auVar372._4_4_ = auVar126._4_4_ + auVar273._4_4_ * fVar177;
  auVar372._8_4_ = auVar126._8_4_ + auVar273._8_4_ * fVar175;
  auVar372._12_4_ = auVar126._12_4_ + auVar273._12_4_ * fVar228;
  auVar372._16_4_ = auVar126._16_4_ + auVar273._16_4_ * fVar144;
  auVar372._20_4_ = auVar126._20_4_ + auVar273._20_4_ * fVar177;
  auVar372._24_4_ = auVar126._24_4_ + auVar273._24_4_ * fVar175;
  auVar372._28_4_ = auVar126._28_4_ + auVar273._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar106 * 0x1f + 6);
  auVar29 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar106 * 0x1f + 0xe);
  auVar30 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar106 * 0x23 + 6);
  auVar31 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar106 * 0x23 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar17);
  auVar392._16_16_ = auVar30;
  auVar392._0_16_ = auVar29;
  auVar420._16_16_ = auVar147;
  auVar420._0_16_ = auVar31;
  auVar126 = vcvtdq2ps_avx(auVar392);
  auVar273 = vcvtdq2ps_avx(auVar420);
  auVar273 = vsubps_avx(auVar273,auVar126);
  auVar393._0_4_ = auVar126._0_4_ + auVar273._0_4_ * fVar144;
  auVar393._4_4_ = auVar126._4_4_ + auVar273._4_4_ * fVar177;
  auVar393._8_4_ = auVar126._8_4_ + auVar273._8_4_ * fVar175;
  auVar393._12_4_ = auVar126._12_4_ + auVar273._12_4_ * fVar228;
  auVar393._16_4_ = auVar126._16_4_ + auVar273._16_4_ * fVar144;
  auVar393._20_4_ = auVar126._20_4_ + auVar273._20_4_ * fVar177;
  auVar393._24_4_ = auVar126._24_4_ + auVar273._24_4_ * fVar175;
  auVar393._28_4_ = auVar126._28_4_ + fVar228;
  auVar126 = vsubps_avx(auVar308,auVar161);
  auVar230._0_4_ = fVar201 * auVar126._0_4_;
  auVar230._4_4_ = fVar222 * auVar126._4_4_;
  auVar230._8_4_ = fVar223 * auVar126._8_4_;
  auVar230._12_4_ = fVar224 * auVar126._12_4_;
  auVar28._16_4_ = fVar225 * auVar126._16_4_;
  auVar28._0_16_ = auVar230;
  auVar28._20_4_ = fVar226 * auVar126._20_4_;
  auVar28._24_4_ = fVar227 * auVar126._24_4_;
  auVar28._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar329,auVar161);
  auVar203._0_4_ = fVar201 * auVar126._0_4_;
  auVar203._4_4_ = fVar222 * auVar126._4_4_;
  auVar203._8_4_ = fVar223 * auVar126._8_4_;
  auVar203._12_4_ = fVar224 * auVar126._12_4_;
  auVar37._16_4_ = fVar225 * auVar126._16_4_;
  auVar37._0_16_ = auVar203;
  auVar37._20_4_ = fVar226 * auVar126._20_4_;
  auVar37._24_4_ = fVar227 * auVar126._24_4_;
  auVar37._28_4_ = auVar35._28_4_ + auVar27._28_4_;
  auVar38._4_4_ = fVar174 * local_980._4_4_ + auVar25._4_4_ * fVar255 + fVar385 * auVar26._4_4_;
  auVar38._0_4_ = fVar8 * local_980._0_4_ + auVar25._0_4_ * fVar253 + fVar384 * auVar26._0_4_;
  auVar38._8_4_ = fVar179 * local_980._8_4_ + auVar25._8_4_ * fVar257 + fVar398 * auVar26._8_4_;
  auVar38._12_4_ = fVar176 * local_980._12_4_ + auVar25._12_4_ * fVar260 + fVar325 * auVar26._12_4_;
  auVar38._16_4_ = fStack_a50;
  auVar38._20_4_ = fStack_a4c;
  auVar38._24_4_ = fStack_a48;
  auVar38._28_4_ = fStack_a44;
  auVar126 = vsubps_avx(auVar339,auVar38);
  auVar145._0_4_ = fVar259 * auVar126._0_4_;
  auVar145._4_4_ = fVar276 * auVar126._4_4_;
  auVar145._8_4_ = fVar277 * auVar126._8_4_;
  auVar145._12_4_ = fVar278 * auVar126._12_4_;
  auVar25._16_4_ = fVar279 * auVar126._16_4_;
  auVar25._0_16_ = auVar145;
  auVar25._20_4_ = fVar280 * auVar126._20_4_;
  auVar25._24_4_ = fVar281 * auVar126._24_4_;
  auVar25._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar358,auVar38);
  auVar261._0_4_ = fVar259 * auVar126._0_4_;
  auVar261._4_4_ = fVar276 * auVar126._4_4_;
  auVar261._8_4_ = fVar277 * auVar126._8_4_;
  auVar261._12_4_ = fVar278 * auVar126._12_4_;
  auVar26._16_4_ = fVar279 * auVar126._16_4_;
  auVar26._0_16_ = auVar261;
  auVar26._20_4_ = fVar280 * auVar126._20_4_;
  auVar26._24_4_ = fVar281 * auVar126._24_4_;
  auVar26._28_4_ = auVar24._28_4_ + auVar360._28_4_;
  auVar126 = vsubps_avx(auVar372,auVar187);
  auVar116._0_4_ = fVar282 * auVar126._0_4_;
  auVar116._4_4_ = fVar292 * auVar126._4_4_;
  auVar116._8_4_ = fVar294 * auVar126._8_4_;
  auVar116._12_4_ = fVar296 * auVar126._12_4_;
  auVar360._16_4_ = fVar298 * auVar126._16_4_;
  auVar360._0_16_ = auVar116;
  auVar360._20_4_ = fVar300 * auVar126._20_4_;
  auVar360._24_4_ = fVar302 * auVar126._24_4_;
  auVar360._28_4_ = auVar126._28_4_;
  auVar126 = vsubps_avx(auVar393,auVar187);
  auVar180._0_4_ = fVar282 * auVar126._0_4_;
  auVar180._4_4_ = fVar292 * auVar126._4_4_;
  auVar180._8_4_ = fVar294 * auVar126._8_4_;
  auVar180._12_4_ = fVar296 * auVar126._12_4_;
  auVar27._16_4_ = fVar298 * auVar126._16_4_;
  auVar27._0_16_ = auVar180;
  auVar27._20_4_ = fVar300 * auVar126._20_4_;
  auVar27._24_4_ = fVar302 * auVar126._24_4_;
  auVar27._28_4_ = auVar126._28_4_;
  auVar29 = vpminsd_avx(auVar28._16_16_,auVar37._16_16_);
  auVar30 = vpminsd_avx(auVar230,auVar203);
  auVar330._16_16_ = auVar29;
  auVar330._0_16_ = auVar30;
  auVar29 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar30 = vpminsd_avx(auVar145,auVar261);
  auVar340._16_16_ = auVar29;
  auVar340._0_16_ = auVar30;
  auVar126 = vmaxps_avx(auVar330,auVar340);
  auVar29 = vpminsd_avx(auVar360._16_16_,auVar27._16_16_);
  auVar30 = vpminsd_avx(auVar116,auVar180);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar436._4_4_ = uVar112;
  auVar436._0_4_ = uVar112;
  auVar436._8_4_ = uVar112;
  auVar436._12_4_ = uVar112;
  auVar436._16_4_ = uVar112;
  auVar436._20_4_ = uVar112;
  auVar436._24_4_ = uVar112;
  auVar436._28_4_ = uVar112;
  auVar421._16_16_ = auVar29;
  auVar421._0_16_ = auVar30;
  auVar273 = vmaxps_avx(auVar421,auVar436);
  auVar126 = vmaxps_avx(auVar126,auVar273);
  local_360._4_4_ = auVar126._4_4_ * 0.99999964;
  local_360._0_4_ = auVar126._0_4_ * 0.99999964;
  local_360._8_4_ = auVar126._8_4_ * 0.99999964;
  local_360._12_4_ = auVar126._12_4_ * 0.99999964;
  local_360._16_4_ = auVar126._16_4_ * 0.99999964;
  local_360._20_4_ = auVar126._20_4_ * 0.99999964;
  local_360._24_4_ = auVar126._24_4_ * 0.99999964;
  local_360._28_4_ = auVar126._28_4_;
  auVar29 = vpmaxsd_avx(auVar28._16_16_,auVar37._16_16_);
  auVar30 = vpmaxsd_avx(auVar230,auVar203);
  auVar217._16_16_ = auVar29;
  auVar217._0_16_ = auVar30;
  auVar29 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar30 = vpmaxsd_avx(auVar145,auVar261);
  auVar162._16_16_ = auVar29;
  auVar162._0_16_ = auVar30;
  auVar126 = vminps_avx(auVar217,auVar162);
  auVar29 = vpmaxsd_avx(auVar360._16_16_,auVar27._16_16_);
  auVar30 = vpmaxsd_avx(auVar116,auVar180);
  auVar130._16_16_ = auVar29;
  auVar130._0_16_ = auVar30;
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar188._4_4_ = uVar112;
  auVar188._0_4_ = uVar112;
  auVar188._8_4_ = uVar112;
  auVar188._12_4_ = uVar112;
  auVar188._16_4_ = uVar112;
  auVar188._20_4_ = uVar112;
  auVar188._24_4_ = uVar112;
  auVar188._28_4_ = uVar112;
  auVar273 = vminps_avx(auVar130,auVar188);
  auVar126 = vminps_avx(auVar126,auVar273);
  auVar35._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar35._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar35._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar35._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar35._16_4_ = auVar126._16_4_ * 1.0000004;
  auVar35._20_4_ = auVar126._20_4_ * 1.0000004;
  auVar35._24_4_ = auVar126._24_4_ * 1.0000004;
  auVar35._28_4_ = auVar126._28_4_;
  auVar126 = vcmpps_avx(local_360,auVar35,2);
  auVar29 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar163._16_16_ = auVar29;
  auVar163._0_16_ = auVar29;
  auVar273 = vcvtdq2ps_avx(auVar163);
  auVar273 = vcmpps_avx(_DAT_01f7b060,auVar273,1);
  auVar126 = vandps_avx(auVar126,auVar273);
  uVar112 = vmovmskps_avx(auVar126);
  uVar106 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar112);
  auVar131._16_16_ = mm_lookupmask_ps._240_16_;
  auVar131._0_16_ = mm_lookupmask_ps._240_16_;
  local_5c0 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
  local_ab0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8e8 = prim;
LAB_00b32851:
  if (uVar106 == 0) {
    return;
  }
  lVar110 = 0;
  if (uVar106 != 0) {
    for (; (uVar106 >> lVar110 & 1) == 0; lVar110 = lVar110 + 1) {
    }
  }
  uVar109 = *(uint *)(local_8e8 + 2);
  local_aa8 = (ulong)*(uint *)(local_8e8 + lVar110 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[uVar109].ptr;
  uVar107 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                            local_aa8 *
                            pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar8 = (pGVar19->time_range).lower;
  fVar8 = pGVar19->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar8) / ((pGVar19->time_range).upper - fVar8));
  auVar29 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
  auVar29 = vminss_avx(auVar29,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar29 = vmaxss_avx(ZEXT816(0) << 0x20,auVar29);
  fVar8 = fVar8 - auVar29._0_4_;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar111 = (long)(int)auVar29._0_4_ * 0x38;
  lVar21 = *(long *)(_Var20 + lVar111);
  lVar22 = *(long *)(_Var20 + 0x10 + lVar111);
  auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - fVar8)),ZEXT416((uint)(1.0 - fVar8)),0);
  pfVar1 = (float *)(lVar21 + lVar22 * uVar107);
  fVar222 = auVar29._0_4_;
  fVar177 = auVar29._4_4_;
  fVar179 = auVar29._8_4_;
  fVar223 = auVar29._12_4_;
  pfVar2 = (float *)(lVar21 + lVar22 * (uVar107 + 1));
  pfVar3 = (float *)(lVar21 + lVar22 * (uVar107 + 2));
  pfVar4 = (float *)(lVar21 + lVar22 * (uVar107 + 3));
  lVar21 = *(long *)(_Var20 + 0x38 + lVar111);
  lVar22 = *(long *)(_Var20 + 0x48 + lVar111);
  auVar29 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
  pfVar5 = (float *)(lVar21 + uVar107 * lVar22);
  fVar175 = auVar29._0_4_;
  fVar176 = auVar29._4_4_;
  fVar224 = auVar29._8_4_;
  fVar228 = auVar29._12_4_;
  pfVar6 = (float *)(lVar21 + (uVar107 + 1) * lVar22);
  pfVar7 = (float *)(lVar21 + (uVar107 + 2) * lVar22);
  auVar231._0_4_ = fVar175 * *pfVar5 + fVar222 * *pfVar1;
  auVar231._4_4_ = fVar176 * pfVar5[1] + fVar177 * pfVar1[1];
  auVar231._8_4_ = fVar224 * pfVar5[2] + fVar179 * pfVar1[2];
  auVar231._12_4_ = fVar228 * pfVar5[3] + fVar223 * pfVar1[3];
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar30 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar8 = *(float *)(ray + k * 4 + 0x40);
  auVar388._4_4_ = fVar8;
  auVar388._0_4_ = fVar8;
  auVar388._8_4_ = fVar8;
  auVar388._12_4_ = fVar8;
  fStack_8d0 = fVar8;
  _local_8e0 = auVar388;
  fStack_8cc = fVar8;
  fStack_8c8 = fVar8;
  fStack_8c4 = fVar8;
  fVar201 = *(float *)(ray + k * 4 + 0x50);
  auVar418._4_4_ = fVar201;
  auVar418._0_4_ = fVar201;
  auVar418._8_4_ = fVar201;
  auVar418._12_4_ = fVar201;
  auVar262._0_4_ = fVar222 * *pfVar2 + fVar175 * *pfVar6;
  auVar262._4_4_ = fVar177 * pfVar2[1] + fVar176 * pfVar6[1];
  auVar262._8_4_ = fVar179 * pfVar2[2] + fVar224 * pfVar6[2];
  auVar262._12_4_ = fVar223 * pfVar2[3] + fVar228 * pfVar6[3];
  auVar29 = vunpcklps_avx(auVar388,auVar418);
  fVar144 = *(float *)(ray + k * 4 + 0x60);
  auVar431._4_4_ = fVar144;
  auVar431._0_4_ = fVar144;
  auVar431._8_4_ = fVar144;
  auVar431._12_4_ = fVar144;
  fStack_6f0 = fVar144;
  _local_700 = auVar431;
  fStack_6ec = fVar144;
  fStack_6e8 = fVar144;
  fStack_6e4 = fVar144;
  _local_9d0 = vinsertps_avx(auVar29,auVar431,0x28);
  auVar117._0_4_ = (auVar231._0_4_ + auVar262._0_4_) * 0.5;
  auVar117._4_4_ = (auVar231._4_4_ + auVar262._4_4_) * 0.5;
  auVar117._8_4_ = (auVar231._8_4_ + auVar262._8_4_) * 0.5;
  auVar117._12_4_ = (auVar231._12_4_ + auVar262._12_4_) * 0.5;
  auVar29 = vsubps_avx(auVar117,auVar30);
  auVar29 = vdpps_avx(auVar29,_local_9d0,0x7f);
  local_9e0 = vdpps_avx(_local_9d0,_local_9d0,0x7f);
  auVar377 = ZEXT1664(local_9e0);
  auVar204._0_4_ = fVar222 * *pfVar3 + fVar175 * *pfVar7;
  auVar204._4_4_ = fVar177 * pfVar3[1] + fVar176 * pfVar7[1];
  auVar204._8_4_ = fVar179 * pfVar3[2] + fVar224 * pfVar7[2];
  auVar204._12_4_ = fVar223 * pfVar3[3] + fVar228 * pfVar7[3];
  auVar31 = vrcpss_avx(local_9e0,local_9e0);
  fVar174 = auVar29._0_4_ * auVar31._0_4_ * (2.0 - local_9e0._0_4_ * auVar31._0_4_);
  auVar31 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
  auVar284._0_4_ = auVar30._0_4_ + local_9d0._0_4_ * auVar31._0_4_;
  auVar284._4_4_ = auVar30._4_4_ + local_9d0._4_4_ * auVar31._4_4_;
  auVar284._8_4_ = auVar30._8_4_ + local_9d0._8_4_ * auVar31._8_4_;
  auVar284._12_4_ = auVar30._12_4_ + local_9d0._12_4_ * auVar31._12_4_;
  auVar29 = vblendps_avx(auVar284,_DAT_01f45a50,8);
  auVar30 = vsubps_avx(auVar231,auVar29);
  auVar333 = ZEXT1664(auVar30);
  auVar249 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar147 = vsubps_avx(auVar204,auVar29);
  pfVar1 = (float *)(lVar21 + lVar22 * (uVar107 + 3));
  auVar146._0_4_ = fVar222 * *pfVar4 + fVar175 * *pfVar1;
  auVar146._4_4_ = fVar177 * pfVar4[1] + fVar176 * pfVar1[1];
  auVar146._8_4_ = fVar179 * pfVar4[2] + fVar224 * pfVar1[2];
  auVar146._12_4_ = fVar223 * pfVar4[3] + fVar228 * pfVar1[3];
  auVar209 = vsubps_avx(auVar262,auVar29);
  auVar202 = vsubps_avx(auVar146,auVar29);
  auVar29 = vshufps_avx(auVar30,auVar30,0);
  register0x00001250 = auVar29;
  _local_4a0 = auVar29;
  auVar29 = vshufps_avx(auVar30,auVar30,0x55);
  register0x00001250 = auVar29;
  _local_1e0 = auVar29;
  auVar29 = vshufps_avx(auVar30,auVar30,0xaa);
  register0x00001250 = auVar29;
  _local_200 = auVar29;
  local_a60 = auVar30._0_4_;
  fStack_a5c = auVar30._4_4_;
  fStack_a58 = auVar30._8_4_;
  fStack_a54 = auVar30._12_4_;
  auVar29 = vshufps_avx(auVar30,auVar30,0xff);
  register0x00001290 = auVar29;
  _local_220 = auVar29;
  auVar29 = vshufps_avx(auVar209,auVar209,0);
  register0x00001290 = auVar29;
  _local_4c0 = auVar29;
  auVar29 = vshufps_avx(auVar209,auVar209,0x55);
  register0x00001290 = auVar29;
  _local_4e0 = auVar29;
  auVar29 = vshufps_avx(auVar209,auVar209,0xaa);
  register0x00001290 = auVar29;
  _local_500 = auVar29;
  _local_960 = auVar209;
  auVar29 = vshufps_avx(auVar209,auVar209,0xff);
  register0x00001290 = auVar29;
  _local_520 = auVar29;
  auVar29 = vshufps_avx(auVar147,auVar147,0);
  auVar422._16_16_ = auVar29;
  auVar422._0_16_ = auVar29;
  auVar424 = ZEXT3264(auVar422);
  auVar30 = vshufps_avx(auVar147,auVar147,0x55);
  register0x00001290 = auVar30;
  _local_540 = auVar30;
  auVar30 = vshufps_avx(auVar147,auVar147,0xaa);
  register0x00001290 = auVar30;
  _local_560 = auVar30;
  _local_a80 = auVar147;
  auVar30 = vshufps_avx(auVar147,auVar147,0xff);
  register0x00001290 = auVar30;
  _local_580 = auVar30;
  auVar30 = vshufps_avx(auVar202,auVar202,0);
  local_840._16_16_ = auVar30;
  local_840._0_16_ = auVar30;
  auVar362 = ZEXT3264(local_840);
  auVar30 = vshufps_avx(auVar202,auVar202,0x55);
  auVar394._16_16_ = auVar30;
  auVar394._0_16_ = auVar30;
  auVar397 = ZEXT3264(auVar394);
  auVar147 = vshufps_avx(auVar202,auVar202,0xaa);
  register0x00001290 = auVar147;
  _local_5a0 = auVar147;
  _local_980 = auVar202;
  auVar147 = vshufps_avx(auVar202,auVar202,0xff);
  register0x00001290 = auVar147;
  _local_240 = auVar147;
  auVar147 = ZEXT416((uint)(fVar8 * fVar8 + fVar201 * fVar201 + fVar144 * fVar144));
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  local_260._16_16_ = auVar147;
  local_260._0_16_ = auVar147;
  fVar8 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)fVar174);
  auVar147 = vshufps_avx(ZEXT416((uint)(fVar8 - fVar174)),ZEXT416((uint)(fVar8 - fVar174)),0);
  local_340._16_16_ = auVar147;
  local_340._0_16_ = auVar147;
  local_7d0 = vpshufd_avx(ZEXT416(uVar109),0);
  local_7e0 = vpshufd_avx(ZEXT416(*(uint *)(local_8e8 + lVar110 * 4 + 6)),0);
  register0x00001210 = auVar31;
  _local_9c0 = auVar31;
  uVar113 = 0;
  local_cc8 = 1;
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  local_5e0 = vandps_avx(local_260,auVar132);
  auVar31 = vsqrtss_avx(local_9e0,local_9e0);
  auVar147 = vsqrtss_avx(local_9e0,local_9e0);
  local_630 = ZEXT816(0x3f80000000000000);
  do {
    auVar209 = vmovshdup_avx(local_630);
    auVar206 = vsubps_avx(auVar209,local_630);
    auVar209 = vshufps_avx(local_630,local_630,0);
    local_800._16_16_ = auVar209;
    local_800._0_16_ = auVar209;
    auVar202 = vshufps_avx(auVar206,auVar206,0);
    local_820._16_16_ = auVar202;
    local_820._0_16_ = auVar202;
    fVar252 = auVar202._0_4_;
    fVar254 = auVar202._4_4_;
    fVar256 = auVar202._8_4_;
    fVar258 = auVar202._12_4_;
    fVar229 = auVar209._0_4_;
    auVar218._0_4_ = fVar229 + fVar252 * 0.0;
    fVar250 = auVar209._4_4_;
    auVar218._4_4_ = fVar250 + fVar254 * 0.14285715;
    fVar251 = auVar209._8_4_;
    auVar218._8_4_ = fVar251 + fVar256 * 0.2857143;
    fStack_a84 = auVar209._12_4_;
    auVar218._12_4_ = fStack_a84 + fVar258 * 0.42857146;
    auVar218._16_4_ = fVar229 + fVar252 * 0.5714286;
    auVar218._20_4_ = fVar250 + fVar254 * 0.71428573;
    auVar218._24_4_ = fVar251 + fVar256 * 0.8571429;
    auVar218._28_4_ = fStack_a84 + fVar258;
    auVar126 = vsubps_avx(auVar249._0_32_,auVar218);
    local_aa0._4_4_ = auVar218._4_4_ * auVar218._4_4_;
    local_aa0._0_4_ = auVar218._0_4_ * auVar218._0_4_;
    fStack_a98 = auVar218._8_4_ * auVar218._8_4_;
    fStack_a94 = auVar218._12_4_ * auVar218._12_4_;
    fStack_a90 = auVar218._16_4_ * auVar218._16_4_;
    fStack_a8c = auVar218._20_4_ * auVar218._20_4_;
    fStack_a88 = auVar218._24_4_ * auVar218._24_4_;
    fVar228 = auVar218._0_4_ * 3.0;
    fVar225 = auVar218._4_4_ * 3.0;
    fVar226 = auVar218._8_4_ * 3.0;
    fVar227 = auVar218._12_4_ * 3.0;
    fVar253 = auVar218._16_4_ * 3.0;
    fVar255 = auVar218._20_4_ * 3.0;
    fVar257 = auVar218._24_4_ * 3.0;
    fVar325 = auVar249._28_4_ + -5.0;
    fVar174 = auVar126._0_4_;
    auVar334._0_4_ = fVar174 * fVar174;
    fVar222 = auVar126._4_4_;
    auVar334._4_4_ = fVar222 * fVar222;
    fVar177 = auVar126._8_4_;
    auVar334._8_4_ = fVar177 * fVar177;
    fVar179 = auVar126._12_4_;
    auVar334._12_4_ = fVar179 * fVar179;
    fVar223 = auVar126._16_4_;
    auVar334._16_4_ = fVar223 * fVar223;
    fVar175 = auVar126._20_4_;
    auVar334._20_4_ = fVar175 * fVar175;
    fVar176 = auVar126._24_4_;
    auVar334._28_36_ = auVar333._28_36_;
    auVar334._24_4_ = fVar176 * fVar176;
    fVar224 = auVar126._28_4_;
    fVar260 = (auVar334._0_4_ * (fVar174 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar259 = (auVar334._4_4_ * (fVar222 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar276 = (auVar334._8_4_ * (fVar177 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar277 = (auVar334._12_4_ * (fVar179 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar278 = (auVar334._16_4_ * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar279 = (auVar334._20_4_ * (fVar175 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar280 = (auVar334._24_4_ * (fVar176 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar281 = -fVar174 * auVar218._0_4_ * auVar218._0_4_ * 0.5;
    fVar282 = -fVar222 * auVar218._4_4_ * auVar218._4_4_ * 0.5;
    fVar292 = -fVar177 * auVar218._8_4_ * auVar218._8_4_ * 0.5;
    fVar294 = -fVar179 * auVar218._12_4_ * auVar218._12_4_ * 0.5;
    fVar296 = -fVar223 * auVar218._16_4_ * auVar218._16_4_ * 0.5;
    fVar298 = -fVar175 * auVar218._20_4_ * auVar218._20_4_ * 0.5;
    fVar300 = -fVar176 * auVar218._24_4_ * auVar218._24_4_ * 0.5;
    fVar144 = auVar424._28_4_;
    fVar302 = auVar362._28_4_ + fVar144;
    fVar384 = auVar377._28_4_ + fVar144;
    fVar417 = (auVar218._0_4_ * auVar218._0_4_ * (fVar228 + -5.0) + 2.0) * 0.5;
    fVar425 = (auVar218._4_4_ * auVar218._4_4_ * (fVar225 + -5.0) + 2.0) * 0.5;
    fVar426 = (auVar218._8_4_ * auVar218._8_4_ * (fVar226 + -5.0) + 2.0) * 0.5;
    fVar427 = (auVar218._12_4_ * auVar218._12_4_ * (fVar227 + -5.0) + 2.0) * 0.5;
    fVar428 = (auVar218._16_4_ * auVar218._16_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar429 = (auVar218._20_4_ * auVar218._20_4_ * (fVar255 + -5.0) + 2.0) * 0.5;
    fVar430 = (auVar218._24_4_ * auVar218._24_4_ * (fVar257 + -5.0) + 2.0) * 0.5;
    fVar416 = -auVar218._28_4_;
    fVar385 = -auVar218._0_4_ * fVar174 * fVar174 * 0.5;
    fVar398 = -auVar218._4_4_ * fVar222 * fVar222 * 0.5;
    fVar401 = -auVar218._8_4_ * fVar177 * fVar177 * 0.5;
    fVar404 = -auVar218._12_4_ * fVar179 * fVar179 * 0.5;
    fVar407 = -auVar218._16_4_ * fVar223 * fVar223 * 0.5;
    fVar410 = -auVar218._20_4_ * fVar175 * fVar175 * 0.5;
    fVar413 = -auVar218._24_4_ * fVar176 * fVar176 * 0.5;
    local_9a0 = fVar385 * (float)local_4a0._0_4_ +
                fVar417 * (float)local_4c0._0_4_ +
                auVar362._0_4_ * fVar281 + auVar424._0_4_ * fVar260;
    fStack_99c = fVar398 * (float)local_4a0._4_4_ +
                 fVar425 * (float)local_4c0._4_4_ +
                 auVar362._4_4_ * fVar282 + auVar424._4_4_ * fVar259;
    fStack_998 = fVar401 * fStack_498 +
                 fVar426 * fStack_4b8 + auVar362._8_4_ * fVar292 + auVar424._8_4_ * fVar276;
    fStack_994 = fVar404 * fStack_494 +
                 fVar427 * fStack_4b4 + auVar362._12_4_ * fVar294 + auVar424._12_4_ * fVar277;
    fStack_990 = fVar407 * fStack_490 +
                 fVar428 * fStack_4b0 + auVar362._16_4_ * fVar296 + auVar424._16_4_ * fVar278;
    fStack_98c = fVar410 * fStack_48c +
                 fVar429 * fStack_4ac + auVar362._20_4_ * fVar298 + auVar424._20_4_ * fVar279;
    fStack_988 = fVar413 * fStack_488 +
                 fVar430 * fStack_4a8 + auVar362._24_4_ * fVar300 + auVar424._24_4_ * fVar280;
    fStack_984 = fVar144 + 2.0 + -fVar224 + fVar302;
    fVar335 = (float)local_1e0._0_4_ * fVar385 +
              fVar417 * (float)local_4e0._0_4_ +
              auVar397._0_4_ * fVar281 + fVar260 * (float)local_540._0_4_;
    fVar344 = (float)local_1e0._4_4_ * fVar398 +
              fVar425 * (float)local_4e0._4_4_ +
              auVar397._4_4_ * fVar282 + fVar259 * (float)local_540._4_4_;
    fVar345 = fStack_1d8 * fVar401 +
              fVar426 * fStack_4d8 + auVar397._8_4_ * fVar292 + fVar276 * fStack_538;
    fVar346 = fStack_1d4 * fVar404 +
              fVar427 * fStack_4d4 + auVar397._12_4_ * fVar294 + fVar277 * fStack_534;
    fVar347 = fStack_1d0 * fVar407 +
              fVar428 * fStack_4d0 + auVar397._16_4_ * fVar296 + fVar278 * fStack_530;
    fVar348 = fStack_1cc * fVar410 +
              fVar429 * fStack_4cc + auVar397._20_4_ * fVar298 + fVar279 * fStack_52c;
    fVar349 = fStack_1c8 * fVar413 +
              fVar430 * fStack_4c8 + auVar397._24_4_ * fVar300 + fVar280 * fStack_528;
    fVar350 = fStack_984 + fVar302 + fVar384;
    fVar178 = (float)local_200._0_4_ * fVar385 +
              fVar417 * (float)local_500._0_4_ +
              fVar281 * (float)local_5a0._0_4_ + fVar260 * (float)local_560._0_4_;
    fVar194 = (float)local_200._4_4_ * fVar398 +
              fVar425 * (float)local_500._4_4_ +
              fVar282 * (float)local_5a0._4_4_ + fVar259 * (float)local_560._4_4_;
    fVar195 = fStack_1f8 * fVar401 +
              fVar426 * fStack_4f8 + fVar292 * fStack_598 + fVar276 * fStack_558;
    fVar196 = fStack_1f4 * fVar404 +
              fVar427 * fStack_4f4 + fVar294 * fStack_594 + fVar277 * fStack_554;
    fVar197 = fStack_1f0 * fVar407 +
              fVar428 * fStack_4f0 + fVar296 * fStack_590 + fVar278 * fStack_550;
    fVar198 = fStack_1ec * fVar410 +
              fVar429 * fStack_4ec + fVar298 * fStack_58c + fVar279 * fStack_54c;
    fVar199 = fStack_1e8 * fVar413 +
              fVar430 * fStack_4e8 + fVar300 * fStack_588 + fVar280 * fStack_548;
    fVar200 = fVar350 + fVar384 + auVar397._28_4_ + fVar144;
    auVar268._0_4_ =
         (float)local_220._0_4_ * fVar385 +
         fVar417 * (float)local_520._0_4_ +
         fVar281 * (float)local_240._0_4_ + fVar260 * (float)local_580._0_4_;
    auVar268._4_4_ =
         (float)local_220._4_4_ * fVar398 +
         fVar425 * (float)local_520._4_4_ +
         fVar282 * (float)local_240._4_4_ + fVar259 * (float)local_580._4_4_;
    auVar268._8_4_ =
         fStack_218 * fVar401 + fVar426 * fStack_518 + fVar292 * fStack_238 + fVar276 * fStack_578;
    auVar268._12_4_ =
         fStack_214 * fVar404 + fVar427 * fStack_514 + fVar294 * fStack_234 + fVar277 * fStack_574;
    auVar268._16_4_ =
         fStack_210 * fVar407 + fVar428 * fStack_510 + fVar296 * fStack_230 + fVar278 * fStack_570;
    auVar268._20_4_ =
         fStack_20c * fVar410 + fVar429 * fStack_50c + fVar298 * fStack_22c + fVar279 * fStack_56c;
    auVar268._24_4_ =
         fStack_208 * fVar413 + fVar430 * fStack_508 + fVar300 * fStack_228 + fVar280 * fStack_568;
    auVar268._28_4_ = fVar350 + fVar144 + 2.0 + -fVar224 + -3.0;
    fVar407 = auVar218._28_4_ + auVar218._28_4_;
    auVar39._4_4_ = (fVar222 + fVar222) * auVar218._4_4_;
    auVar39._0_4_ = (fVar174 + fVar174) * auVar218._0_4_;
    auVar39._8_4_ = (fVar177 + fVar177) * auVar218._8_4_;
    auVar39._12_4_ = (fVar179 + fVar179) * auVar218._12_4_;
    auVar39._16_4_ = (fVar223 + fVar223) * auVar218._16_4_;
    auVar39._20_4_ = (fVar175 + fVar175) * auVar218._20_4_;
    auVar39._24_4_ = (fVar176 + fVar176) * auVar218._24_4_;
    auVar39._28_4_ = fVar407;
    auVar126 = vsubps_avx(auVar39,auVar334._0_32_);
    fVar278 = auVar249._28_4_ + 2.0;
    auVar40._4_4_ = (fVar222 + fVar222) * (fVar225 + 2.0);
    auVar40._0_4_ = (fVar174 + fVar174) * (fVar228 + 2.0);
    auVar40._8_4_ = (fVar177 + fVar177) * (fVar226 + 2.0);
    auVar40._12_4_ = (fVar179 + fVar179) * (fVar227 + 2.0);
    auVar40._16_4_ = (fVar223 + fVar223) * (fVar253 + 2.0);
    auVar40._20_4_ = (fVar175 + fVar175) * (fVar255 + 2.0);
    auVar40._24_4_ = (fVar176 + fVar176) * (fVar257 + 2.0);
    auVar40._28_4_ = fVar278;
    auVar41._4_4_ = fVar222 * fVar222 * 3.0;
    auVar41._0_4_ = fVar174 * fVar174 * 3.0;
    auVar41._8_4_ = fVar177 * fVar177 * 3.0;
    auVar41._12_4_ = fVar179 * fVar179 * 3.0;
    auVar41._16_4_ = fVar223 * fVar223 * 3.0;
    auVar41._20_4_ = fVar175 * fVar175 * 3.0;
    auVar41._24_4_ = fVar176 * fVar176 * 3.0;
    auVar41._28_4_ = fVar224;
    auVar273 = vsubps_avx(auVar40,auVar41);
    auVar360 = vsubps_avx(_local_aa0,auVar39);
    fVar296 = auVar126._0_4_ * 0.5;
    fVar298 = auVar126._4_4_ * 0.5;
    fVar300 = auVar126._8_4_ * 0.5;
    fVar302 = auVar126._12_4_ * 0.5;
    fVar384 = auVar126._16_4_ * 0.5;
    fVar385 = auVar126._20_4_ * 0.5;
    fVar398 = auVar126._24_4_ * 0.5;
    fVar276 = (auVar218._0_4_ * fVar228 + (auVar218._0_4_ + auVar218._0_4_) * (fVar228 + -5.0)) *
              0.5;
    fVar279 = (auVar218._4_4_ * fVar225 + (auVar218._4_4_ + auVar218._4_4_) * (fVar225 + -5.0)) *
              0.5;
    fVar280 = (auVar218._8_4_ * fVar226 + (auVar218._8_4_ + auVar218._8_4_) * (fVar226 + -5.0)) *
              0.5;
    fVar281 = (auVar218._12_4_ * fVar227 + (auVar218._12_4_ + auVar218._12_4_) * (fVar227 + -5.0)) *
              0.5;
    fVar282 = (auVar218._16_4_ * fVar253 + (auVar218._16_4_ + auVar218._16_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar292 = (auVar218._20_4_ * fVar255 + (auVar218._20_4_ + auVar218._20_4_) * (fVar255 + -5.0)) *
              0.5;
    fVar294 = (auVar218._24_4_ * fVar257 + (auVar218._24_4_ + auVar218._24_4_) * (fVar257 + -5.0)) *
              0.5;
    fVar144 = auVar273._0_4_ * 0.5;
    fVar174 = auVar273._4_4_ * 0.5;
    fVar222 = auVar273._8_4_ * 0.5;
    fVar177 = auVar273._12_4_ * 0.5;
    fVar175 = auVar273._16_4_ * 0.5;
    fVar176 = auVar273._20_4_ * 0.5;
    fVar226 = auVar273._24_4_ * 0.5;
    fVar179 = auVar360._0_4_ * 0.5;
    fVar223 = auVar360._4_4_ * 0.5;
    fVar228 = auVar360._8_4_ * 0.5;
    fVar227 = auVar360._12_4_ * 0.5;
    fVar253 = auVar360._16_4_ * 0.5;
    fVar260 = auVar360._20_4_ * 0.5;
    fVar259 = auVar360._24_4_ * 0.5;
    local_c60 = auVar30._0_4_;
    fStack_c5c = auVar30._4_4_;
    fStack_c58 = auVar30._8_4_;
    fStack_c54 = auVar30._12_4_;
    local_c80 = auVar29._0_4_;
    fStack_c7c = auVar29._4_4_;
    fStack_c78 = auVar29._8_4_;
    fStack_c74 = auVar29._12_4_;
    fVar278 = fVar278 + auVar218._28_4_ + fVar325 + auVar273._28_4_ + auVar360._28_4_;
    auVar209 = vpermilps_avx(ZEXT416((uint)(auVar206._0_4_ * 0.04761905)),0);
    fVar255 = auVar209._0_4_;
    fVar304 = fVar255 * (fVar296 * (float)local_4a0._0_4_ +
                        fVar276 * (float)local_4c0._0_4_ +
                        fVar144 * local_c80 + auVar362._0_4_ * fVar179);
    fVar257 = auVar209._4_4_;
    fVar313 = fVar257 * (fVar298 * (float)local_4a0._4_4_ +
                        fVar279 * (float)local_4c0._4_4_ +
                        fVar174 * fStack_c7c + auVar362._4_4_ * fVar223);
    auVar42._4_4_ = fVar313;
    auVar42._0_4_ = fVar304;
    fVar277 = auVar209._8_4_;
    fVar315 = fVar277 * (fVar300 * fStack_498 +
                        fVar280 * fStack_4b8 + fVar222 * fStack_c78 + auVar362._8_4_ * fVar228);
    auVar42._8_4_ = fVar315;
    fVar225 = auVar209._12_4_;
    fVar317 = fVar225 * (fVar302 * fStack_494 +
                        fVar281 * fStack_4b4 + fVar177 * fStack_c74 + auVar362._12_4_ * fVar227);
    auVar42._12_4_ = fVar317;
    fVar319 = fVar255 * (fVar384 * fStack_490 +
                        fVar282 * fStack_4b0 + fVar175 * local_c80 + auVar362._16_4_ * fVar253);
    auVar42._16_4_ = fVar319;
    fVar321 = fVar257 * (fVar385 * fStack_48c +
                        fVar292 * fStack_4ac + fVar176 * fStack_c7c + auVar362._20_4_ * fVar260);
    auVar42._20_4_ = fVar321;
    fVar323 = fVar277 * (fVar398 * fStack_488 +
                        fVar294 * fStack_4a8 + fVar226 * fStack_c78 + auVar362._24_4_ * fVar259);
    auVar42._24_4_ = fVar323;
    auVar42._28_4_ = fVar224 + fVar224 + auVar126._28_4_ + fVar224 + fVar224 + fVar325;
    fVar369 = fVar255 * ((float)local_1e0._0_4_ * fVar296 +
                        fVar276 * (float)local_4e0._0_4_ +
                        fVar144 * (float)local_540._0_4_ + fVar179 * local_c60);
    fVar378 = fVar257 * ((float)local_1e0._4_4_ * fVar298 +
                        fVar279 * (float)local_4e0._4_4_ +
                        fVar174 * (float)local_540._4_4_ + fVar223 * fStack_c5c);
    auVar43._4_4_ = fVar378;
    auVar43._0_4_ = fVar369;
    fVar379 = fVar277 * (fStack_1d8 * fVar300 +
                        fVar280 * fStack_4d8 + fVar222 * fStack_538 + fVar228 * fStack_c58);
    auVar43._8_4_ = fVar379;
    fVar380 = fVar225 * (fStack_1d4 * fVar302 +
                        fVar281 * fStack_4d4 + fVar177 * fStack_534 + fVar227 * fStack_c54);
    auVar43._12_4_ = fVar380;
    fVar381 = fVar255 * (fStack_1d0 * fVar384 +
                        fVar282 * fStack_4d0 + fVar175 * fStack_530 + fVar253 * local_c60);
    auVar43._16_4_ = fVar381;
    fVar382 = fVar257 * (fStack_1cc * fVar385 +
                        fVar292 * fStack_4cc + fVar176 * fStack_52c + fVar260 * fStack_c5c);
    auVar43._20_4_ = fVar382;
    fVar383 = fVar277 * (fStack_1c8 * fVar398 +
                        fVar294 * fStack_4c8 + fVar226 * fStack_528 + fVar259 * fStack_c58);
    auVar43._24_4_ = fVar383;
    auVar43._28_4_ = fStack_1e4;
    fVar386 = fVar255 * ((float)local_200._0_4_ * fVar296 +
                        fVar144 * (float)local_560._0_4_ + fVar179 * (float)local_5a0._0_4_ +
                        fVar276 * (float)local_500._0_4_);
    fVar399 = fVar257 * ((float)local_200._4_4_ * fVar298 +
                        fVar174 * (float)local_560._4_4_ + fVar223 * (float)local_5a0._4_4_ +
                        fVar279 * (float)local_500._4_4_);
    auVar44._4_4_ = fVar399;
    auVar44._0_4_ = fVar386;
    fVar402 = fVar277 * (fStack_1f8 * fVar300 +
                        fVar222 * fStack_558 + fVar228 * fStack_598 + fVar280 * fStack_4f8);
    auVar44._8_4_ = fVar402;
    fVar405 = fVar225 * (fStack_1f4 * fVar302 +
                        fVar177 * fStack_554 + fVar227 * fStack_594 + fVar281 * fStack_4f4);
    auVar44._12_4_ = fVar405;
    fVar408 = fVar255 * (fStack_1f0 * fVar384 +
                        fVar175 * fStack_550 + fVar253 * fStack_590 + fVar282 * fStack_4f0);
    auVar44._16_4_ = fVar408;
    fVar411 = fVar257 * (fStack_1ec * fVar385 +
                        fVar176 * fStack_54c + fVar260 * fStack_58c + fVar292 * fStack_4ec);
    auVar44._20_4_ = fVar411;
    fVar414 = fVar277 * (fStack_1e8 * fVar398 +
                        fVar226 * fStack_548 + fVar259 * fStack_588 + fVar294 * fStack_4e8);
    auVar44._24_4_ = fVar414;
    auVar44._28_4_ = fVar416;
    fVar179 = fVar255 * ((float)local_220._0_4_ * fVar296 +
                        fVar276 * (float)local_520._0_4_ +
                        fVar144 * (float)local_580._0_4_ + (float)local_240._0_4_ * fVar179);
    fVar223 = fVar257 * ((float)local_220._4_4_ * fVar298 +
                        fVar279 * (float)local_520._4_4_ +
                        fVar174 * (float)local_580._4_4_ + (float)local_240._4_4_ * fVar223);
    auVar45._4_4_ = fVar223;
    auVar45._0_4_ = fVar179;
    fVar228 = fVar277 * (fStack_218 * fVar300 +
                        fVar280 * fStack_518 + fVar222 * fStack_578 + fStack_238 * fVar228);
    auVar45._8_4_ = fVar228;
    fVar225 = fVar225 * (fStack_214 * fVar302 +
                        fVar281 * fStack_514 + fVar177 * fStack_574 + fStack_234 * fVar227);
    auVar45._12_4_ = fVar225;
    fVar255 = fVar255 * (fStack_210 * fVar384 +
                        fVar282 * fStack_510 + fVar175 * fStack_570 + fStack_230 * fVar253);
    auVar45._16_4_ = fVar255;
    fVar257 = fVar257 * (fStack_20c * fVar385 +
                        fVar292 * fStack_50c + fVar176 * fStack_56c + fStack_22c * fVar260);
    auVar45._20_4_ = fVar257;
    fVar277 = fVar277 * (fStack_208 * fVar398 +
                        fVar294 * fStack_508 + fVar226 * fStack_568 + fStack_228 * fVar259);
    auVar45._24_4_ = fVar277;
    auVar45._28_4_ = fVar278;
    auVar97._4_4_ = fVar344;
    auVar97._0_4_ = fVar335;
    auVar97._8_4_ = fVar345;
    auVar97._12_4_ = fVar346;
    auVar97._16_4_ = fVar347;
    auVar97._20_4_ = fVar348;
    auVar97._24_4_ = fVar349;
    auVar97._28_4_ = fVar350;
    auVar126 = vperm2f128_avx(auVar97,auVar97,1);
    auVar126 = vshufps_avx(auVar126,auVar97,0x30);
    auVar24 = vshufps_avx(auVar97,auVar126,0x29);
    auVar95._4_4_ = fVar194;
    auVar95._0_4_ = fVar178;
    auVar95._8_4_ = fVar195;
    auVar95._12_4_ = fVar196;
    auVar95._16_4_ = fVar197;
    auVar95._20_4_ = fVar198;
    auVar95._24_4_ = fVar199;
    auVar95._28_4_ = fVar200;
    auVar126 = vperm2f128_avx(auVar95,auVar95,1);
    auVar126 = vshufps_avx(auVar126,auVar95,0x30);
    auVar25 = vshufps_avx(auVar95,auVar126,0x29);
    auVar273 = vsubps_avx(auVar268,auVar45);
    auVar126 = vperm2f128_avx(auVar273,auVar273,1);
    auVar126 = vshufps_avx(auVar126,auVar273,0x30);
    auVar26 = vshufps_avx(auVar273,auVar126,0x29);
    local_2a0 = vsubps_avx(auVar24,auVar97);
    local_280 = vsubps_avx(auVar25,auVar95);
    fVar174 = local_2a0._0_4_;
    fVar175 = local_2a0._4_4_;
    auVar46._4_4_ = fVar399 * fVar175;
    auVar46._0_4_ = fVar386 * fVar174;
    fVar226 = local_2a0._8_4_;
    auVar46._8_4_ = fVar402 * fVar226;
    fVar260 = local_2a0._12_4_;
    auVar46._12_4_ = fVar405 * fVar260;
    fVar279 = local_2a0._16_4_;
    auVar46._16_4_ = fVar408 * fVar279;
    fVar294 = local_2a0._20_4_;
    auVar46._20_4_ = fVar411 * fVar294;
    fVar384 = local_2a0._24_4_;
    auVar46._24_4_ = fVar414 * fVar384;
    auVar46._28_4_ = auVar273._28_4_;
    fVar222 = local_280._0_4_;
    fVar176 = local_280._4_4_;
    auVar47._4_4_ = fVar378 * fVar176;
    auVar47._0_4_ = fVar369 * fVar222;
    fVar227 = local_280._8_4_;
    auVar47._8_4_ = fVar379 * fVar227;
    fVar259 = local_280._12_4_;
    auVar47._12_4_ = fVar380 * fVar259;
    fVar280 = local_280._16_4_;
    auVar47._16_4_ = fVar381 * fVar280;
    fVar296 = local_280._20_4_;
    auVar47._20_4_ = fVar382 * fVar296;
    fVar385 = local_280._24_4_;
    auVar47._24_4_ = fVar383 * fVar385;
    auVar47._28_4_ = auVar126._28_4_;
    auVar373 = vsubps_avx(auVar47,auVar46);
    auVar102._4_4_ = fStack_99c;
    auVar102._0_4_ = local_9a0;
    auVar102._8_4_ = fStack_998;
    auVar102._12_4_ = fStack_994;
    auVar102._16_4_ = fStack_990;
    auVar102._20_4_ = fStack_98c;
    auVar102._24_4_ = fStack_988;
    auVar102._28_4_ = fStack_984;
    auVar126 = vperm2f128_avx(auVar102,auVar102,1);
    auVar126 = vshufps_avx(auVar126,auVar102,0x30);
    auVar27 = vshufps_avx(auVar102,auVar126,0x29);
    local_2c0 = vsubps_avx(auVar27,auVar102);
    auVar48._4_4_ = fVar313 * fVar176;
    auVar48._0_4_ = fVar304 * fVar222;
    auVar48._8_4_ = fVar315 * fVar227;
    auVar48._12_4_ = fVar317 * fVar259;
    auVar48._16_4_ = fVar319 * fVar280;
    auVar48._20_4_ = fVar321 * fVar296;
    auVar48._24_4_ = fVar323 * fVar385;
    auVar48._28_4_ = auVar126._28_4_;
    fVar177 = local_2c0._0_4_;
    fVar224 = local_2c0._4_4_;
    auVar49._4_4_ = fVar399 * fVar224;
    auVar49._0_4_ = fVar386 * fVar177;
    fVar253 = local_2c0._8_4_;
    auVar49._8_4_ = fVar402 * fVar253;
    fVar276 = local_2c0._12_4_;
    auVar49._12_4_ = fVar405 * fVar276;
    fVar281 = local_2c0._16_4_;
    auVar49._16_4_ = fVar408 * fVar281;
    fVar298 = local_2c0._20_4_;
    auVar49._20_4_ = fVar411 * fVar298;
    fVar398 = local_2c0._24_4_;
    auVar49._24_4_ = fVar414 * fVar398;
    auVar49._28_4_ = fVar200;
    auVar28 = vsubps_avx(auVar49,auVar48);
    auVar50._4_4_ = fVar378 * fVar224;
    auVar50._0_4_ = fVar369 * fVar177;
    auVar50._8_4_ = fVar379 * fVar253;
    auVar50._12_4_ = fVar380 * fVar276;
    auVar50._16_4_ = fVar381 * fVar281;
    auVar50._20_4_ = fVar382 * fVar298;
    auVar50._24_4_ = fVar383 * fVar398;
    auVar50._28_4_ = fVar200;
    auVar51._4_4_ = fVar175 * fVar313;
    auVar51._0_4_ = fVar174 * fVar304;
    auVar51._8_4_ = fVar226 * fVar315;
    auVar51._12_4_ = fVar260 * fVar317;
    auVar51._16_4_ = fVar279 * fVar319;
    auVar51._20_4_ = fVar294 * fVar321;
    auVar51._24_4_ = fVar384 * fVar323;
    auVar51._28_4_ = fVar407;
    auVar35 = vsubps_avx(auVar51,auVar50);
    fVar144 = auVar35._28_4_;
    auVar219._0_4_ = fVar177 * fVar177 + fVar174 * fVar174 + fVar222 * fVar222;
    auVar219._4_4_ = fVar224 * fVar224 + fVar175 * fVar175 + fVar176 * fVar176;
    auVar219._8_4_ = fVar253 * fVar253 + fVar226 * fVar226 + fVar227 * fVar227;
    auVar219._12_4_ = fVar276 * fVar276 + fVar260 * fVar260 + fVar259 * fVar259;
    auVar219._16_4_ = fVar281 * fVar281 + fVar279 * fVar279 + fVar280 * fVar280;
    auVar219._20_4_ = fVar298 * fVar298 + fVar294 * fVar294 + fVar296 * fVar296;
    auVar219._24_4_ = fVar398 * fVar398 + fVar384 * fVar384 + fVar385 * fVar385;
    auVar219._28_4_ = fVar144 + fVar144 + auVar373._28_4_;
    auVar126 = vrcpps_avx(auVar219);
    fVar282 = auVar126._0_4_;
    fVar292 = auVar126._4_4_;
    auVar52._4_4_ = fVar292 * auVar219._4_4_;
    auVar52._0_4_ = fVar282 * auVar219._0_4_;
    fVar300 = auVar126._8_4_;
    auVar52._8_4_ = fVar300 * auVar219._8_4_;
    fVar302 = auVar126._12_4_;
    auVar52._12_4_ = fVar302 * auVar219._12_4_;
    fVar325 = auVar126._16_4_;
    auVar52._16_4_ = fVar325 * auVar219._16_4_;
    fVar401 = auVar126._20_4_;
    auVar52._20_4_ = fVar401 * auVar219._20_4_;
    fVar404 = auVar126._24_4_;
    auVar52._24_4_ = fVar404 * auVar219._24_4_;
    auVar52._28_4_ = fVar407;
    auVar189._8_4_ = 0x3f800000;
    auVar189._0_8_ = 0x3f8000003f800000;
    auVar189._12_4_ = 0x3f800000;
    auVar189._16_4_ = 0x3f800000;
    auVar189._20_4_ = 0x3f800000;
    auVar189._24_4_ = 0x3f800000;
    auVar189._28_4_ = 0x3f800000;
    auVar37 = vsubps_avx(auVar189,auVar52);
    fVar282 = fVar282 + fVar282 * auVar37._0_4_;
    fVar292 = fVar292 + fVar292 * auVar37._4_4_;
    fVar300 = fVar300 + fVar300 * auVar37._8_4_;
    fVar302 = fVar302 + fVar302 * auVar37._12_4_;
    fVar325 = fVar325 + fVar325 * auVar37._16_4_;
    fVar401 = fVar401 + fVar401 * auVar37._20_4_;
    fVar404 = fVar404 + fVar404 * auVar37._24_4_;
    auVar273 = vperm2f128_avx(auVar43,auVar43,1);
    auVar273 = vshufps_avx(auVar273,auVar43,0x30);
    auVar273 = vshufps_avx(auVar43,auVar273,0x29);
    auVar360 = vperm2f128_avx(auVar44,auVar44,1);
    auVar360 = vshufps_avx(auVar360,auVar44,0x30);
    local_a00 = vshufps_avx(auVar44,auVar360,0x29);
    fVar387 = local_a00._0_4_;
    fVar400 = local_a00._4_4_;
    auVar53._4_4_ = fVar400 * fVar175;
    auVar53._0_4_ = fVar387 * fVar174;
    fVar403 = local_a00._8_4_;
    auVar53._8_4_ = fVar403 * fVar226;
    fVar406 = local_a00._12_4_;
    auVar53._12_4_ = fVar406 * fVar260;
    fVar409 = local_a00._16_4_;
    auVar53._16_4_ = fVar409 * fVar279;
    fVar412 = local_a00._20_4_;
    auVar53._20_4_ = fVar412 * fVar294;
    fVar415 = local_a00._24_4_;
    auVar53._24_4_ = fVar415 * fVar384;
    auVar53._28_4_ = auVar360._28_4_;
    fVar426 = auVar273._0_4_;
    fVar427 = auVar273._4_4_;
    auVar54._4_4_ = fVar427 * fVar176;
    auVar54._0_4_ = fVar426 * fVar222;
    fVar428 = auVar273._8_4_;
    auVar54._8_4_ = fVar428 * fVar227;
    fVar429 = auVar273._12_4_;
    auVar54._12_4_ = fVar429 * fVar259;
    fVar430 = auVar273._16_4_;
    auVar54._16_4_ = fVar430 * fVar280;
    fVar442 = auVar273._20_4_;
    auVar54._20_4_ = fVar442 * fVar296;
    fVar444 = auVar273._24_4_;
    auVar54._24_4_ = fVar444 * fVar385;
    auVar54._28_4_ = fStack_1e4;
    auVar38 = vsubps_avx(auVar54,auVar53);
    auVar273 = vperm2f128_avx(auVar42,auVar42,1);
    auVar273 = vshufps_avx(auVar273,auVar42,0x30);
    auVar360 = vshufps_avx(auVar42,auVar273,0x29);
    fVar305 = auVar360._0_4_;
    fVar314 = auVar360._4_4_;
    auVar55._4_4_ = fVar314 * fVar176;
    auVar55._0_4_ = fVar305 * fVar222;
    fVar316 = auVar360._8_4_;
    auVar55._8_4_ = fVar316 * fVar227;
    fVar318 = auVar360._12_4_;
    auVar55._12_4_ = fVar318 * fVar259;
    fVar320 = auVar360._16_4_;
    auVar55._16_4_ = fVar320 * fVar280;
    fVar322 = auVar360._20_4_;
    auVar55._20_4_ = fVar322 * fVar296;
    fVar324 = auVar360._24_4_;
    auVar55._24_4_ = fVar324 * fVar385;
    auVar55._28_4_ = auVar273._28_4_;
    auVar56._4_4_ = fVar400 * fVar224;
    auVar56._0_4_ = fVar387 * fVar177;
    auVar56._8_4_ = fVar403 * fVar253;
    auVar56._12_4_ = fVar406 * fVar276;
    auVar56._16_4_ = fVar409 * fVar281;
    auVar56._20_4_ = fVar412 * fVar298;
    uVar114 = local_a00._28_4_;
    auVar56._24_4_ = fVar415 * fVar398;
    auVar56._28_4_ = uVar114;
    auVar273 = vsubps_avx(auVar56,auVar55);
    auVar57._4_4_ = fVar224 * fVar427;
    auVar57._0_4_ = fVar177 * fVar426;
    auVar57._8_4_ = fVar253 * fVar428;
    auVar57._12_4_ = fVar276 * fVar429;
    auVar57._16_4_ = fVar281 * fVar430;
    auVar57._20_4_ = fVar298 * fVar442;
    auVar57._24_4_ = fVar398 * fVar444;
    auVar57._28_4_ = uVar114;
    auVar58._4_4_ = fVar175 * fVar314;
    auVar58._0_4_ = fVar174 * fVar305;
    auVar58._8_4_ = fVar226 * fVar316;
    auVar58._12_4_ = fVar260 * fVar318;
    auVar58._16_4_ = fVar279 * fVar320;
    auVar58._20_4_ = fVar294 * fVar322;
    auVar58._24_4_ = fVar384 * fVar324;
    auVar58._28_4_ = fStack_1c4;
    auVar127 = vsubps_avx(auVar58,auVar57);
    auVar59._4_4_ =
         fVar292 * (auVar373._4_4_ * auVar373._4_4_ +
                   auVar35._4_4_ * auVar35._4_4_ + auVar28._4_4_ * auVar28._4_4_);
    auVar59._0_4_ =
         fVar282 * (auVar373._0_4_ * auVar373._0_4_ +
                   auVar35._0_4_ * auVar35._0_4_ + auVar28._0_4_ * auVar28._0_4_);
    auVar59._8_4_ =
         fVar300 * (auVar373._8_4_ * auVar373._8_4_ +
                   auVar35._8_4_ * auVar35._8_4_ + auVar28._8_4_ * auVar28._8_4_);
    auVar59._12_4_ =
         fVar302 * (auVar373._12_4_ * auVar373._12_4_ +
                   auVar35._12_4_ * auVar35._12_4_ + auVar28._12_4_ * auVar28._12_4_);
    auVar59._16_4_ =
         fVar325 * (auVar373._16_4_ * auVar373._16_4_ +
                   auVar35._16_4_ * auVar35._16_4_ + auVar28._16_4_ * auVar28._16_4_);
    auVar59._20_4_ =
         fVar401 * (auVar373._20_4_ * auVar373._20_4_ +
                   auVar35._20_4_ * auVar35._20_4_ + auVar28._20_4_ * auVar28._20_4_);
    auVar59._24_4_ =
         fVar404 * (auVar373._24_4_ * auVar373._24_4_ +
                   auVar35._24_4_ * auVar35._24_4_ + auVar28._24_4_ * auVar28._24_4_);
    auVar59._28_4_ = auVar373._28_4_ + fVar144 + auVar28._28_4_;
    auVar60._4_4_ =
         (auVar38._4_4_ * auVar38._4_4_ +
         auVar273._4_4_ * auVar273._4_4_ + auVar127._4_4_ * auVar127._4_4_) * fVar292;
    auVar60._0_4_ =
         (auVar38._0_4_ * auVar38._0_4_ +
         auVar273._0_4_ * auVar273._0_4_ + auVar127._0_4_ * auVar127._0_4_) * fVar282;
    auVar60._8_4_ =
         (auVar38._8_4_ * auVar38._8_4_ +
         auVar273._8_4_ * auVar273._8_4_ + auVar127._8_4_ * auVar127._8_4_) * fVar300;
    auVar60._12_4_ =
         (auVar38._12_4_ * auVar38._12_4_ +
         auVar273._12_4_ * auVar273._12_4_ + auVar127._12_4_ * auVar127._12_4_) * fVar302;
    auVar60._16_4_ =
         (auVar38._16_4_ * auVar38._16_4_ +
         auVar273._16_4_ * auVar273._16_4_ + auVar127._16_4_ * auVar127._16_4_) * fVar325;
    auVar60._20_4_ =
         (auVar38._20_4_ * auVar38._20_4_ +
         auVar273._20_4_ * auVar273._20_4_ + auVar127._20_4_ * auVar127._20_4_) * fVar401;
    auVar60._24_4_ =
         (auVar38._24_4_ * auVar38._24_4_ +
         auVar273._24_4_ * auVar273._24_4_ + auVar127._24_4_ * auVar127._24_4_) * fVar404;
    auVar60._28_4_ = auVar126._28_4_ + auVar37._28_4_;
    auVar126 = vmaxps_avx(auVar59,auVar60);
    auVar273 = vperm2f128_avx(auVar268,auVar268,1);
    auVar273 = vshufps_avx(auVar273,auVar268,0x30);
    local_660 = vshufps_avx(auVar268,auVar273,0x29);
    local_680._0_4_ = auVar268._0_4_ + fVar179;
    local_680._4_4_ = auVar268._4_4_ + fVar223;
    local_680._8_4_ = auVar268._8_4_ + fVar228;
    local_680._12_4_ = auVar268._12_4_ + fVar225;
    local_680._16_4_ = auVar268._16_4_ + fVar255;
    local_680._20_4_ = auVar268._20_4_ + fVar257;
    local_680._24_4_ = auVar268._24_4_ + fVar277;
    local_680._28_4_ = auVar268._28_4_ + fVar278;
    auVar273 = vmaxps_avx(auVar268,local_680);
    auVar360 = vmaxps_avx(auVar26,local_660);
    auVar273 = vmaxps_avx(auVar273,auVar360);
    auVar360 = vrsqrtps_avx(auVar219);
    fVar144 = auVar360._0_4_;
    fVar179 = auVar360._4_4_;
    fVar223 = auVar360._8_4_;
    fVar228 = auVar360._12_4_;
    fVar225 = auVar360._16_4_;
    fVar255 = auVar360._20_4_;
    fVar257 = auVar360._24_4_;
    auVar61._4_4_ = fVar179 * fVar179 * fVar179 * auVar219._4_4_ * 0.5;
    auVar61._0_4_ = fVar144 * fVar144 * fVar144 * auVar219._0_4_ * 0.5;
    auVar61._8_4_ = fVar223 * fVar223 * fVar223 * auVar219._8_4_ * 0.5;
    auVar61._12_4_ = fVar228 * fVar228 * fVar228 * auVar219._12_4_ * 0.5;
    auVar61._16_4_ = fVar225 * fVar225 * fVar225 * auVar219._16_4_ * 0.5;
    auVar61._20_4_ = fVar255 * fVar255 * fVar255 * auVar219._20_4_ * 0.5;
    auVar61._24_4_ = fVar257 * fVar257 * fVar257 * auVar219._24_4_ * 0.5;
    auVar61._28_4_ = auVar219._28_4_;
    auVar62._4_4_ = fVar179 * 1.5;
    auVar62._0_4_ = fVar144 * 1.5;
    auVar62._8_4_ = fVar223 * 1.5;
    auVar62._12_4_ = fVar228 * 1.5;
    auVar62._16_4_ = fVar225 * 1.5;
    auVar62._20_4_ = fVar255 * 1.5;
    auVar62._24_4_ = fVar257 * 1.5;
    auVar62._28_4_ = auVar360._28_4_;
    _local_ae0 = vsubps_avx(auVar62,auVar61);
    auVar98._4_4_ = fVar344;
    auVar98._0_4_ = fVar335;
    auVar98._8_4_ = fVar345;
    auVar98._12_4_ = fVar346;
    auVar98._16_4_ = fVar347;
    auVar98._20_4_ = fVar348;
    auVar98._24_4_ = fVar349;
    auVar98._28_4_ = fVar350;
    auVar373 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a40 = vsubps_avx(auVar373,auVar98);
    auVar96._4_4_ = fVar194;
    auVar96._0_4_ = fVar178;
    auVar96._8_4_ = fVar195;
    auVar96._12_4_ = fVar196;
    auVar96._16_4_ = fVar197;
    auVar96._20_4_ = fVar198;
    auVar96._24_4_ = fVar199;
    auVar96._28_4_ = fVar200;
    local_a20 = vsubps_avx(auVar373,auVar96);
    fVar351 = local_a20._0_4_;
    fVar363 = local_a20._4_4_;
    fVar364 = local_a20._8_4_;
    fVar365 = local_a20._12_4_;
    fVar366 = local_a20._16_4_;
    fVar367 = local_a20._20_4_;
    fVar368 = local_a20._24_4_;
    fVar179 = local_a40._0_4_;
    fVar228 = local_a40._4_4_;
    fVar255 = local_a40._8_4_;
    fVar277 = local_a40._12_4_;
    fVar282 = local_a40._16_4_;
    fVar300 = local_a40._20_4_;
    fVar325 = local_a40._24_4_;
    auVar373 = vsubps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar102);
    fVar435 = auVar373._0_4_;
    fVar437 = auVar373._4_4_;
    fVar438 = auVar373._8_4_;
    fVar439 = auVar373._12_4_;
    fVar440 = auVar373._16_4_;
    fVar441 = auVar373._20_4_;
    fVar443 = auVar373._24_4_;
    auVar341._0_4_ =
         fVar435 * (float)local_8e0._0_4_ + fVar201 * fVar179 + fVar351 * (float)local_700._0_4_;
    auVar341._4_4_ =
         fVar437 * (float)local_8e0._4_4_ + fVar201 * fVar228 + fVar363 * (float)local_700._4_4_;
    auVar341._8_4_ = fVar438 * fStack_8d8 + fVar201 * fVar255 + fVar364 * fStack_6f8;
    auVar341._12_4_ = fVar439 * fStack_8d4 + fVar201 * fVar277 + fVar365 * fStack_6f4;
    auVar341._16_4_ = fVar440 * fStack_8d0 + fVar201 * fVar282 + fVar366 * fStack_6f0;
    auVar341._20_4_ = fVar441 * fStack_8cc + fVar201 * fVar300 + fVar367 * fStack_6ec;
    auVar341._24_4_ = fVar443 * fStack_8c8 + fVar201 * fVar325 + fVar368 * fStack_6e8;
    auVar341._28_4_ = auVar127._28_4_ + auVar360._28_4_ + auVar219._28_4_;
    auVar395._0_4_ = fVar435 * fVar435 + fVar179 * fVar179 + fVar351 * fVar351;
    auVar395._4_4_ = fVar437 * fVar437 + fVar228 * fVar228 + fVar363 * fVar363;
    auVar395._8_4_ = fVar438 * fVar438 + fVar255 * fVar255 + fVar364 * fVar364;
    auVar395._12_4_ = fVar439 * fVar439 + fVar277 * fVar277 + fVar365 * fVar365;
    auVar395._16_4_ = fVar440 * fVar440 + fVar282 * fVar282 + fVar366 * fVar366;
    auVar395._20_4_ = fVar441 * fVar441 + fVar300 * fVar300 + fVar367 * fVar367;
    auVar395._24_4_ = fVar443 * fVar443 + fVar325 * fVar325 + fVar368 * fVar368;
    auVar395._28_4_ = fStack_1c4 + fStack_1c4 + auVar127._28_4_;
    fVar223 = local_ae0._0_4_;
    fVar225 = local_ae0._4_4_;
    fVar257 = local_ae0._8_4_;
    fVar278 = local_ae0._12_4_;
    fVar292 = local_ae0._16_4_;
    fVar302 = local_ae0._20_4_;
    fVar401 = local_ae0._24_4_;
    auVar35 = local_2c0;
    local_600._0_4_ =
         (float)local_8e0._0_4_ * fVar177 * fVar223 +
         fVar174 * fVar223 * fVar201 + fVar222 * fVar223 * (float)local_700._0_4_;
    local_600._4_4_ =
         (float)local_8e0._4_4_ * fVar224 * fVar225 +
         fVar175 * fVar225 * fVar201 + fVar176 * fVar225 * (float)local_700._4_4_;
    local_600._8_4_ =
         fStack_8d8 * fVar253 * fVar257 +
         fVar226 * fVar257 * fVar201 + fVar227 * fVar257 * fStack_6f8;
    local_600._12_4_ =
         fStack_8d4 * fVar276 * fVar278 +
         fVar260 * fVar278 * fVar201 + fVar259 * fVar278 * fStack_6f4;
    local_600._16_4_ =
         fStack_8d0 * fVar281 * fVar292 +
         fVar279 * fVar292 * fVar201 + fVar280 * fVar292 * fStack_6f0;
    local_600._20_4_ =
         fStack_8cc * fVar298 * fVar302 +
         fVar294 * fVar302 * fVar201 + fVar296 * fVar302 * fStack_6ec;
    local_600._24_4_ =
         fStack_8c8 * fVar398 * fVar401 +
         fVar384 * fVar401 * fVar201 + fVar385 * fVar401 * fStack_6e8;
    local_600._28_4_ = fStack_8c4 + fVar201 + fStack_6e4;
    fVar144 = fStack_8c4 + fVar201 + fStack_6e4;
    local_620._0_4_ =
         fVar435 * fVar177 * fVar223 + fVar174 * fVar223 * fVar179 + fVar351 * fVar222 * fVar223;
    local_620._4_4_ =
         fVar437 * fVar224 * fVar225 + fVar175 * fVar225 * fVar228 + fVar363 * fVar176 * fVar225;
    local_620._8_4_ =
         fVar438 * fVar253 * fVar257 + fVar226 * fVar257 * fVar255 + fVar364 * fVar227 * fVar257;
    local_620._12_4_ =
         fVar439 * fVar276 * fVar278 + fVar260 * fVar278 * fVar277 + fVar365 * fVar259 * fVar278;
    local_620._16_4_ =
         fVar440 * fVar281 * fVar292 + fVar279 * fVar292 * fVar282 + fVar366 * fVar280 * fVar292;
    local_620._20_4_ =
         fVar441 * fVar298 * fVar302 + fVar294 * fVar302 * fVar300 + fVar367 * fVar296 * fVar302;
    local_620._24_4_ =
         fVar443 * fVar398 * fVar401 + fVar384 * fVar401 * fVar325 + fVar368 * fVar385 * fVar401;
    local_620._28_4_ = fVar201 + fVar144;
    auVar63._4_4_ = local_600._4_4_ * local_620._4_4_;
    auVar63._0_4_ = local_600._0_4_ * local_620._0_4_;
    auVar63._8_4_ = local_600._8_4_ * local_620._8_4_;
    auVar63._12_4_ = local_600._12_4_ * local_620._12_4_;
    auVar63._16_4_ = local_600._16_4_ * local_620._16_4_;
    auVar63._20_4_ = local_600._20_4_ * local_620._20_4_;
    auVar63._24_4_ = local_600._24_4_ * local_620._24_4_;
    auVar63._28_4_ = fVar144;
    auVar360 = vsubps_avx(auVar341,auVar63);
    auVar64._4_4_ = local_620._4_4_ * local_620._4_4_;
    auVar64._0_4_ = local_620._0_4_ * local_620._0_4_;
    auVar64._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar64._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar64._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar64._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar64._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar64._28_4_ = fVar201;
    auVar373 = vsubps_avx(auVar395,auVar64);
    local_6e0 = vsqrtps_avx(auVar126);
    fVar144 = (local_6e0._0_4_ + auVar273._0_4_) * 1.0000002;
    fVar404 = (local_6e0._4_4_ + auVar273._4_4_) * 1.0000002;
    fVar407 = (local_6e0._8_4_ + auVar273._8_4_) * 1.0000002;
    fVar410 = (local_6e0._12_4_ + auVar273._12_4_) * 1.0000002;
    fVar413 = (local_6e0._16_4_ + auVar273._16_4_) * 1.0000002;
    fVar417 = (local_6e0._20_4_ + auVar273._20_4_) * 1.0000002;
    fVar425 = (local_6e0._24_4_ + auVar273._24_4_) * 1.0000002;
    auVar65._4_4_ = fVar404 * fVar404;
    auVar65._0_4_ = fVar144 * fVar144;
    auVar65._8_4_ = fVar407 * fVar407;
    auVar65._12_4_ = fVar410 * fVar410;
    auVar65._16_4_ = fVar413 * fVar413;
    auVar65._20_4_ = fVar417 * fVar417;
    auVar65._24_4_ = fVar425 * fVar425;
    auVar65._28_4_ = local_6e0._28_4_ + auVar273._28_4_;
    local_3e0._0_4_ = auVar360._0_4_ + auVar360._0_4_;
    local_3e0._4_4_ = auVar360._4_4_ + auVar360._4_4_;
    local_3e0._8_4_ = auVar360._8_4_ + auVar360._8_4_;
    local_3e0._12_4_ = auVar360._12_4_ + auVar360._12_4_;
    local_3e0._16_4_ = auVar360._16_4_ + auVar360._16_4_;
    local_3e0._20_4_ = auVar360._20_4_ + auVar360._20_4_;
    local_3e0._24_4_ = auVar360._24_4_ + auVar360._24_4_;
    fVar144 = auVar360._28_4_;
    local_3e0._28_4_ = fVar144 + fVar144;
    auVar273 = vsubps_avx(auVar373,auVar65);
    auVar66._4_4_ = local_600._4_4_ * local_600._4_4_;
    auVar66._0_4_ = local_600._0_4_ * local_600._0_4_;
    auVar66._8_4_ = local_600._8_4_ * local_600._8_4_;
    auVar66._12_4_ = local_600._12_4_ * local_600._12_4_;
    auVar66._16_4_ = local_600._16_4_ * local_600._16_4_;
    auVar66._20_4_ = local_600._20_4_ * local_600._20_4_;
    auVar66._24_4_ = local_600._24_4_ * local_600._24_4_;
    auVar66._28_4_ = fVar144;
    auVar360 = vsubps_avx(local_260,auVar66);
    local_6a0._4_4_ = local_3e0._4_4_ * local_3e0._4_4_;
    local_6a0._0_4_ = local_3e0._0_4_ * local_3e0._0_4_;
    local_6a0._8_4_ = local_3e0._8_4_ * local_3e0._8_4_;
    local_6a0._12_4_ = local_3e0._12_4_ * local_3e0._12_4_;
    local_6a0._16_4_ = local_3e0._16_4_ * local_3e0._16_4_;
    local_6a0._20_4_ = local_3e0._20_4_ * local_3e0._20_4_;
    local_6a0._24_4_ = local_3e0._24_4_ * local_3e0._24_4_;
    local_6a0._28_4_ = local_260._28_4_;
    fVar144 = auVar360._0_4_;
    local_6c0._0_4_ = fVar144 * 4.0;
    fVar404 = auVar360._4_4_;
    local_6c0._4_4_ = fVar404 * 4.0;
    fVar407 = auVar360._8_4_;
    fStack_6b8 = fVar407 * 4.0;
    fVar410 = auVar360._12_4_;
    fStack_6b4 = fVar410 * 4.0;
    fVar413 = auVar360._16_4_;
    fStack_6b0 = fVar413 * 4.0;
    fVar417 = auVar360._20_4_;
    fStack_6ac = fVar417 * 4.0;
    fVar425 = auVar360._24_4_;
    fStack_6a8 = fVar425 * 4.0;
    uStack_6a4 = 0x40800000;
    auVar67._4_4_ = auVar273._4_4_ * (float)local_6c0._4_4_;
    auVar67._0_4_ = auVar273._0_4_ * (float)local_6c0._0_4_;
    auVar67._8_4_ = auVar273._8_4_ * fStack_6b8;
    auVar67._12_4_ = auVar273._12_4_ * fStack_6b4;
    auVar67._16_4_ = auVar273._16_4_ * fStack_6b0;
    auVar67._20_4_ = auVar273._20_4_ * fStack_6ac;
    auVar67._24_4_ = auVar273._24_4_ * fStack_6a8;
    auVar67._28_4_ = 0x40800000;
    auVar28 = vsubps_avx(local_6a0,auVar67);
    auVar126 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,5);
    auVar133._8_4_ = 0x7fffffff;
    auVar133._0_8_ = 0x7fffffff7fffffff;
    auVar133._12_4_ = 0x7fffffff;
    auVar133._16_4_ = 0x7fffffff;
    auVar133._20_4_ = 0x7fffffff;
    auVar133._24_4_ = 0x7fffffff;
    auVar133._28_4_ = 0x7fffffff;
    local_3c0 = vandps_avx(auVar66,auVar133);
    local_320._0_4_ = fVar144 + fVar144;
    local_320._4_4_ = fVar404 + fVar404;
    local_320._8_4_ = fVar407 + fVar407;
    local_320._12_4_ = fVar410 + fVar410;
    local_320._16_4_ = fVar413 + fVar413;
    local_320._20_4_ = fVar417 + fVar417;
    local_320._24_4_ = fVar425 + fVar425;
    local_320._28_4_ = auVar360._28_4_ + auVar360._28_4_;
    local_2e0 = vandps_avx(auVar360,auVar133);
    uVar107 = CONCAT44(local_3e0._4_4_,local_3e0._0_4_);
    local_300._0_8_ = uVar107 ^ 0x8000000080000000;
    local_300._8_4_ = -local_3e0._8_4_;
    local_300._12_4_ = -local_3e0._12_4_;
    local_300._16_4_ = -local_3e0._16_4_;
    local_300._20_4_ = -local_3e0._20_4_;
    local_300._24_4_ = -local_3e0._24_4_;
    local_300._28_4_ = -local_3e0._28_4_;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      auVar333 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar164._8_4_ = 0xff800000;
      auVar164._0_8_ = 0xff800000ff800000;
      auVar164._12_4_ = 0xff800000;
      auVar164._16_4_ = 0xff800000;
      auVar164._20_4_ = 0xff800000;
      auVar164._24_4_ = 0xff800000;
      auVar164._28_4_ = 0xff800000;
    }
    else {
      auVar38 = vsqrtps_avx(auVar28);
      auVar360 = vrcpps_avx(local_320);
      auVar37 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,5);
      fVar144 = auVar360._0_4_;
      fVar404 = auVar360._4_4_;
      auVar68._4_4_ = local_320._4_4_ * fVar404;
      auVar68._0_4_ = local_320._0_4_ * fVar144;
      fVar407 = auVar360._8_4_;
      auVar68._8_4_ = local_320._8_4_ * fVar407;
      fVar410 = auVar360._12_4_;
      auVar68._12_4_ = local_320._12_4_ * fVar410;
      fVar413 = auVar360._16_4_;
      auVar68._16_4_ = local_320._16_4_ * fVar413;
      fVar417 = auVar360._20_4_;
      auVar68._20_4_ = local_320._20_4_ * fVar417;
      fVar425 = auVar360._24_4_;
      auVar68._24_4_ = local_320._24_4_ * fVar425;
      auVar68._28_4_ = auVar28._28_4_;
      auVar134._8_4_ = 0x3f800000;
      auVar134._0_8_ = 0x3f8000003f800000;
      auVar134._12_4_ = 0x3f800000;
      auVar134._16_4_ = 0x3f800000;
      auVar134._20_4_ = 0x3f800000;
      auVar134._24_4_ = 0x3f800000;
      auVar134._28_4_ = 0x3f800000;
      auVar28 = vsubps_avx(auVar134,auVar68);
      fVar144 = fVar144 + fVar144 * auVar28._0_4_;
      fVar404 = fVar404 + fVar404 * auVar28._4_4_;
      fVar407 = fVar407 + fVar407 * auVar28._8_4_;
      fVar410 = fVar410 + fVar410 * auVar28._12_4_;
      fVar413 = fVar413 + fVar413 * auVar28._16_4_;
      fVar417 = fVar417 + fVar417 * auVar28._20_4_;
      fVar425 = fVar425 + fVar425 * auVar28._24_4_;
      auVar127 = vsubps_avx(local_300,auVar38);
      fVar283 = auVar127._0_4_ * fVar144;
      fVar293 = auVar127._4_4_ * fVar404;
      auVar69._4_4_ = fVar293;
      auVar69._0_4_ = fVar283;
      fVar295 = auVar127._8_4_ * fVar407;
      auVar69._8_4_ = fVar295;
      fVar297 = auVar127._12_4_ * fVar410;
      auVar69._12_4_ = fVar297;
      fVar299 = auVar127._16_4_ * fVar413;
      auVar69._16_4_ = fVar299;
      fVar301 = auVar127._20_4_ * fVar417;
      auVar69._20_4_ = fVar301;
      fVar303 = auVar127._24_4_ * fVar425;
      auVar69._24_4_ = fVar303;
      auVar69._28_4_ = auVar127._28_4_;
      auVar38 = vsubps_avx(auVar38,local_3e0);
      fVar144 = auVar38._0_4_ * fVar144;
      fVar404 = auVar38._4_4_ * fVar404;
      auVar70._4_4_ = fVar404;
      auVar70._0_4_ = fVar144;
      fVar407 = auVar38._8_4_ * fVar407;
      auVar70._8_4_ = fVar407;
      fVar410 = auVar38._12_4_ * fVar410;
      auVar70._12_4_ = fVar410;
      fVar413 = auVar38._16_4_ * fVar413;
      auVar70._16_4_ = fVar413;
      fVar417 = auVar38._20_4_ * fVar417;
      auVar70._20_4_ = fVar417;
      fVar425 = auVar38._24_4_ * fVar425;
      auVar70._24_4_ = fVar425;
      auVar70._28_4_ = auVar360._28_4_ + auVar28._28_4_;
      fStack_384 = local_620._28_4_ + auVar38._28_4_;
      local_3a0 = fVar223 * (local_620._0_4_ + local_600._0_4_ * fVar283);
      fStack_39c = fVar225 * (local_620._4_4_ + local_600._4_4_ * fVar293);
      fStack_398 = fVar257 * (local_620._8_4_ + local_600._8_4_ * fVar295);
      fStack_394 = fVar278 * (local_620._12_4_ + local_600._12_4_ * fVar297);
      fStack_390 = fVar292 * (local_620._16_4_ + local_600._16_4_ * fVar299);
      fStack_38c = fVar302 * (local_620._20_4_ + local_600._20_4_ * fVar301);
      fStack_388 = fVar401 * (local_620._24_4_ + local_600._24_4_ * fVar303);
      local_380 = fVar223 * (local_620._0_4_ + local_600._0_4_ * fVar144);
      fStack_37c = fVar225 * (local_620._4_4_ + local_600._4_4_ * fVar404);
      fStack_378 = fVar257 * (local_620._8_4_ + local_600._8_4_ * fVar407);
      fStack_374 = fVar278 * (local_620._12_4_ + local_600._12_4_ * fVar410);
      fStack_370 = fVar292 * (local_620._16_4_ + local_600._16_4_ * fVar413);
      fStack_36c = fVar302 * (local_620._20_4_ + local_600._20_4_ * fVar417);
      fStack_368 = fVar401 * (local_620._24_4_ + local_600._24_4_ * fVar425);
      fStack_364 = local_620._28_4_ + fStack_384;
      auVar269._8_4_ = 0x7f800000;
      auVar269._0_8_ = 0x7f8000007f800000;
      auVar269._12_4_ = 0x7f800000;
      auVar269._16_4_ = 0x7f800000;
      auVar269._20_4_ = 0x7f800000;
      auVar269._24_4_ = 0x7f800000;
      auVar269._28_4_ = 0x7f800000;
      auVar360 = vblendvps_avx(auVar269,auVar69,auVar37);
      auVar333 = ZEXT3264(auVar360);
      auVar270._8_4_ = 0xff800000;
      auVar270._0_8_ = 0xff800000ff800000;
      auVar270._12_4_ = 0xff800000;
      auVar270._16_4_ = 0xff800000;
      auVar270._20_4_ = 0xff800000;
      auVar270._24_4_ = 0xff800000;
      auVar270._28_4_ = 0xff800000;
      auVar164 = vblendvps_avx(auVar270,auVar70,auVar37);
      auVar28 = vmaxps_avx(local_5e0,local_3c0);
      auVar71._4_4_ = auVar28._4_4_ * 1.9073486e-06;
      auVar71._0_4_ = auVar28._0_4_ * 1.9073486e-06;
      auVar71._8_4_ = auVar28._8_4_ * 1.9073486e-06;
      auVar71._12_4_ = auVar28._12_4_ * 1.9073486e-06;
      auVar71._16_4_ = auVar28._16_4_ * 1.9073486e-06;
      auVar71._20_4_ = auVar28._20_4_ * 1.9073486e-06;
      auVar71._24_4_ = auVar28._24_4_ * 1.9073486e-06;
      auVar71._28_4_ = auVar28._28_4_;
      auVar28 = vcmpps_avx(local_2e0,auVar71,1);
      auVar38 = auVar37 & auVar28;
      if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar38 >> 0x7f,0) != '\0') ||
            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar38 >> 0xbf,0) != '\0') ||
          (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar38[0x1f] < '\0') {
        auVar126 = vandps_avx(auVar28,auVar37);
        auVar209 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar28 = vcmpps_avx(auVar273,ZEXT432(0) << 0x20,2);
        auVar311._8_4_ = 0xff800000;
        auVar311._0_8_ = 0xff800000ff800000;
        auVar311._12_4_ = 0xff800000;
        auVar311._16_4_ = 0xff800000;
        auVar311._20_4_ = 0xff800000;
        auVar311._24_4_ = 0xff800000;
        auVar311._28_4_ = 0xff800000;
        auVar312._8_4_ = 0x7f800000;
        auVar312._0_8_ = 0x7f8000007f800000;
        auVar312._12_4_ = 0x7f800000;
        auVar312._16_4_ = 0x7f800000;
        auVar312._20_4_ = 0x7f800000;
        auVar312._24_4_ = 0x7f800000;
        auVar312._28_4_ = 0x7f800000;
        auVar273 = vblendvps_avx(auVar312,auVar311,auVar28);
        auVar202 = vpmovsxwd_avx(auVar209);
        auVar209 = vpunpckhwd_avx(auVar209,auVar209);
        auVar275._16_16_ = auVar209;
        auVar275._0_16_ = auVar202;
        auVar273 = vblendvps_avx(auVar360,auVar273,auVar275);
        auVar360 = vblendvps_avx(auVar311,auVar312,auVar28);
        auVar333 = ZEXT3264(auVar273);
        auVar164 = vblendvps_avx(auVar164,auVar360,auVar275);
        auVar248._0_8_ = auVar126._0_8_ ^ 0xffffffffffffffff;
        auVar248._8_4_ = auVar126._8_4_ ^ 0xffffffff;
        auVar248._12_4_ = auVar126._12_4_ ^ 0xffffffff;
        auVar248._16_4_ = auVar126._16_4_ ^ 0xffffffff;
        auVar248._20_4_ = auVar126._20_4_ ^ 0xffffffff;
        auVar248._24_4_ = auVar126._24_4_ ^ 0xffffffff;
        auVar248._28_4_ = auVar126._28_4_ ^ 0xffffffff;
        auVar126 = vorps_avx(auVar28,auVar248);
        auVar126 = vandps_avx(auVar37,auVar126);
      }
    }
    auVar377 = ZEXT3264(local_620);
    auVar424 = ZEXT3264(auVar422);
    auVar397 = ZEXT3264(auVar394);
    auVar273 = local_5c0 & auVar126;
    fVar144 = (float)local_9c0._0_4_;
    fVar404 = (float)local_9c0._4_4_;
    fVar407 = fStack_9b8;
    fVar410 = fStack_9b4;
    fVar413 = fStack_9b0;
    fVar417 = fStack_9ac;
    fVar425 = fStack_9a8;
    fVar283 = fStack_9a4;
    if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar273 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar273 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar273 >> 0x7f,0) == '\0') &&
          (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar273 >> 0xbf,0) == '\0') &&
        (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar273[0x1f])
    {
      auVar249 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar362 = ZEXT3264(local_840);
    }
    else {
      auVar249 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar209 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_910._0_4_));
      auVar209 = vshufps_avx(auVar209,auVar209,0);
      auVar271._16_16_ = auVar209;
      auVar271._0_16_ = auVar209;
      auVar37 = vminps_avx(auVar271,auVar164);
      auVar135._0_4_ =
           (float)local_8e0._0_4_ * fVar304 + fVar201 * fVar369 + (float)local_700._0_4_ * fVar386;
      auVar135._4_4_ =
           (float)local_8e0._4_4_ * fVar313 + fVar201 * fVar378 + (float)local_700._4_4_ * fVar399;
      auVar135._8_4_ = fStack_8d8 * fVar315 + fVar201 * fVar379 + fStack_6f8 * fVar402;
      auVar135._12_4_ = fStack_8d4 * fVar317 + fVar201 * fVar380 + fStack_6f4 * fVar405;
      auVar135._16_4_ = fStack_8d0 * fVar319 + fVar201 * fVar381 + fStack_6f0 * fVar408;
      auVar135._20_4_ = fStack_8cc * fVar321 + fVar201 * fVar382 + fStack_6ec * fVar411;
      auVar135._24_4_ = fStack_8c8 * fVar323 + fVar201 * fVar383 + fStack_6e8 * fVar414;
      auVar135._28_4_ = fVar416 + fStack_1e4 + fVar416;
      auVar28 = vrcpps_avx(auVar135);
      fVar416 = auVar28._0_4_;
      fVar293 = auVar28._4_4_;
      auVar72._4_4_ = auVar135._4_4_ * fVar293;
      auVar72._0_4_ = auVar135._0_4_ * fVar416;
      fVar295 = auVar28._8_4_;
      auVar72._8_4_ = auVar135._8_4_ * fVar295;
      fVar297 = auVar28._12_4_;
      auVar72._12_4_ = auVar135._12_4_ * fVar297;
      fVar299 = auVar28._16_4_;
      auVar72._16_4_ = auVar135._16_4_ * fVar299;
      fVar301 = auVar28._20_4_;
      auVar72._20_4_ = auVar135._20_4_ * fVar301;
      fVar303 = auVar28._24_4_;
      auVar72._24_4_ = auVar135._24_4_ * fVar303;
      auVar72._28_4_ = fStack_9a4 + auVar209._12_4_;
      auVar374._8_4_ = 0x3f800000;
      auVar374._0_8_ = 0x3f8000003f800000;
      auVar374._12_4_ = 0x3f800000;
      auVar374._16_4_ = 0x3f800000;
      auVar374._20_4_ = 0x3f800000;
      auVar374._24_4_ = 0x3f800000;
      auVar374._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar374,auVar72);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar273 = vandps_avx(auVar135,auVar309);
      auVar359._8_4_ = 0x219392ef;
      auVar359._0_8_ = 0x219392ef219392ef;
      auVar359._12_4_ = 0x219392ef;
      auVar359._16_4_ = 0x219392ef;
      auVar359._20_4_ = 0x219392ef;
      auVar359._24_4_ = 0x219392ef;
      auVar359._28_4_ = 0x219392ef;
      auVar360 = vcmpps_avx(auVar273,auVar359,1);
      auVar73._4_4_ =
           (fVar293 + fVar293 * auVar38._4_4_) *
           -(fVar313 * fVar437 + fVar378 * fVar228 + fVar399 * fVar363);
      auVar73._0_4_ =
           (fVar416 + fVar416 * auVar38._0_4_) *
           -(fVar304 * fVar435 + fVar369 * fVar179 + fVar386 * fVar351);
      auVar73._8_4_ =
           (fVar295 + fVar295 * auVar38._8_4_) *
           -(fVar315 * fVar438 + fVar379 * fVar255 + fVar402 * fVar364);
      auVar73._12_4_ =
           (fVar297 + fVar297 * auVar38._12_4_) *
           -(fVar317 * fVar439 + fVar380 * fVar277 + fVar405 * fVar365);
      auVar73._16_4_ =
           (fVar299 + fVar299 * auVar38._16_4_) *
           -(fVar319 * fVar440 + fVar381 * fVar282 + fVar408 * fVar366);
      auVar73._20_4_ =
           (fVar301 + fVar301 * auVar38._20_4_) *
           -(fVar321 * fVar441 + fVar382 * fVar300 + fVar411 * fVar367);
      auVar73._24_4_ =
           (fVar303 + fVar303 * auVar38._24_4_) *
           -(fVar323 * fVar443 + fVar383 * fVar325 + fVar414 * fVar368);
      auVar73._28_4_ = auVar28._28_4_ + auVar38._28_4_;
      auVar94 = ZEXT812(0);
      auVar377 = ZEXT1264(auVar94) << 0x20;
      auVar273 = vcmpps_avx(auVar135,ZEXT1232(auVar94) << 0x20,1);
      auVar273 = vorps_avx(auVar360,auVar273);
      auVar423._8_4_ = 0xff800000;
      auVar423._0_8_ = 0xff800000ff800000;
      auVar423._12_4_ = 0xff800000;
      auVar423._16_4_ = 0xff800000;
      auVar423._20_4_ = 0xff800000;
      auVar423._24_4_ = 0xff800000;
      auVar423._28_4_ = 0xff800000;
      auVar273 = vblendvps_avx(auVar73,auVar423,auVar273);
      auVar28 = vcmpps_avx(auVar135,ZEXT1232(auVar94) << 0x20,6);
      auVar360 = vorps_avx(auVar360,auVar28);
      auVar433._8_4_ = 0x7f800000;
      auVar433._0_8_ = 0x7f8000007f800000;
      auVar433._12_4_ = 0x7f800000;
      auVar433._16_4_ = 0x7f800000;
      auVar433._20_4_ = 0x7f800000;
      auVar433._24_4_ = 0x7f800000;
      auVar433._28_4_ = 0x7f800000;
      auVar360 = vblendvps_avx(auVar73,auVar433,auVar360);
      auVar28 = vmaxps_avx(local_340,auVar333._0_32_);
      auVar28 = vmaxps_avx(auVar28,auVar273);
      auVar37 = vminps_avx(auVar37,auVar360);
      auVar333 = ZEXT3264(auVar37);
      auVar127 = ZEXT1232(auVar94) << 0x20;
      auVar273 = vsubps_avx(auVar127,auVar24);
      auVar360 = vsubps_avx(auVar127,auVar25);
      auVar74._4_4_ = auVar360._4_4_ * -fVar400;
      auVar74._0_4_ = auVar360._0_4_ * -fVar387;
      auVar74._8_4_ = auVar360._8_4_ * -fVar403;
      auVar74._12_4_ = auVar360._12_4_ * -fVar406;
      auVar74._16_4_ = auVar360._16_4_ * -fVar409;
      auVar74._20_4_ = auVar360._20_4_ * -fVar412;
      auVar74._24_4_ = auVar360._24_4_ * -fVar415;
      auVar74._28_4_ = auVar360._28_4_;
      auVar75._4_4_ = fVar427 * auVar273._4_4_;
      auVar75._0_4_ = fVar426 * auVar273._0_4_;
      auVar75._8_4_ = fVar428 * auVar273._8_4_;
      auVar75._12_4_ = fVar429 * auVar273._12_4_;
      auVar75._16_4_ = fVar430 * auVar273._16_4_;
      auVar75._20_4_ = fVar442 * auVar273._20_4_;
      auVar75._24_4_ = fVar444 * auVar273._24_4_;
      auVar75._28_4_ = auVar273._28_4_;
      auVar273 = vsubps_avx(auVar74,auVar75);
      auVar360 = vsubps_avx(auVar127,auVar27);
      auVar76._4_4_ = fVar314 * auVar360._4_4_;
      auVar76._0_4_ = fVar305 * auVar360._0_4_;
      auVar76._8_4_ = fVar316 * auVar360._8_4_;
      auVar76._12_4_ = fVar318 * auVar360._12_4_;
      auVar76._16_4_ = fVar320 * auVar360._16_4_;
      auVar76._20_4_ = fVar322 * auVar360._20_4_;
      uVar112 = auVar360._28_4_;
      auVar76._24_4_ = fVar324 * auVar360._24_4_;
      auVar76._28_4_ = uVar112;
      auVar24 = vsubps_avx(auVar273,auVar76);
      auVar77._4_4_ = (float)local_700._4_4_ * -fVar400;
      auVar77._0_4_ = (float)local_700._0_4_ * -fVar387;
      auVar77._8_4_ = fStack_6f8 * -fVar403;
      auVar77._12_4_ = fStack_6f4 * -fVar406;
      auVar77._16_4_ = fStack_6f0 * -fVar409;
      auVar77._20_4_ = fStack_6ec * -fVar412;
      auVar77._24_4_ = fStack_6e8 * -fVar415;
      auVar77._28_4_ = uVar114 ^ 0x80000000;
      auVar396._8_4_ = 0x3f800000;
      auVar396._0_8_ = 0x3f8000003f800000;
      auVar396._12_4_ = 0x3f800000;
      auVar396._16_4_ = 0x3f800000;
      auVar396._20_4_ = 0x3f800000;
      auVar396._24_4_ = 0x3f800000;
      auVar396._28_4_ = 0x3f800000;
      auVar78._4_4_ = fVar201 * fVar427;
      auVar78._0_4_ = fVar201 * fVar426;
      auVar78._8_4_ = fVar201 * fVar428;
      auVar78._12_4_ = fVar201 * fVar429;
      auVar78._16_4_ = fVar201 * fVar430;
      auVar78._20_4_ = fVar201 * fVar442;
      auVar78._24_4_ = fVar201 * fVar444;
      auVar78._28_4_ = uVar112;
      auVar273 = vsubps_avx(auVar77,auVar78);
      auVar79._4_4_ = (float)local_8e0._4_4_ * fVar314;
      auVar79._0_4_ = (float)local_8e0._0_4_ * fVar305;
      auVar79._8_4_ = fStack_8d8 * fVar316;
      auVar79._12_4_ = fStack_8d4 * fVar318;
      auVar79._16_4_ = fStack_8d0 * fVar320;
      auVar79._20_4_ = fStack_8cc * fVar322;
      auVar79._24_4_ = fStack_8c8 * fVar324;
      auVar79._28_4_ = uVar112;
      auVar25 = vsubps_avx(auVar273,auVar79);
      auVar273 = vrcpps_avx(auVar25);
      fVar179 = auVar273._0_4_;
      fVar228 = auVar273._4_4_;
      auVar80._4_4_ = auVar25._4_4_ * fVar228;
      auVar80._0_4_ = auVar25._0_4_ * fVar179;
      fVar255 = auVar273._8_4_;
      auVar80._8_4_ = auVar25._8_4_ * fVar255;
      fVar277 = auVar273._12_4_;
      auVar80._12_4_ = auVar25._12_4_ * fVar277;
      fVar282 = auVar273._16_4_;
      auVar80._16_4_ = auVar25._16_4_ * fVar282;
      fVar300 = auVar273._20_4_;
      auVar80._20_4_ = auVar25._20_4_ * fVar300;
      fVar325 = auVar273._24_4_;
      auVar80._24_4_ = auVar25._24_4_ * fVar325;
      auVar80._28_4_ = fStack_8c4;
      auVar38 = vsubps_avx(auVar396,auVar80);
      auVar136._8_4_ = 0x7fffffff;
      auVar136._0_8_ = 0x7fffffff7fffffff;
      auVar136._12_4_ = 0x7fffffff;
      auVar136._16_4_ = 0x7fffffff;
      auVar136._20_4_ = 0x7fffffff;
      auVar136._24_4_ = 0x7fffffff;
      auVar136._28_4_ = 0x7fffffff;
      auVar273 = vandps_avx(auVar25,auVar136);
      auVar137._8_4_ = 0x219392ef;
      auVar137._0_8_ = 0x219392ef219392ef;
      auVar137._12_4_ = 0x219392ef;
      auVar137._16_4_ = 0x219392ef;
      auVar137._20_4_ = 0x219392ef;
      auVar137._24_4_ = 0x219392ef;
      auVar137._28_4_ = 0x219392ef;
      auVar360 = vcmpps_avx(auVar273,auVar137,1);
      auVar81._4_4_ = (fVar228 + fVar228 * auVar38._4_4_) * -auVar24._4_4_;
      auVar81._0_4_ = (fVar179 + fVar179 * auVar38._0_4_) * -auVar24._0_4_;
      auVar81._8_4_ = (fVar255 + fVar255 * auVar38._8_4_) * -auVar24._8_4_;
      auVar81._12_4_ = (fVar277 + fVar277 * auVar38._12_4_) * -auVar24._12_4_;
      auVar81._16_4_ = (fVar282 + fVar282 * auVar38._16_4_) * -auVar24._16_4_;
      auVar81._20_4_ = (fVar300 + fVar300 * auVar38._20_4_) * -auVar24._20_4_;
      auVar81._24_4_ = (fVar325 + fVar325 * auVar38._24_4_) * -auVar24._24_4_;
      auVar81._28_4_ = auVar24._28_4_ ^ 0x80000000;
      auVar273 = vcmpps_avx(auVar25,auVar127,1);
      auVar273 = vorps_avx(auVar360,auVar273);
      auVar273 = vblendvps_avx(auVar81,auVar423,auVar273);
      local_720 = vmaxps_avx(auVar28,auVar273);
      auVar273 = vcmpps_avx(auVar25,ZEXT1232(auVar94) << 0x20,6);
      auVar273 = vorps_avx(auVar360,auVar273);
      auVar273 = vblendvps_avx(auVar81,auVar433,auVar273);
      auVar126 = vandps_avx(auVar126,local_5c0);
      local_400 = vminps_avx(auVar37,auVar273);
      auVar273 = vcmpps_avx(local_720,local_400,2);
      auVar360 = auVar126 & auVar273;
      if ((((((((auVar360 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar360 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar360 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar360 >> 0x7f,0) == '\0') &&
            (auVar360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar360 >> 0xbf,0) == '\0') &&
          (auVar360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar360[0x1f]) {
        auVar249 = ZEXT3264(auVar396);
        auVar424 = ZEXT3264(auVar422);
        auVar362 = ZEXT3264(local_840);
        auVar397 = ZEXT3264(auVar394);
      }
      else {
        auVar360 = vminps_avx(auVar268,local_680);
        auVar24 = vminps_avx(auVar26,local_660);
        auVar360 = vminps_avx(auVar360,auVar24);
        auVar360 = vsubps_avx(auVar360,local_6e0);
        auVar126 = vandps_avx(auVar273,auVar126);
        auVar103._4_4_ = fStack_39c;
        auVar103._0_4_ = local_3a0;
        auVar103._8_4_ = fStack_398;
        auVar103._12_4_ = fStack_394;
        auVar103._16_4_ = fStack_390;
        auVar103._20_4_ = fStack_38c;
        auVar103._24_4_ = fStack_388;
        auVar103._28_4_ = fStack_384;
        auVar273 = vminps_avx(auVar103,auVar396);
        auVar240 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar273 = vmaxps_avx(auVar273,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar229 + fVar252 * (auVar273._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar250 + fVar254 * (auVar273._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar251 + fVar256 * (auVar273._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_a84 + fVar258 * (auVar273._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar229 + fVar252 * (auVar273._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar250 + fVar254 * (auVar273._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar251 + fVar256 * (auVar273._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_a84 + auVar273._28_4_ + 7.0;
        auVar104._4_4_ = fStack_37c;
        auVar104._0_4_ = local_380;
        auVar104._8_4_ = fStack_378;
        auVar104._12_4_ = fStack_374;
        auVar104._16_4_ = fStack_370;
        auVar104._20_4_ = fStack_36c;
        auVar104._24_4_ = fStack_368;
        auVar104._28_4_ = fStack_364;
        auVar273 = vminps_avx(auVar104,auVar396);
        auVar273 = vmaxps_avx(auVar273,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar229 + fVar252 * (auVar273._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar250 + fVar254 * (auVar273._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar251 + fVar256 * (auVar273._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_a84 + fVar258 * (auVar273._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar229 + fVar252 * (auVar273._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar250 + fVar254 * (auVar273._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar251 + fVar256 * (auVar273._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_a84 + auVar273._28_4_ + 7.0;
        auVar82._4_4_ = auVar360._4_4_ * 0.99999976;
        auVar82._0_4_ = auVar360._0_4_ * 0.99999976;
        auVar82._8_4_ = auVar360._8_4_ * 0.99999976;
        auVar82._12_4_ = auVar360._12_4_ * 0.99999976;
        auVar82._16_4_ = auVar360._16_4_ * 0.99999976;
        auVar82._20_4_ = auVar360._20_4_ * 0.99999976;
        auVar82._24_4_ = auVar360._24_4_ * 0.99999976;
        auVar82._28_4_ = 0x3f7ffffc;
        auVar273 = vmaxps_avx(ZEXT832(0) << 0x20,auVar82);
        auVar83._4_4_ = auVar273._4_4_ * auVar273._4_4_;
        auVar83._0_4_ = auVar273._0_4_ * auVar273._0_4_;
        auVar83._8_4_ = auVar273._8_4_ * auVar273._8_4_;
        auVar83._12_4_ = auVar273._12_4_ * auVar273._12_4_;
        auVar83._16_4_ = auVar273._16_4_ * auVar273._16_4_;
        auVar83._20_4_ = auVar273._20_4_ * auVar273._20_4_;
        auVar83._24_4_ = auVar273._24_4_ * auVar273._24_4_;
        auVar83._28_4_ = auVar273._28_4_;
        local_940 = vsubps_avx(auVar373,auVar83);
        auVar84._4_4_ = local_940._4_4_ * (float)local_6c0._4_4_;
        auVar84._0_4_ = local_940._0_4_ * (float)local_6c0._0_4_;
        auVar84._8_4_ = local_940._8_4_ * fStack_6b8;
        auVar84._12_4_ = local_940._12_4_ * fStack_6b4;
        auVar84._16_4_ = local_940._16_4_ * fStack_6b0;
        auVar84._20_4_ = local_940._20_4_ * fStack_6ac;
        auVar84._24_4_ = local_940._24_4_ * fStack_6a8;
        auVar84._28_4_ = auVar273._28_4_;
        auVar360 = vsubps_avx(local_6a0,auVar84);
        auVar273 = vcmpps_avx(auVar360,ZEXT832(0) << 0x20,5);
        if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar273 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar273 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar273 >> 0x7f,0) == '\0') &&
              (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar273 >> 0xbf,0) == '\0') &&
            (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar273[0x1f]) {
          auVar306 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar287 = ZEXT828(0) << 0x20;
          auVar267 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_aa0 = ZEXT832(0) << 0x20;
          _local_c20 = local_aa0._0_28_;
          auVar331._8_4_ = 0x7f800000;
          auVar331._0_8_ = 0x7f8000007f800000;
          auVar331._12_4_ = 0x7f800000;
          auVar331._16_4_ = 0x7f800000;
          auVar331._20_4_ = 0x7f800000;
          auVar331._24_4_ = 0x7f800000;
          auVar331._28_4_ = 0x7f800000;
          auVar375._8_4_ = 0xff800000;
          auVar375._0_8_ = 0xff800000ff800000;
          auVar375._12_4_ = 0xff800000;
          auVar375._16_4_ = 0xff800000;
          auVar375._20_4_ = 0xff800000;
          auVar375._24_4_ = 0xff800000;
          auVar375._28_4_ = 0xff800000;
          local_940 = auVar27;
        }
        else {
          auVar24 = vrcpps_avx(local_320);
          fVar179 = auVar24._0_4_;
          auVar243._0_4_ = local_320._0_4_ * fVar179;
          fVar228 = auVar24._4_4_;
          auVar243._4_4_ = local_320._4_4_ * fVar228;
          fVar255 = auVar24._8_4_;
          auVar243._8_4_ = local_320._8_4_ * fVar255;
          fVar277 = auVar24._12_4_;
          auVar243._12_4_ = local_320._12_4_ * fVar277;
          fVar282 = auVar24._16_4_;
          auVar243._16_4_ = local_320._16_4_ * fVar282;
          fVar300 = auVar24._20_4_;
          auVar243._20_4_ = local_320._20_4_ * fVar300;
          fVar325 = auVar24._24_4_;
          auVar243._24_4_ = local_320._24_4_ * fVar325;
          auVar243._28_4_ = 0;
          auVar26 = vsubps_avx(auVar396,auVar243);
          auVar25 = vsqrtps_avx(auVar360);
          fVar179 = fVar179 + fVar179 * auVar26._0_4_;
          fVar228 = fVar228 + fVar228 * auVar26._4_4_;
          fVar255 = fVar255 + fVar255 * auVar26._8_4_;
          fVar277 = fVar277 + fVar277 * auVar26._12_4_;
          fVar282 = fVar282 + fVar282 * auVar26._16_4_;
          fVar300 = fVar300 + fVar300 * auVar26._20_4_;
          fVar325 = fVar325 + fVar325 * auVar26._24_4_;
          auVar27 = vsubps_avx(local_300,auVar25);
          fVar426 = auVar27._0_4_ * fVar179;
          fVar427 = auVar27._4_4_ * fVar228;
          auVar85._4_4_ = fVar427;
          auVar85._0_4_ = fVar426;
          fVar428 = auVar27._8_4_ * fVar255;
          auVar85._8_4_ = fVar428;
          fVar429 = auVar27._12_4_ * fVar277;
          auVar85._12_4_ = fVar429;
          fVar430 = auVar27._16_4_ * fVar282;
          auVar85._16_4_ = fVar430;
          fVar442 = auVar27._20_4_ * fVar300;
          auVar85._20_4_ = fVar442;
          fVar444 = auVar27._24_4_ * fVar325;
          auVar85._24_4_ = fVar444;
          auVar85._28_4_ = fVar201;
          auVar27 = vsubps_avx(auVar25,local_3e0);
          fVar179 = auVar27._0_4_ * fVar179;
          fVar228 = auVar27._4_4_ * fVar228;
          auVar86._4_4_ = fVar228;
          auVar86._0_4_ = fVar179;
          fVar255 = auVar27._8_4_ * fVar255;
          auVar86._8_4_ = fVar255;
          fVar277 = auVar27._12_4_ * fVar277;
          auVar86._12_4_ = fVar277;
          fVar282 = auVar27._16_4_ * fVar282;
          auVar86._16_4_ = fVar282;
          fVar300 = auVar27._20_4_ * fVar300;
          auVar86._20_4_ = fVar300;
          fVar325 = auVar27._24_4_ * fVar325;
          auVar86._24_4_ = fVar325;
          auVar86._28_4_ = 0x7f800000;
          fVar229 = (fVar426 * local_600._0_4_ + local_620._0_4_) * fVar223;
          fVar250 = (fVar427 * local_600._4_4_ + local_620._4_4_) * fVar225;
          fVar251 = (fVar428 * local_600._8_4_ + local_620._8_4_) * fVar257;
          fVar252 = (fVar429 * local_600._12_4_ + local_620._12_4_) * fVar278;
          fVar254 = (fVar430 * local_600._16_4_ + local_620._16_4_) * fVar292;
          fVar256 = (fVar442 * local_600._20_4_ + local_620._20_4_) * fVar302;
          fVar258 = (fVar444 * local_600._24_4_ + local_620._24_4_) * fVar401;
          auVar165._0_4_ = local_9a0 + fVar177 * fVar229;
          auVar165._4_4_ = fStack_99c + fVar224 * fVar250;
          auVar165._8_4_ = fStack_998 + fVar253 * fVar251;
          auVar165._12_4_ = fStack_994 + fVar276 * fVar252;
          auVar165._16_4_ = fStack_990 + fVar281 * fVar254;
          auVar165._20_4_ = fStack_98c + fVar298 * fVar256;
          auVar165._24_4_ = fStack_988 + fVar398 * fVar258;
          auVar165._28_4_ = fStack_984 + auVar24._28_4_ + auVar26._28_4_ + local_620._28_4_;
          auVar87._4_4_ = fVar427 * (float)local_8e0._4_4_;
          auVar87._0_4_ = fVar426 * (float)local_8e0._0_4_;
          auVar87._8_4_ = fVar428 * fStack_8d8;
          auVar87._12_4_ = fVar429 * fStack_8d4;
          auVar87._16_4_ = fVar430 * fStack_8d0;
          auVar87._20_4_ = fVar442 * fStack_8cc;
          auVar87._24_4_ = fVar444 * fStack_8c8;
          auVar87._28_4_ = auVar25._28_4_;
          auVar26 = vsubps_avx(auVar87,auVar165);
          auVar272._0_4_ = fVar335 + fVar174 * fVar229;
          auVar272._4_4_ = fVar344 + fVar175 * fVar250;
          auVar272._8_4_ = fVar345 + fVar226 * fVar251;
          auVar272._12_4_ = fVar346 + fVar260 * fVar252;
          auVar272._16_4_ = fVar347 + fVar279 * fVar254;
          auVar272._20_4_ = fVar348 + fVar294 * fVar256;
          auVar272._24_4_ = fVar349 + fVar384 * fVar258;
          auVar272._28_4_ = fVar350 + auVar25._28_4_;
          auVar88._4_4_ = fVar201 * fVar427;
          auVar88._0_4_ = fVar201 * fVar426;
          auVar88._8_4_ = fVar201 * fVar428;
          auVar88._12_4_ = fVar201 * fVar429;
          auVar88._16_4_ = fVar201 * fVar430;
          auVar88._20_4_ = fVar201 * fVar442;
          auVar88._24_4_ = fVar201 * fVar444;
          auVar88._28_4_ = 0x3e000000;
          auVar24 = vsubps_avx(auVar88,auVar272);
          _local_c20 = auVar24._0_28_;
          auVar244._0_4_ = fVar178 + fVar222 * fVar229;
          auVar244._4_4_ = fVar194 + fVar176 * fVar250;
          auVar244._8_4_ = fVar195 + fVar227 * fVar251;
          auVar244._12_4_ = fVar196 + fVar259 * fVar252;
          auVar244._16_4_ = fVar197 + fVar280 * fVar254;
          auVar244._20_4_ = fVar198 + fVar296 * fVar256;
          auVar244._24_4_ = fVar199 + fVar385 * fVar258;
          auVar244._28_4_ = fVar200 + auVar27._28_4_;
          auVar89._4_4_ = (float)local_700._4_4_ * fVar427;
          auVar89._0_4_ = (float)local_700._0_4_ * fVar426;
          auVar89._8_4_ = fStack_6f8 * fVar428;
          auVar89._12_4_ = fStack_6f4 * fVar429;
          auVar89._16_4_ = fStack_6f0 * fVar430;
          auVar89._20_4_ = fStack_6ec * fVar442;
          auVar89._24_4_ = fStack_6e8 * fVar444;
          auVar89._28_4_ = 0x3e000000;
          _local_aa0 = vsubps_avx(auVar89,auVar244);
          fVar223 = (fVar179 * local_600._0_4_ + local_620._0_4_) * fVar223;
          fVar225 = (fVar228 * local_600._4_4_ + local_620._4_4_) * fVar225;
          fVar257 = (fVar255 * local_600._8_4_ + local_620._8_4_) * fVar257;
          fVar278 = (fVar277 * local_600._12_4_ + local_620._12_4_) * fVar278;
          fVar292 = (fVar282 * local_600._16_4_ + local_620._16_4_) * fVar292;
          fVar302 = (fVar300 * local_600._20_4_ + local_620._20_4_) * fVar302;
          fVar401 = (fVar325 * local_600._24_4_ + local_620._24_4_) * fVar401;
          auVar245._0_4_ = local_9a0 + fVar177 * fVar223;
          auVar245._4_4_ = fStack_99c + fVar224 * fVar225;
          auVar245._8_4_ = fStack_998 + fVar253 * fVar257;
          auVar245._12_4_ = fStack_994 + fVar276 * fVar278;
          auVar245._16_4_ = fStack_990 + fVar281 * fVar292;
          auVar245._20_4_ = fStack_98c + fVar298 * fVar302;
          auVar245._24_4_ = fStack_988 + fVar398 * fVar401;
          auVar245._28_4_ = fStack_984 + local_aa0._28_4_ + local_620._28_4_;
          auVar90._4_4_ = fVar228 * (float)local_8e0._4_4_;
          auVar90._0_4_ = fVar179 * (float)local_8e0._0_4_;
          auVar90._8_4_ = fVar255 * fStack_8d8;
          auVar90._12_4_ = fVar277 * fStack_8d4;
          auVar90._16_4_ = fVar282 * fStack_8d0;
          auVar90._20_4_ = fVar300 * fStack_8cc;
          auVar90._24_4_ = fVar325 * fStack_8c8;
          auVar90._28_4_ = fStack_8c4;
          auVar24 = vsubps_avx(auVar90,auVar245);
          auVar240 = auVar24._0_28_;
          auVar310._0_4_ = fVar335 + fVar174 * fVar223;
          auVar310._4_4_ = fVar344 + fVar175 * fVar225;
          auVar310._8_4_ = fVar345 + fVar226 * fVar257;
          auVar310._12_4_ = fVar346 + fVar260 * fVar278;
          auVar310._16_4_ = fVar347 + fVar279 * fVar292;
          auVar310._20_4_ = fVar348 + fVar294 * fVar302;
          auVar310._24_4_ = fVar349 + fVar384 * fVar401;
          auVar310._28_4_ = fVar350 + fStack_8c4;
          auVar91._4_4_ = fVar201 * fVar228;
          auVar91._0_4_ = fVar201 * fVar179;
          auVar91._8_4_ = fVar201 * fVar255;
          auVar91._12_4_ = fVar201 * fVar277;
          auVar91._16_4_ = fVar201 * fVar282;
          auVar91._20_4_ = fVar201 * fVar300;
          auVar91._24_4_ = fVar201 * fVar325;
          auVar91._28_4_ = local_2c0._28_4_;
          auVar24 = vsubps_avx(auVar91,auVar310);
          auVar306 = auVar24._0_28_;
          auVar290._0_4_ = fVar178 + fVar222 * fVar223;
          auVar290._4_4_ = fVar194 + fVar176 * fVar225;
          auVar290._8_4_ = fVar195 + fVar227 * fVar257;
          auVar290._12_4_ = fVar196 + fVar259 * fVar278;
          auVar290._16_4_ = fVar197 + fVar280 * fVar292;
          auVar290._20_4_ = fVar198 + fVar296 * fVar302;
          auVar290._24_4_ = fVar199 + fVar385 * fVar401;
          auVar290._28_4_ = fVar200 + 0.125;
          auVar92._4_4_ = (float)local_700._4_4_ * fVar228;
          auVar92._0_4_ = (float)local_700._0_4_ * fVar179;
          auVar92._8_4_ = fStack_6f8 * fVar255;
          auVar92._12_4_ = fStack_6f4 * fVar277;
          auVar92._16_4_ = fStack_6f0 * fVar282;
          auVar92._20_4_ = fStack_6ec * fVar300;
          auVar92._24_4_ = fStack_6e8 * fVar325;
          auVar92._28_4_ = local_2c0._28_4_;
          auVar24 = vsubps_avx(auVar92,auVar290);
          auVar287 = auVar24._0_28_;
          auVar360 = vcmpps_avx(auVar360,_DAT_01f7b000,5);
          auVar332._8_4_ = 0x7f800000;
          auVar332._0_8_ = 0x7f8000007f800000;
          auVar332._12_4_ = 0x7f800000;
          auVar332._16_4_ = 0x7f800000;
          auVar332._20_4_ = 0x7f800000;
          auVar332._24_4_ = 0x7f800000;
          auVar332._28_4_ = 0x7f800000;
          auVar331 = vblendvps_avx(auVar332,auVar85,auVar360);
          auVar24 = vmaxps_avx(local_5e0,local_3c0);
          auVar93._4_4_ = auVar24._4_4_ * 1.9073486e-06;
          auVar93._0_4_ = auVar24._0_4_ * 1.9073486e-06;
          auVar93._8_4_ = auVar24._8_4_ * 1.9073486e-06;
          auVar93._12_4_ = auVar24._12_4_ * 1.9073486e-06;
          auVar93._16_4_ = auVar24._16_4_ * 1.9073486e-06;
          auVar93._20_4_ = auVar24._20_4_ * 1.9073486e-06;
          auVar93._24_4_ = auVar24._24_4_ * 1.9073486e-06;
          auVar93._28_4_ = auVar24._28_4_;
          auVar24 = vcmpps_avx(local_2e0,auVar93,1);
          auVar376._8_4_ = 0xff800000;
          auVar376._0_8_ = 0xff800000ff800000;
          auVar376._12_4_ = 0xff800000;
          auVar376._16_4_ = 0xff800000;
          auVar376._20_4_ = 0xff800000;
          auVar376._24_4_ = 0xff800000;
          auVar376._28_4_ = 0xff800000;
          auVar375 = vblendvps_avx(auVar376,auVar86,auVar360);
          auVar25 = auVar360 & auVar24;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            auVar273 = vandps_avx(auVar24,auVar360);
            auVar209 = vpackssdw_avx(auVar273._0_16_,auVar273._16_16_);
            auVar25 = vcmpps_avx(local_940,_DAT_01f7b000,2);
            auVar173._8_4_ = 0xff800000;
            auVar173._0_8_ = 0xff800000ff800000;
            auVar173._12_4_ = 0xff800000;
            auVar173._16_4_ = 0xff800000;
            auVar173._20_4_ = 0xff800000;
            auVar173._24_4_ = 0xff800000;
            auVar173._28_4_ = 0xff800000;
            auVar361._8_4_ = 0x7f800000;
            auVar361._0_8_ = 0x7f8000007f800000;
            auVar361._12_4_ = 0x7f800000;
            auVar361._16_4_ = 0x7f800000;
            auVar361._20_4_ = 0x7f800000;
            auVar361._24_4_ = 0x7f800000;
            auVar361._28_4_ = 0x7f800000;
            auVar24 = vblendvps_avx(auVar361,auVar173,auVar25);
            auVar202 = vpmovsxwd_avx(auVar209);
            auVar209 = vpunpckhwd_avx(auVar209,auVar209);
            auVar434._16_16_ = auVar209;
            auVar434._0_16_ = auVar202;
            auVar331 = vblendvps_avx(auVar331,auVar24,auVar434);
            auVar24 = vblendvps_avx(auVar173,auVar361,auVar25);
            auVar375 = vblendvps_avx(auVar375,auVar24,auVar434);
            auVar221._0_8_ = auVar273._0_8_ ^ 0xffffffffffffffff;
            auVar221._8_4_ = auVar273._8_4_ ^ 0xffffffff;
            auVar221._12_4_ = auVar273._12_4_ ^ 0xffffffff;
            auVar221._16_4_ = auVar273._16_4_ ^ 0xffffffff;
            auVar221._20_4_ = auVar273._20_4_ ^ 0xffffffff;
            auVar221._24_4_ = auVar273._24_4_ ^ 0xffffffff;
            auVar221._28_4_ = auVar273._28_4_ ^ 0xffffffff;
            auVar273 = vorps_avx(auVar25,auVar221);
            auVar273 = vandps_avx(auVar360,auVar273);
          }
          auVar267 = auVar26._0_28_;
        }
        auVar424 = ZEXT3264(auVar422);
        auVar397 = ZEXT3264(auVar394);
        _local_460 = local_720;
        local_440 = vminps_avx(local_400,auVar331);
        _local_860 = vmaxps_avx(local_720,auVar375);
        auVar377 = ZEXT3264(_local_860);
        _local_420 = _local_860;
        auVar360 = vcmpps_avx(local_720,local_440,2);
        auVar333 = ZEXT3264(auVar360);
        local_660 = vandps_avx(auVar360,auVar126);
        auVar360 = vcmpps_avx(_local_860,local_400,2);
        local_8a0 = vandps_avx(auVar126,auVar360);
        auVar126 = vorps_avx(local_8a0,local_660);
        auVar362 = ZEXT3264(local_840);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
          auVar249 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
        else {
          auVar333 = ZEXT3264(_local_700);
          auVar190._0_8_ = auVar273._0_8_ ^ 0xffffffffffffffff;
          auVar190._8_4_ = auVar273._8_4_ ^ 0xffffffff;
          auVar190._12_4_ = auVar273._12_4_ ^ 0xffffffff;
          auVar190._16_4_ = auVar273._16_4_ ^ 0xffffffff;
          auVar190._20_4_ = auVar273._20_4_ ^ 0xffffffff;
          auVar190._24_4_ = auVar273._24_4_ ^ 0xffffffff;
          auVar190._28_4_ = (uint)auVar273._28_4_ ^ 0xffffffff;
          auVar377 = ZEXT3264(local_660);
          auVar138._0_4_ =
               (float)local_8e0._0_4_ * auVar240._0_4_ +
               fVar201 * auVar306._0_4_ + (float)local_700._0_4_ * auVar287._0_4_;
          auVar138._4_4_ =
               (float)local_8e0._4_4_ * auVar240._4_4_ +
               fVar201 * auVar306._4_4_ + (float)local_700._4_4_ * auVar287._4_4_;
          auVar138._8_4_ =
               fStack_8d8 * auVar240._8_4_ + fVar201 * auVar306._8_4_ + fStack_6f8 * auVar287._8_4_;
          auVar138._12_4_ =
               fStack_8d4 * auVar240._12_4_ +
               fVar201 * auVar306._12_4_ + fStack_6f4 * auVar287._12_4_;
          auVar138._16_4_ =
               fStack_8d0 * auVar240._16_4_ +
               fVar201 * auVar306._16_4_ + fStack_6f0 * auVar287._16_4_;
          auVar138._20_4_ =
               fStack_8cc * auVar240._20_4_ +
               fVar201 * auVar306._20_4_ + fStack_6ec * auVar287._20_4_;
          auVar138._24_4_ =
               fStack_8c8 * auVar240._24_4_ +
               fVar201 * auVar306._24_4_ + fStack_6e8 * auVar287._24_4_;
          auVar138._28_4_ = local_660._28_4_ + local_8a0._28_4_ + auVar126._28_4_;
          auVar246._8_4_ = 0x7fffffff;
          auVar246._0_8_ = 0x7fffffff7fffffff;
          auVar246._12_4_ = 0x7fffffff;
          auVar246._16_4_ = 0x7fffffff;
          auVar246._20_4_ = 0x7fffffff;
          auVar246._24_4_ = 0x7fffffff;
          auVar246._28_4_ = 0x7fffffff;
          auVar126 = vandps_avx(auVar138,auVar246);
          auVar291._8_4_ = 0x3e99999a;
          auVar291._0_8_ = 0x3e99999a3e99999a;
          auVar291._12_4_ = 0x3e99999a;
          auVar291._16_4_ = 0x3e99999a;
          auVar291._20_4_ = 0x3e99999a;
          auVar291._24_4_ = 0x3e99999a;
          auVar291._28_4_ = 0x3e99999a;
          auVar126 = vcmpps_avx(auVar126,auVar291,1);
          local_6a0 = vorps_avx(auVar126,auVar190);
          auVar139._0_4_ =
               (float)local_8e0._0_4_ * auVar267._0_4_ +
               fVar201 * (float)local_c20._0_4_ + (float)local_700._0_4_ * (float)local_aa0._0_4_;
          auVar139._4_4_ =
               (float)local_8e0._4_4_ * auVar267._4_4_ +
               fVar201 * (float)local_c20._4_4_ + (float)local_700._4_4_ * (float)local_aa0._4_4_;
          auVar139._8_4_ =
               fStack_8d8 * auVar267._8_4_ + fVar201 * fStack_c18 + fStack_6f8 * fStack_a98;
          auVar139._12_4_ =
               fStack_8d4 * auVar267._12_4_ + fVar201 * fStack_c14 + fStack_6f4 * fStack_a94;
          auVar139._16_4_ =
               fStack_8d0 * auVar267._16_4_ + fVar201 * fStack_c10 + fStack_6f0 * fStack_a90;
          auVar139._20_4_ =
               fStack_8cc * auVar267._20_4_ + fVar201 * fStack_c0c + fStack_6ec * fStack_a8c;
          auVar139._24_4_ =
               fStack_8c8 * auVar267._24_4_ + fVar201 * fStack_c08 + fStack_6e8 * fStack_a88;
          auVar139._28_4_ = local_6a0._28_4_ + auVar273._28_4_ + local_660._28_4_;
          auVar126 = vandps_avx(auVar139,auVar246);
          auVar126 = vcmpps_avx(auVar126,auVar291,1);
          auVar126 = vorps_avx(auVar126,auVar190);
          auVar166._8_4_ = 3;
          auVar166._0_8_ = 0x300000003;
          auVar166._12_4_ = 3;
          auVar166._16_4_ = 3;
          auVar166._20_4_ = 3;
          auVar166._24_4_ = 3;
          auVar166._28_4_ = 3;
          auVar191._8_4_ = 2;
          auVar191._0_8_ = 0x200000002;
          auVar191._12_4_ = 2;
          auVar191._16_4_ = 2;
          auVar191._20_4_ = 2;
          auVar191._24_4_ = 2;
          auVar191._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar191,auVar166,auVar126);
          _local_6c0 = ZEXT432(local_cc8);
          auVar202 = vpshufd_avx(ZEXT416(local_cc8),0);
          auVar209 = vpcmpgtd_avx(auVar126._16_16_,auVar202);
          local_6e0._0_16_ = auVar202;
          auVar202 = vpcmpgtd_avx(auVar126._0_16_,auVar202);
          auVar167._16_16_ = auVar209;
          auVar167._0_16_ = auVar202;
          local_680 = vblendps_avx(ZEXT1632(auVar202),auVar167,0xf0);
          auVar126 = vandnps_avx(local_680,local_660);
          local_880._4_4_ = local_720._4_4_ + (float)local_9c0._4_4_;
          local_880._0_4_ = local_720._0_4_ + (float)local_9c0._0_4_;
          fStack_878 = local_720._8_4_ + fStack_9b8;
          fStack_874 = local_720._12_4_ + fStack_9b4;
          fStack_870 = local_720._16_4_ + fStack_9b0;
          fStack_86c = local_720._20_4_ + fStack_9ac;
          fStack_868 = local_720._24_4_ + fStack_9a8;
          fStack_864 = local_720._28_4_ + fStack_9a4;
          auVar273 = auVar422;
          local_2c0 = auVar35;
          while( true ) {
            local_480 = auVar126;
            if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar126 >> 0x7f,0) == '\0') &&
                  (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar126 >> 0xbf,0) == '\0') &&
                (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar126[0x1f]) break;
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar360 = vblendvps_avx(auVar168,local_720,auVar126);
            auVar24 = vshufps_avx(auVar360,auVar360,0xb1);
            auVar24 = vminps_avx(auVar360,auVar24);
            auVar25 = vshufpd_avx(auVar24,auVar24,5);
            auVar24 = vminps_avx(auVar24,auVar25);
            auVar25 = vperm2f128_avx(auVar24,auVar24,1);
            auVar24 = vminps_avx(auVar24,auVar25);
            auVar360 = vcmpps_avx(auVar360,auVar24,0);
            auVar24 = auVar126 & auVar360;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0x7f,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0xbf,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar24[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar360,auVar126);
            }
            uVar105 = vmovmskps_avx(auVar126);
            uVar114 = 0;
            if (uVar105 != 0) {
              for (; (uVar105 >> uVar114 & 1) == 0; uVar114 = uVar114 + 1) {
              }
            }
            uVar107 = (ulong)uVar114;
            *(undefined4 *)(local_480 + uVar107 * 4) = 0;
            fVar144 = local_1a0[uVar107];
            uVar114 = *(uint *)(local_460 + uVar107 * 4);
            auVar126 = auVar397._0_32_;
            fVar174 = auVar31._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar333 = ZEXT1664(auVar333._0_16_);
              fVar174 = sqrtf((float)local_9e0._0_4_);
              auVar126 = auVar394;
              auVar273 = auVar422;
            }
            auVar249 = ZEXT3264(auVar126);
            auVar362 = ZEXT3264(auVar273);
            auVar100._4_4_ = fStack_a5c;
            auVar100._0_4_ = local_a60;
            auVar100._8_4_ = fStack_a58;
            auVar100._12_4_ = fStack_a54;
            auVar202 = vminps_avx(auVar100,_local_960);
            auVar209 = vmaxps_avx(auVar100,_local_960);
            auVar206 = vminps_avx(_local_a80,_local_980);
            auVar119 = vminps_avx(auVar202,auVar206);
            auVar202 = vmaxps_avx(_local_a80,_local_980);
            auVar206 = vmaxps_avx(auVar209,auVar202);
            auVar205._8_4_ = 0x7fffffff;
            auVar205._0_8_ = 0x7fffffff7fffffff;
            auVar205._12_4_ = 0x7fffffff;
            auVar209 = vandps_avx(auVar119,auVar205);
            auVar202 = vandps_avx(auVar206,auVar205);
            auVar209 = vmaxps_avx(auVar209,auVar202);
            auVar202 = vmovshdup_avx(auVar209);
            auVar202 = vmaxss_avx(auVar202,auVar209);
            auVar209 = vshufpd_avx(auVar209,auVar209,1);
            auVar209 = vmaxss_avx(auVar209,auVar202);
            local_9a0 = auVar209._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar174 * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar206,auVar206,0xff);
            auVar209 = vinsertps_avx(ZEXT416(uVar114),ZEXT416((uint)fVar144),0x10);
            auVar377 = ZEXT1664(auVar209);
            lVar110 = 5;
            do {
              do {
                auVar209 = auVar377._0_16_;
                bVar115 = lVar110 == 0;
                lVar110 = lVar110 + -1;
                auVar273 = auVar362._0_32_;
                auVar360 = auVar249._0_32_;
                if (bVar115) goto LAB_00b34505;
                auVar202 = vshufps_avx(auVar209,auVar209,0);
                auVar118._0_4_ = auVar202._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar118._4_4_ = auVar202._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar118._8_4_ = auVar202._8_4_ * fStack_9c8 + 0.0;
                auVar118._12_4_ = auVar202._12_4_ * fStack_9c4 + 0.0;
                auVar202 = vmovshdup_avx(auVar209);
                fVar223 = auVar202._0_4_;
                fVar177 = 1.0 - fVar223;
                fVar174 = fVar223 * 3.0;
                fVar144 = fVar174 + -5.0;
                fVar222 = fVar177 * fVar177;
                auVar202 = ZEXT416((uint)(fVar223 * fVar223 * -fVar177 * 0.5));
                auVar202 = vshufps_avx(auVar202,auVar202,0);
                auVar206 = ZEXT416((uint)((fVar222 * (fVar177 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar119 = ZEXT416((uint)((fVar223 * fVar223 * fVar144 + 2.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar148 = ZEXT416((uint)(fVar177 * fVar177 * -fVar223 * 0.5));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar181._0_4_ =
                     auVar148._0_4_ * local_a60 +
                     auVar119._0_4_ * (float)local_960._0_4_ +
                     auVar206._0_4_ * (float)local_a80._0_4_ +
                     auVar202._0_4_ * (float)local_980._0_4_;
                auVar181._4_4_ =
                     auVar148._4_4_ * fStack_a5c +
                     auVar119._4_4_ * (float)local_960._4_4_ +
                     auVar206._4_4_ * (float)local_a80._4_4_ +
                     auVar202._4_4_ * (float)local_980._4_4_;
                auVar181._8_4_ =
                     auVar148._8_4_ * fStack_a58 +
                     auVar119._8_4_ * fStack_958 +
                     auVar206._8_4_ * fStack_a78 + auVar202._8_4_ * fStack_978;
                auVar181._12_4_ =
                     auVar148._12_4_ * fStack_a54 +
                     auVar119._12_4_ * fStack_954 +
                     auVar206._12_4_ * fStack_a74 + auVar202._12_4_ * fStack_974;
                _local_aa0 = auVar181;
                auVar202 = vsubps_avx(auVar118,auVar181);
                _local_ae0 = auVar202;
                auVar202 = vdpps_avx(auVar202,auVar202,0x7f);
                fVar179 = auVar202._0_4_;
                if (fVar179 < 0.0) {
                  local_a00._0_4_ = fVar223 * 9.0;
                  local_a20._0_4_ = fVar144;
                  local_a40._0_4_ = fVar222;
                  local_800._0_4_ = fVar177 * -2.0;
                  fVar175 = sqrtf(fVar179);
                  fVar224 = (float)local_a00._0_4_;
                  fVar176 = (float)local_800._0_4_;
                  fVar144 = (float)local_a20._0_4_;
                  fVar222 = (float)local_a40._0_4_;
                }
                else {
                  auVar206 = vsqrtss_avx(auVar202,auVar202);
                  fVar175 = auVar206._0_4_;
                  fVar224 = fVar223 * 9.0;
                  fVar176 = fVar177 * -2.0;
                }
                auVar206 = ZEXT416((uint)((fVar223 * fVar223 + fVar223 * fVar176) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar119 = ZEXT416((uint)(((fVar177 + fVar177) * (fVar174 + 2.0) +
                                          fVar177 * fVar177 * -3.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar148 = ZEXT416((uint)((fVar144 * (fVar223 + fVar223) + fVar223 * fVar174) * 0.5)
                                  );
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar149 = ZEXT416((uint)((fVar223 * (fVar177 + fVar177) - fVar222) * 0.5));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar352._0_4_ =
                     local_a60 * auVar149._0_4_ +
                     (float)local_960._0_4_ * auVar148._0_4_ +
                     (float)local_980._0_4_ * auVar206._0_4_ +
                     (float)local_a80._0_4_ * auVar119._0_4_;
                auVar352._4_4_ =
                     fStack_a5c * auVar149._4_4_ +
                     (float)local_960._4_4_ * auVar148._4_4_ +
                     (float)local_980._4_4_ * auVar206._4_4_ +
                     (float)local_a80._4_4_ * auVar119._4_4_;
                auVar352._8_4_ =
                     fStack_a58 * auVar149._8_4_ +
                     fStack_958 * auVar148._8_4_ +
                     fStack_978 * auVar206._8_4_ + fStack_a78 * auVar119._8_4_;
                auVar352._12_4_ =
                     fStack_a54 * auVar149._12_4_ +
                     fStack_954 * auVar148._12_4_ +
                     fStack_974 * auVar206._12_4_ + fStack_a74 * auVar119._12_4_;
                auVar149 = vpermilps_avx(ZEXT416((uint)(fVar174 + -1.0)),0);
                auVar32 = vpermilps_avx(ZEXT416((uint)(fVar223 * -9.0 + 4.0)),0);
                auVar206 = vshufps_avx(ZEXT416((uint)(fVar224 + -5.0)),
                                       ZEXT416((uint)(fVar224 + -5.0)),0);
                auVar119 = ZEXT416((uint)(fVar223 * -3.0 + 2.0));
                auVar148 = vshufps_avx(auVar119,auVar119,0);
                auVar119 = vdpps_avx(auVar352,auVar352,0x7f);
                auVar150._0_4_ =
                     local_a60 * auVar148._0_4_ +
                     (float)local_960._0_4_ * auVar206._0_4_ +
                     (float)local_a80._0_4_ * auVar32._0_4_ +
                     (float)local_980._0_4_ * auVar149._0_4_;
                auVar150._4_4_ =
                     fStack_a5c * auVar148._4_4_ +
                     (float)local_960._4_4_ * auVar206._4_4_ +
                     (float)local_a80._4_4_ * auVar32._4_4_ +
                     (float)local_980._4_4_ * auVar149._4_4_;
                auVar150._8_4_ =
                     fStack_a58 * auVar148._8_4_ +
                     fStack_958 * auVar206._8_4_ +
                     fStack_a78 * auVar32._8_4_ + fStack_978 * auVar149._8_4_;
                auVar150._12_4_ =
                     fStack_a54 * auVar148._12_4_ +
                     fStack_954 * auVar206._12_4_ +
                     fStack_a74 * auVar32._12_4_ + fStack_974 * auVar149._12_4_;
                auVar206 = vblendps_avx(auVar119,_DAT_01f45a50,0xe);
                auVar148 = vrsqrtss_avx(auVar206,auVar206);
                fVar174 = auVar148._0_4_;
                fVar144 = auVar119._0_4_;
                auVar148 = vdpps_avx(auVar352,auVar150,0x7f);
                auVar149 = vshufps_avx(auVar119,auVar119,0);
                auVar151._0_4_ = auVar150._0_4_ * auVar149._0_4_;
                auVar151._4_4_ = auVar150._4_4_ * auVar149._4_4_;
                auVar151._8_4_ = auVar150._8_4_ * auVar149._8_4_;
                auVar151._12_4_ = auVar150._12_4_ * auVar149._12_4_;
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar232._0_4_ = auVar352._0_4_ * auVar148._0_4_;
                auVar232._4_4_ = auVar352._4_4_ * auVar148._4_4_;
                auVar232._8_4_ = auVar352._8_4_ * auVar148._8_4_;
                auVar232._12_4_ = auVar352._12_4_ * auVar148._12_4_;
                auVar32 = vsubps_avx(auVar151,auVar232);
                auVar148 = vrcpss_avx(auVar206,auVar206);
                auVar206 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                      ZEXT416((uint)(auVar377._0_4_ * (float)local_940._0_4_)));
                auVar148 = ZEXT416((uint)(auVar148._0_4_ * (2.0 - fVar144 * auVar148._0_4_)));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                uVar107 = CONCAT44(auVar352._4_4_,auVar352._0_4_);
                auVar263._0_8_ = uVar107 ^ 0x8000000080000000;
                auVar263._8_4_ = -auVar352._8_4_;
                auVar263._12_4_ = -auVar352._12_4_;
                auVar149 = ZEXT416((uint)(fVar174 * 1.5 +
                                         fVar144 * -0.5 * fVar174 * fVar174 * fVar174));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar207._0_4_ = auVar149._0_4_ * auVar32._0_4_ * auVar148._0_4_;
                auVar207._4_4_ = auVar149._4_4_ * auVar32._4_4_ * auVar148._4_4_;
                auVar207._8_4_ = auVar149._8_4_ * auVar32._8_4_ * auVar148._8_4_;
                auVar207._12_4_ = auVar149._12_4_ * auVar32._12_4_ * auVar148._12_4_;
                auVar285._0_4_ = auVar352._0_4_ * auVar149._0_4_;
                auVar285._4_4_ = auVar352._4_4_ * auVar149._4_4_;
                auVar285._8_4_ = auVar352._8_4_ * auVar149._8_4_;
                auVar285._12_4_ = auVar352._12_4_ * auVar149._12_4_;
                if (fVar144 < 0.0) {
                  fVar144 = sqrtf(fVar144);
                }
                else {
                  auVar119 = vsqrtss_avx(auVar119,auVar119);
                  fVar144 = auVar119._0_4_;
                }
                auVar119 = vdpps_avx(_local_ae0,auVar285,0x7f);
                fVar144 = (local_9a0 / fVar144) * (fVar175 + 1.0) +
                          auVar206._0_4_ + fVar175 * local_9a0;
                auVar148 = vdpps_avx(auVar263,auVar285,0x7f);
                auVar149 = vdpps_avx(_local_ae0,auVar207,0x7f);
                auVar32 = vdpps_avx(_local_9d0,auVar285,0x7f);
                auVar33 = vdpps_avx(_local_ae0,auVar263,0x7f);
                fVar174 = auVar148._0_4_ + auVar149._0_4_;
                fVar222 = auVar119._0_4_;
                auVar120._0_4_ = fVar222 * fVar222;
                auVar120._4_4_ = auVar119._4_4_ * auVar119._4_4_;
                auVar120._8_4_ = auVar119._8_4_ * auVar119._8_4_;
                auVar120._12_4_ = auVar119._12_4_ * auVar119._12_4_;
                auVar149 = vsubps_avx(auVar202,auVar120);
                auVar148 = vdpps_avx(_local_ae0,_local_9d0,0x7f);
                fVar177 = auVar33._0_4_ - fVar222 * fVar174;
                fVar223 = auVar148._0_4_ - fVar222 * auVar32._0_4_;
                auVar148 = vrsqrtss_avx(auVar149,auVar149);
                fVar175 = auVar149._0_4_;
                fVar222 = auVar148._0_4_;
                fVar222 = fVar222 * 1.5 + fVar175 * -0.5 * fVar222 * fVar222 * fVar222;
                if (fVar175 < 0.0) {
                  local_a00._0_4_ = fVar177;
                  local_a20._0_4_ = fVar223;
                  local_a40._0_4_ = fVar222;
                  fVar175 = sqrtf(fVar175);
                  fVar222 = (float)local_a40._0_4_;
                  fVar177 = (float)local_a00._0_4_;
                  fVar223 = (float)local_a20._0_4_;
                }
                else {
                  auVar148 = vsqrtss_avx(auVar149,auVar149);
                  fVar175 = auVar148._0_4_;
                }
                auVar362 = ZEXT3264(auVar422);
                auVar249 = ZEXT3264(auVar394);
                auVar333 = ZEXT1664(auVar352);
                auVar33 = vpermilps_avx(_local_aa0,0xff);
                auVar34 = vshufps_avx(auVar352,auVar352,0xff);
                fVar177 = fVar177 * fVar222 - auVar34._0_4_;
                auVar233._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
                auVar233._8_4_ = auVar32._8_4_ ^ 0x80000000;
                auVar233._12_4_ = auVar32._12_4_ ^ 0x80000000;
                auVar264._0_4_ = -fVar177;
                auVar264._4_4_ = 0x80000000;
                auVar264._8_4_ = 0x80000000;
                auVar264._12_4_ = 0x80000000;
                auVar148 = vinsertps_avx(auVar264,ZEXT416((uint)(fVar223 * fVar222)),0x1c);
                auVar32 = vmovsldup_avx(ZEXT416((uint)(fVar174 * fVar223 * fVar222 -
                                                      auVar32._0_4_ * fVar177)));
                auVar148 = vdivps_avx(auVar148,auVar32);
                auVar149 = vinsertps_avx(ZEXT416((uint)fVar174),auVar233,0x10);
                auVar149 = vdivps_avx(auVar149,auVar32);
                auVar32 = vmovsldup_avx(auVar119);
                auVar121 = ZEXT416((uint)(fVar175 - auVar33._0_4_));
                auVar33 = vmovsldup_avx(auVar121);
                auVar182._0_4_ = auVar32._0_4_ * auVar148._0_4_ + auVar33._0_4_ * auVar149._0_4_;
                auVar182._4_4_ = auVar32._4_4_ * auVar148._4_4_ + auVar33._4_4_ * auVar149._4_4_;
                auVar182._8_4_ = auVar32._8_4_ * auVar148._8_4_ + auVar33._8_4_ * auVar149._8_4_;
                auVar182._12_4_ =
                     auVar32._12_4_ * auVar148._12_4_ + auVar33._12_4_ * auVar149._12_4_;
                auVar148 = vsubps_avx(auVar209,auVar182);
                auVar377 = ZEXT1664(auVar148);
                auVar183._8_4_ = 0x7fffffff;
                auVar183._0_8_ = 0x7fffffff7fffffff;
                auVar183._12_4_ = 0x7fffffff;
                auVar209 = vandps_avx(auVar119,auVar183);
              } while (fVar144 <= auVar209._0_4_);
              auVar208._8_4_ = 0x7fffffff;
              auVar208._0_8_ = 0x7fffffff7fffffff;
              auVar208._12_4_ = 0x7fffffff;
              auVar209 = vandps_avx(auVar121,auVar208);
            } while ((float)local_820._0_4_ * 1.9073486e-06 + auVar206._0_4_ + fVar144 <=
                     auVar209._0_4_);
            fVar144 = auVar148._0_4_ + (float)local_910._0_4_;
            auVar273 = auVar422;
            auVar360 = auVar394;
            if ((fVar8 <= fVar144) && (fVar174 = *(float *)(ray + k * 4 + 0x80), fVar144 <= fVar174)
               ) {
              auVar209 = vmovshdup_avx(auVar148);
              fVar222 = auVar209._0_4_;
              if ((0.0 <= fVar222) && (fVar222 <= 1.0)) {
                auVar209 = vrsqrtss_avx(auVar202,auVar202);
                fVar177 = auVar209._0_4_;
                pGVar19 = (context->scene->geometries).items[uVar109].ptr;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar209 = ZEXT416((uint)(fVar177 * 1.5 +
                                           fVar179 * -0.5 * fVar177 * fVar177 * fVar177));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar210._0_4_ = auVar209._0_4_ * (float)local_ae0._0_4_;
                  auVar210._4_4_ = auVar209._4_4_ * (float)local_ae0._4_4_;
                  auVar210._8_4_ = auVar209._8_4_ * fStack_ad8;
                  auVar210._12_4_ = auVar209._12_4_ * fStack_ad4;
                  auVar152._0_4_ = auVar352._0_4_ + auVar34._0_4_ * auVar210._0_4_;
                  auVar152._4_4_ = auVar352._4_4_ + auVar34._4_4_ * auVar210._4_4_;
                  auVar152._8_4_ = auVar352._8_4_ + auVar34._8_4_ * auVar210._8_4_;
                  auVar152._12_4_ = auVar352._12_4_ + auVar34._12_4_ * auVar210._12_4_;
                  auVar209 = vshufps_avx(auVar210,auVar210,0xc9);
                  auVar202 = vshufps_avx(auVar352,auVar352,0xc9);
                  auVar211._0_4_ = auVar202._0_4_ * auVar210._0_4_;
                  auVar211._4_4_ = auVar202._4_4_ * auVar210._4_4_;
                  auVar211._8_4_ = auVar202._8_4_ * auVar210._8_4_;
                  auVar211._12_4_ = auVar202._12_4_ * auVar210._12_4_;
                  auVar234._0_4_ = auVar352._0_4_ * auVar209._0_4_;
                  auVar234._4_4_ = auVar352._4_4_ * auVar209._4_4_;
                  auVar234._8_4_ = auVar352._8_4_ * auVar209._8_4_;
                  auVar234._12_4_ = auVar352._12_4_ * auVar209._12_4_;
                  auVar206 = vsubps_avx(auVar234,auVar211);
                  auVar209 = vshufps_avx(auVar206,auVar206,0xc9);
                  auVar202 = vshufps_avx(auVar152,auVar152,0xc9);
                  auVar235._0_4_ = auVar202._0_4_ * auVar209._0_4_;
                  auVar235._4_4_ = auVar202._4_4_ * auVar209._4_4_;
                  auVar235._8_4_ = auVar202._8_4_ * auVar209._8_4_;
                  auVar235._12_4_ = auVar202._12_4_ * auVar209._12_4_;
                  auVar209 = vshufps_avx(auVar206,auVar206,0xd2);
                  auVar153._0_4_ = auVar152._0_4_ * auVar209._0_4_;
                  auVar153._4_4_ = auVar152._4_4_ * auVar209._4_4_;
                  auVar153._8_4_ = auVar152._8_4_ * auVar209._8_4_;
                  auVar153._12_4_ = auVar152._12_4_ * auVar209._12_4_;
                  auVar209 = vsubps_avx(auVar235,auVar153);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar144;
                    uVar112 = vextractps_avx(auVar209,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar112;
                    uVar112 = vextractps_avx(auVar209,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar112;
                    *(int *)(ray + k * 4 + 0xe0) = auVar209._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar222;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_aa8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar109;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar148,auVar148,0x55);
                    auVar202 = vshufps_avx(auVar209,auVar209,0x55);
                    auStack_7b0 = vshufps_avx(auVar209,auVar209,0xaa);
                    local_7a0 = vshufps_avx(auVar209,auVar209,0);
                    local_7c0 = (RTCHitN  [16])auVar202;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar114 = context->user->instPrimID[0];
                    auVar154._4_4_ = uVar114;
                    auVar154._0_4_ = uVar114;
                    auVar154._8_4_ = uVar114;
                    auVar154._12_4_ = uVar114;
                    auStack_740 = auVar154;
                    *(float *)(ray + k * 4 + 0x80) = fVar144;
                    local_8c0._0_16_ = *local_ab0;
                    local_b10.valid = (int *)local_8c0;
                    local_b10.geometryUserPtr = pGVar19->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_7c0;
                    local_b10.N = 4;
                    auVar209 = *local_ab0;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar333 = ZEXT1664(auVar352);
                      auVar377 = ZEXT1664(auVar148);
                      (*pGVar19->intersectionFilterN)(&local_b10);
                      auVar362._8_56_ = extraout_var;
                      auVar362._0_8_ = extraout_XMM1_Qa;
                      auVar154 = auVar362._0_16_;
                      auVar209 = local_8c0._0_16_;
                    }
                    if (auVar209 == (undefined1  [16])0x0) {
                      auVar202 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar209 = vpcmpeqd_avx(auVar154,auVar154);
                      auVar202 = auVar202 ^ auVar209;
                    }
                    else {
                      p_Var23 = context->args->filter;
                      auVar206 = vpcmpeqd_avx(auVar202,auVar202);
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar333 = ZEXT1664(auVar333._0_16_);
                        auVar377 = ZEXT1664(auVar377._0_16_);
                        (*p_Var23)(&local_b10);
                        auVar206 = vpcmpeqd_avx(auVar206,auVar206);
                        auVar209 = local_8c0._0_16_;
                      }
                      auVar119 = vpcmpeqd_avx(auVar209,_DAT_01f45a50);
                      auVar202 = auVar119 ^ auVar206;
                      if (auVar209 != (undefined1  [16])0x0) {
                        auVar119 = auVar119 ^ auVar206;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar209;
                        auVar209 = vmaskmovps_avx(auVar119,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar209;
                      }
                    }
                    auVar122._8_8_ = 0x100000001;
                    auVar122._0_8_ = 0x100000001;
                    if ((auVar122 & auVar202) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar174;
                    }
                  }
                }
              }
            }
LAB_00b34505:
            uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar342._4_4_ = uVar112;
            auVar342._0_4_ = uVar112;
            auVar342._8_4_ = uVar112;
            auVar342._12_4_ = uVar112;
            auVar342._16_4_ = uVar112;
            auVar342._20_4_ = uVar112;
            auVar342._24_4_ = uVar112;
            auVar342._28_4_ = uVar112;
            auVar249 = ZEXT3264(auVar342);
            auVar126 = vcmpps_avx(_local_880,auVar342,2);
            auVar126 = vandps_avx(auVar126,local_480);
            auVar397 = ZEXT3264(auVar360);
            auVar362 = ZEXT3264(local_840);
          }
          auVar140._0_4_ = (float)local_9c0._0_4_ + (float)local_860._0_4_;
          auVar140._4_4_ = (float)local_9c0._4_4_ + (float)local_860._4_4_;
          auVar140._8_4_ = fStack_9b8 + fStack_858;
          auVar140._12_4_ = fStack_9b4 + fStack_854;
          auVar140._16_4_ = fStack_9b0 + fStack_850;
          auVar140._20_4_ = fStack_9ac + fStack_84c;
          auVar140._24_4_ = fStack_9a8 + fStack_848;
          auVar140._28_4_ = fStack_9a4 + fStack_844;
          auVar209 = vshufps_avx(auVar249._0_16_,auVar249._0_16_,0);
          auVar169._16_16_ = auVar209;
          auVar169._0_16_ = auVar209;
          auVar126 = vcmpps_avx(auVar140,auVar169,2);
          _local_880 = vandps_avx(auVar126,local_8a0);
          auVar141._8_4_ = 3;
          auVar141._0_8_ = 0x300000003;
          auVar141._12_4_ = 3;
          auVar141._16_4_ = 3;
          auVar141._20_4_ = 3;
          auVar141._24_4_ = 3;
          auVar141._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar170,auVar141,local_6a0);
          auVar209 = vpcmpgtd_avx(auVar126._16_16_,local_6e0._0_16_);
          auVar202 = vpshufd_avx(_local_6c0,0);
          auVar202 = vpcmpgtd_avx(auVar126._0_16_,auVar202);
          auVar171._16_16_ = auVar209;
          auVar171._0_16_ = auVar202;
          local_8a0 = vblendps_avx(ZEXT1632(auVar202),auVar171,0xf0);
          local_8c0 = vandnps_avx(local_8a0,_local_880);
          local_720 = _local_420;
          local_860._4_4_ = (float)local_9c0._4_4_ + (float)local_420._4_4_;
          local_860._0_4_ = (float)local_9c0._0_4_ + (float)local_420._0_4_;
          fStack_858 = fStack_9b8 + fStack_418;
          fStack_854 = fStack_9b4 + fStack_414;
          fStack_850 = fStack_9b0 + fStack_410;
          fStack_84c = fStack_9ac + fStack_40c;
          fStack_848 = fStack_9a8 + fStack_408;
          fStack_844 = fStack_9a4 + fStack_404;
          while( true ) {
            if ((((((((local_8c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_8c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_8c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_8c0 >> 0x7f,0) == '\0') &&
                  (local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_8c0 >> 0xbf,0) == '\0') &&
                (local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_8c0[0x1f]) break;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar126 = vblendvps_avx(auVar172,local_720,local_8c0);
            auVar360 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar360 = vminps_avx(auVar126,auVar360);
            auVar24 = vshufpd_avx(auVar360,auVar360,5);
            auVar360 = vminps_avx(auVar360,auVar24);
            auVar24 = vperm2f128_avx(auVar360,auVar360,1);
            auVar360 = vminps_avx(auVar360,auVar24);
            auVar360 = vcmpps_avx(auVar126,auVar360,0);
            auVar24 = local_8c0 & auVar360;
            auVar126 = local_8c0;
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0x7f,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0xbf,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar24[0x1f] < '\0') {
              auVar126 = vandps_avx(auVar360,local_8c0);
            }
            uVar105 = vmovmskps_avx(auVar126);
            uVar114 = 0;
            if (uVar105 != 0) {
              for (; (uVar105 >> uVar114 & 1) == 0; uVar114 = uVar114 + 1) {
              }
            }
            uVar107 = (ulong)uVar114;
            *(undefined4 *)(local_8c0 + uVar107 * 4) = 0;
            fVar144 = local_1c0[uVar107];
            uVar114 = *(uint *)(local_400 + uVar107 * 4);
            auVar126 = auVar397._0_32_;
            fVar174 = auVar147._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar333 = ZEXT1664(auVar333._0_16_);
              fVar174 = sqrtf((float)local_9e0._0_4_);
              auVar126 = auVar394;
              auVar273 = auVar422;
            }
            auVar249 = ZEXT3264(auVar126);
            auVar362 = ZEXT3264(auVar273);
            auVar101._4_4_ = fStack_a5c;
            auVar101._0_4_ = local_a60;
            auVar101._8_4_ = fStack_a58;
            auVar101._12_4_ = fStack_a54;
            auVar202 = vminps_avx(auVar101,_local_960);
            auVar209 = vmaxps_avx(auVar101,_local_960);
            auVar206 = vminps_avx(_local_a80,_local_980);
            auVar119 = vminps_avx(auVar202,auVar206);
            auVar202 = vmaxps_avx(_local_a80,_local_980);
            auVar206 = vmaxps_avx(auVar209,auVar202);
            auVar212._8_4_ = 0x7fffffff;
            auVar212._0_8_ = 0x7fffffff7fffffff;
            auVar212._12_4_ = 0x7fffffff;
            auVar209 = vandps_avx(auVar119,auVar212);
            auVar202 = vandps_avx(auVar206,auVar212);
            auVar209 = vmaxps_avx(auVar209,auVar202);
            auVar202 = vmovshdup_avx(auVar209);
            auVar202 = vmaxss_avx(auVar202,auVar209);
            auVar209 = vshufpd_avx(auVar209,auVar209,1);
            auVar209 = vmaxss_avx(auVar209,auVar202);
            local_9a0 = auVar209._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar174 * 1.9073486e-06;
            local_820._0_16_ = vshufps_avx(auVar206,auVar206,0xff);
            auVar209 = vinsertps_avx(ZEXT416(uVar114),ZEXT416((uint)fVar144),0x10);
            auVar377 = ZEXT1664(auVar209);
            lVar110 = 5;
            do {
              do {
                auVar209 = auVar377._0_16_;
                bVar115 = lVar110 == 0;
                lVar110 = lVar110 + -1;
                auVar273 = auVar362._0_32_;
                auVar126 = auVar249._0_32_;
                if (bVar115) goto LAB_00b351c7;
                auVar202 = vshufps_avx(auVar209,auVar209,0);
                auVar123._0_4_ = auVar202._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar123._4_4_ = auVar202._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar123._8_4_ = auVar202._8_4_ * fStack_9c8 + 0.0;
                auVar123._12_4_ = auVar202._12_4_ * fStack_9c4 + 0.0;
                auVar202 = vmovshdup_avx(auVar209);
                fVar223 = auVar202._0_4_;
                fVar177 = 1.0 - fVar223;
                fVar174 = fVar223 * 3.0;
                fVar144 = fVar174 + -5.0;
                fVar222 = fVar177 * fVar177;
                auVar202 = ZEXT416((uint)(fVar223 * fVar223 * -fVar177 * 0.5));
                auVar202 = vshufps_avx(auVar202,auVar202,0);
                auVar206 = ZEXT416((uint)((fVar222 * (fVar177 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar119 = ZEXT416((uint)((fVar223 * fVar223 * fVar144 + 2.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar148 = ZEXT416((uint)(fVar177 * fVar177 * -fVar223 * 0.5));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar184._0_4_ =
                     auVar148._0_4_ * local_a60 +
                     auVar119._0_4_ * (float)local_960._0_4_ +
                     auVar206._0_4_ * (float)local_a80._0_4_ +
                     auVar202._0_4_ * (float)local_980._0_4_;
                auVar184._4_4_ =
                     auVar148._4_4_ * fStack_a5c +
                     auVar119._4_4_ * (float)local_960._4_4_ +
                     auVar206._4_4_ * (float)local_a80._4_4_ +
                     auVar202._4_4_ * (float)local_980._4_4_;
                auVar184._8_4_ =
                     auVar148._8_4_ * fStack_a58 +
                     auVar119._8_4_ * fStack_958 +
                     auVar206._8_4_ * fStack_a78 + auVar202._8_4_ * fStack_978;
                auVar184._12_4_ =
                     auVar148._12_4_ * fStack_a54 +
                     auVar119._12_4_ * fStack_954 +
                     auVar206._12_4_ * fStack_a74 + auVar202._12_4_ * fStack_974;
                _local_aa0 = auVar184;
                auVar202 = vsubps_avx(auVar123,auVar184);
                _local_ae0 = auVar202;
                auVar202 = vdpps_avx(auVar202,auVar202,0x7f);
                fVar179 = auVar202._0_4_;
                if (fVar179 < 0.0) {
                  local_a00._0_4_ = fVar223 * 9.0;
                  local_a20._0_4_ = fVar144;
                  local_a40._0_4_ = fVar222;
                  local_800._0_4_ = fVar177 * -2.0;
                  fVar175 = sqrtf(fVar179);
                  fVar144 = (float)local_a20._0_4_;
                  fVar224 = (float)local_a00._0_4_;
                  fVar176 = (float)local_800._0_4_;
                  fVar222 = (float)local_a40._0_4_;
                }
                else {
                  auVar206 = vsqrtss_avx(auVar202,auVar202);
                  fVar175 = auVar206._0_4_;
                  fVar224 = fVar223 * 9.0;
                  fVar176 = fVar177 * -2.0;
                }
                auVar206 = ZEXT416((uint)((fVar223 * fVar223 + fVar223 * fVar176) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar119 = ZEXT416((uint)(((fVar177 + fVar177) * (fVar174 + 2.0) +
                                          fVar177 * fVar177 * -3.0) * 0.5));
                auVar119 = vshufps_avx(auVar119,auVar119,0);
                auVar148 = ZEXT416((uint)((fVar144 * (fVar223 + fVar223) + fVar223 * fVar174) * 0.5)
                                  );
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar149 = ZEXT416((uint)((fVar223 * (fVar177 + fVar177) - fVar222) * 0.5));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar353._0_4_ =
                     local_a60 * auVar149._0_4_ +
                     (float)local_960._0_4_ * auVar148._0_4_ +
                     (float)local_980._0_4_ * auVar206._0_4_ +
                     (float)local_a80._0_4_ * auVar119._0_4_;
                auVar353._4_4_ =
                     fStack_a5c * auVar149._4_4_ +
                     (float)local_960._4_4_ * auVar148._4_4_ +
                     (float)local_980._4_4_ * auVar206._4_4_ +
                     (float)local_a80._4_4_ * auVar119._4_4_;
                auVar353._8_4_ =
                     fStack_a58 * auVar149._8_4_ +
                     fStack_958 * auVar148._8_4_ +
                     fStack_978 * auVar206._8_4_ + fStack_a78 * auVar119._8_4_;
                auVar353._12_4_ =
                     fStack_a54 * auVar149._12_4_ +
                     fStack_954 * auVar148._12_4_ +
                     fStack_974 * auVar206._12_4_ + fStack_a74 * auVar119._12_4_;
                auVar149 = vpermilps_avx(ZEXT416((uint)(fVar174 + -1.0)),0);
                auVar32 = vpermilps_avx(ZEXT416((uint)(fVar223 * -9.0 + 4.0)),0);
                auVar206 = vshufps_avx(ZEXT416((uint)(fVar224 + -5.0)),
                                       ZEXT416((uint)(fVar224 + -5.0)),0);
                auVar119 = ZEXT416((uint)(fVar223 * -3.0 + 2.0));
                auVar148 = vshufps_avx(auVar119,auVar119,0);
                auVar119 = vdpps_avx(auVar353,auVar353,0x7f);
                auVar155._0_4_ =
                     local_a60 * auVar148._0_4_ +
                     (float)local_960._0_4_ * auVar206._0_4_ +
                     (float)local_a80._0_4_ * auVar32._0_4_ +
                     (float)local_980._0_4_ * auVar149._0_4_;
                auVar155._4_4_ =
                     fStack_a5c * auVar148._4_4_ +
                     (float)local_960._4_4_ * auVar206._4_4_ +
                     (float)local_a80._4_4_ * auVar32._4_4_ +
                     (float)local_980._4_4_ * auVar149._4_4_;
                auVar155._8_4_ =
                     fStack_a58 * auVar148._8_4_ +
                     fStack_958 * auVar206._8_4_ +
                     fStack_a78 * auVar32._8_4_ + fStack_978 * auVar149._8_4_;
                auVar155._12_4_ =
                     fStack_a54 * auVar148._12_4_ +
                     fStack_954 * auVar206._12_4_ +
                     fStack_a74 * auVar32._12_4_ + fStack_974 * auVar149._12_4_;
                auVar206 = vblendps_avx(auVar119,_DAT_01f45a50,0xe);
                auVar148 = vrsqrtss_avx(auVar206,auVar206);
                fVar174 = auVar148._0_4_;
                fVar144 = auVar119._0_4_;
                auVar148 = vdpps_avx(auVar353,auVar155,0x7f);
                auVar149 = vshufps_avx(auVar119,auVar119,0);
                auVar156._0_4_ = auVar155._0_4_ * auVar149._0_4_;
                auVar156._4_4_ = auVar155._4_4_ * auVar149._4_4_;
                auVar156._8_4_ = auVar155._8_4_ * auVar149._8_4_;
                auVar156._12_4_ = auVar155._12_4_ * auVar149._12_4_;
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                auVar236._0_4_ = auVar353._0_4_ * auVar148._0_4_;
                auVar236._4_4_ = auVar353._4_4_ * auVar148._4_4_;
                auVar236._8_4_ = auVar353._8_4_ * auVar148._8_4_;
                auVar236._12_4_ = auVar353._12_4_ * auVar148._12_4_;
                auVar32 = vsubps_avx(auVar156,auVar236);
                auVar148 = vrcpss_avx(auVar206,auVar206);
                auVar206 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                      ZEXT416((uint)(auVar377._0_4_ * (float)local_940._0_4_)));
                auVar148 = ZEXT416((uint)(auVar148._0_4_ * (2.0 - fVar144 * auVar148._0_4_)));
                auVar148 = vshufps_avx(auVar148,auVar148,0);
                uVar107 = CONCAT44(auVar353._4_4_,auVar353._0_4_);
                auVar265._0_8_ = uVar107 ^ 0x8000000080000000;
                auVar265._8_4_ = -auVar353._8_4_;
                auVar265._12_4_ = -auVar353._12_4_;
                auVar149 = ZEXT416((uint)(fVar174 * 1.5 +
                                         fVar144 * -0.5 * fVar174 * fVar174 * fVar174));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar213._0_4_ = auVar149._0_4_ * auVar32._0_4_ * auVar148._0_4_;
                auVar213._4_4_ = auVar149._4_4_ * auVar32._4_4_ * auVar148._4_4_;
                auVar213._8_4_ = auVar149._8_4_ * auVar32._8_4_ * auVar148._8_4_;
                auVar213._12_4_ = auVar149._12_4_ * auVar32._12_4_ * auVar148._12_4_;
                auVar286._0_4_ = auVar353._0_4_ * auVar149._0_4_;
                auVar286._4_4_ = auVar353._4_4_ * auVar149._4_4_;
                auVar286._8_4_ = auVar353._8_4_ * auVar149._8_4_;
                auVar286._12_4_ = auVar353._12_4_ * auVar149._12_4_;
                if (fVar144 < 0.0) {
                  fVar144 = sqrtf(fVar144);
                }
                else {
                  auVar119 = vsqrtss_avx(auVar119,auVar119);
                  fVar144 = auVar119._0_4_;
                }
                auVar119 = vdpps_avx(_local_ae0,auVar286,0x7f);
                fVar144 = (local_9a0 / fVar144) * (fVar175 + 1.0) +
                          auVar206._0_4_ + fVar175 * local_9a0;
                auVar148 = vdpps_avx(auVar265,auVar286,0x7f);
                auVar149 = vdpps_avx(_local_ae0,auVar213,0x7f);
                auVar32 = vdpps_avx(_local_9d0,auVar286,0x7f);
                auVar33 = vdpps_avx(_local_ae0,auVar265,0x7f);
                fVar174 = auVar148._0_4_ + auVar149._0_4_;
                fVar222 = auVar119._0_4_;
                auVar124._0_4_ = fVar222 * fVar222;
                auVar124._4_4_ = auVar119._4_4_ * auVar119._4_4_;
                auVar124._8_4_ = auVar119._8_4_ * auVar119._8_4_;
                auVar124._12_4_ = auVar119._12_4_ * auVar119._12_4_;
                auVar149 = vsubps_avx(auVar202,auVar124);
                auVar148 = vdpps_avx(_local_ae0,_local_9d0,0x7f);
                fVar177 = auVar33._0_4_ - fVar222 * fVar174;
                fVar223 = auVar148._0_4_ - fVar222 * auVar32._0_4_;
                auVar148 = vrsqrtss_avx(auVar149,auVar149);
                fVar175 = auVar149._0_4_;
                fVar222 = auVar148._0_4_;
                fVar222 = fVar222 * 1.5 + fVar175 * -0.5 * fVar222 * fVar222 * fVar222;
                if (fVar175 < 0.0) {
                  local_a00._0_4_ = fVar177;
                  local_a20._0_4_ = fVar223;
                  local_a40._0_4_ = fVar222;
                  fVar175 = sqrtf(fVar175);
                  fVar222 = (float)local_a40._0_4_;
                  fVar177 = (float)local_a00._0_4_;
                  fVar223 = (float)local_a20._0_4_;
                }
                else {
                  auVar148 = vsqrtss_avx(auVar149,auVar149);
                  fVar175 = auVar148._0_4_;
                }
                auVar362 = ZEXT3264(auVar422);
                auVar249 = ZEXT3264(auVar394);
                auVar333 = ZEXT1664(auVar353);
                auVar33 = vpermilps_avx(_local_aa0,0xff);
                auVar34 = vshufps_avx(auVar353,auVar353,0xff);
                fVar177 = fVar177 * fVar222 - auVar34._0_4_;
                auVar237._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
                auVar237._8_4_ = auVar32._8_4_ ^ 0x80000000;
                auVar237._12_4_ = auVar32._12_4_ ^ 0x80000000;
                auVar266._0_4_ = -fVar177;
                auVar266._4_4_ = 0x80000000;
                auVar266._8_4_ = 0x80000000;
                auVar266._12_4_ = 0x80000000;
                auVar148 = vinsertps_avx(auVar266,ZEXT416((uint)(fVar223 * fVar222)),0x1c);
                auVar32 = vmovsldup_avx(ZEXT416((uint)(fVar174 * fVar223 * fVar222 -
                                                      auVar32._0_4_ * fVar177)));
                auVar148 = vdivps_avx(auVar148,auVar32);
                auVar149 = vinsertps_avx(ZEXT416((uint)fVar174),auVar237,0x10);
                auVar149 = vdivps_avx(auVar149,auVar32);
                auVar32 = vmovsldup_avx(auVar119);
                auVar121 = ZEXT416((uint)(fVar175 - auVar33._0_4_));
                auVar33 = vmovsldup_avx(auVar121);
                auVar185._0_4_ = auVar32._0_4_ * auVar148._0_4_ + auVar33._0_4_ * auVar149._0_4_;
                auVar185._4_4_ = auVar32._4_4_ * auVar148._4_4_ + auVar33._4_4_ * auVar149._4_4_;
                auVar185._8_4_ = auVar32._8_4_ * auVar148._8_4_ + auVar33._8_4_ * auVar149._8_4_;
                auVar185._12_4_ =
                     auVar32._12_4_ * auVar148._12_4_ + auVar33._12_4_ * auVar149._12_4_;
                auVar148 = vsubps_avx(auVar209,auVar185);
                auVar377 = ZEXT1664(auVar148);
                auVar186._8_4_ = 0x7fffffff;
                auVar186._0_8_ = 0x7fffffff7fffffff;
                auVar186._12_4_ = 0x7fffffff;
                auVar209 = vandps_avx(auVar119,auVar186);
              } while (fVar144 <= auVar209._0_4_);
              auVar214._8_4_ = 0x7fffffff;
              auVar214._0_8_ = 0x7fffffff7fffffff;
              auVar214._12_4_ = 0x7fffffff;
              auVar209 = vandps_avx(auVar121,auVar214);
            } while ((float)local_820._0_4_ * 1.9073486e-06 + auVar206._0_4_ + fVar144 <=
                     auVar209._0_4_);
            fVar144 = auVar148._0_4_ + (float)local_910._0_4_;
            auVar273 = auVar422;
            auVar126 = auVar394;
            if ((fVar8 <= fVar144) && (fVar174 = *(float *)(ray + k * 4 + 0x80), fVar144 <= fVar174)
               ) {
              auVar209 = vmovshdup_avx(auVar148);
              fVar222 = auVar209._0_4_;
              if ((0.0 <= fVar222) && (fVar222 <= 1.0)) {
                auVar209 = vrsqrtss_avx(auVar202,auVar202);
                fVar177 = auVar209._0_4_;
                pGVar19 = (context->scene->geometries).items[uVar109].ptr;
                if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar209 = ZEXT416((uint)(fVar177 * 1.5 +
                                           fVar179 * -0.5 * fVar177 * fVar177 * fVar177));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar215._0_4_ = auVar209._0_4_ * (float)local_ae0._0_4_;
                  auVar215._4_4_ = auVar209._4_4_ * (float)local_ae0._4_4_;
                  auVar215._8_4_ = auVar209._8_4_ * fStack_ad8;
                  auVar215._12_4_ = auVar209._12_4_ * fStack_ad4;
                  auVar157._0_4_ = auVar353._0_4_ + auVar34._0_4_ * auVar215._0_4_;
                  auVar157._4_4_ = auVar353._4_4_ + auVar34._4_4_ * auVar215._4_4_;
                  auVar157._8_4_ = auVar353._8_4_ + auVar34._8_4_ * auVar215._8_4_;
                  auVar157._12_4_ = auVar353._12_4_ + auVar34._12_4_ * auVar215._12_4_;
                  auVar209 = vshufps_avx(auVar215,auVar215,0xc9);
                  auVar202 = vshufps_avx(auVar353,auVar353,0xc9);
                  auVar216._0_4_ = auVar202._0_4_ * auVar215._0_4_;
                  auVar216._4_4_ = auVar202._4_4_ * auVar215._4_4_;
                  auVar216._8_4_ = auVar202._8_4_ * auVar215._8_4_;
                  auVar216._12_4_ = auVar202._12_4_ * auVar215._12_4_;
                  auVar238._0_4_ = auVar353._0_4_ * auVar209._0_4_;
                  auVar238._4_4_ = auVar353._4_4_ * auVar209._4_4_;
                  auVar238._8_4_ = auVar353._8_4_ * auVar209._8_4_;
                  auVar238._12_4_ = auVar353._12_4_ * auVar209._12_4_;
                  auVar206 = vsubps_avx(auVar238,auVar216);
                  auVar209 = vshufps_avx(auVar206,auVar206,0xc9);
                  auVar202 = vshufps_avx(auVar157,auVar157,0xc9);
                  auVar239._0_4_ = auVar202._0_4_ * auVar209._0_4_;
                  auVar239._4_4_ = auVar202._4_4_ * auVar209._4_4_;
                  auVar239._8_4_ = auVar202._8_4_ * auVar209._8_4_;
                  auVar239._12_4_ = auVar202._12_4_ * auVar209._12_4_;
                  auVar209 = vshufps_avx(auVar206,auVar206,0xd2);
                  auVar158._0_4_ = auVar157._0_4_ * auVar209._0_4_;
                  auVar158._4_4_ = auVar157._4_4_ * auVar209._4_4_;
                  auVar158._8_4_ = auVar157._8_4_ * auVar209._8_4_;
                  auVar158._12_4_ = auVar157._12_4_ * auVar209._12_4_;
                  auVar209 = vsubps_avx(auVar239,auVar158);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar144;
                    uVar112 = vextractps_avx(auVar209,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar112;
                    uVar112 = vextractps_avx(auVar209,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar112;
                    *(int *)(ray + k * 4 + 0xe0) = auVar209._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar222;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_aa8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar109;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_790 = vshufps_avx(auVar148,auVar148,0x55);
                    auVar202 = vshufps_avx(auVar209,auVar209,0x55);
                    auStack_7b0 = vshufps_avx(auVar209,auVar209,0xaa);
                    local_7a0 = vshufps_avx(auVar209,auVar209,0);
                    local_7c0 = (RTCHitN  [16])auVar202;
                    local_780 = ZEXT816(0) << 0x20;
                    local_770 = local_7e0._0_8_;
                    uStack_768 = local_7e0._8_8_;
                    local_760 = local_7d0;
                    vcmpps_avx(ZEXT1632(local_7d0),ZEXT1632(local_7d0),0xf);
                    uStack_74c = context->user->instID[0];
                    local_750 = uStack_74c;
                    uStack_748 = uStack_74c;
                    uStack_744 = uStack_74c;
                    uVar114 = context->user->instPrimID[0];
                    auVar159._4_4_ = uVar114;
                    auVar159._0_4_ = uVar114;
                    auVar159._8_4_ = uVar114;
                    auVar159._12_4_ = uVar114;
                    auStack_740 = auVar159;
                    *(float *)(ray + k * 4 + 0x80) = fVar144;
                    local_900 = *local_ab0;
                    local_b10.valid = (int *)local_900;
                    local_b10.geometryUserPtr = pGVar19->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = local_7c0;
                    local_b10.N = 4;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar19->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar333 = ZEXT1664(auVar353);
                      auVar377 = ZEXT1664(auVar148);
                      (*pGVar19->intersectionFilterN)(&local_b10);
                      auVar249._8_56_ = extraout_var_00;
                      auVar249._0_8_ = extraout_XMM1_Qa_00;
                      auVar159 = auVar249._0_16_;
                    }
                    if (local_900 == (undefined1  [16])0x0) {
                      auVar209 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar202 = vpcmpeqd_avx(auVar159,auVar159);
                      auVar209 = auVar209 ^ auVar202;
                    }
                    else {
                      p_Var23 = context->args->filter;
                      auVar202 = vpcmpeqd_avx(auVar202,auVar202);
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar333 = ZEXT1664(auVar333._0_16_);
                        auVar377 = ZEXT1664(auVar377._0_16_);
                        (*p_Var23)(&local_b10);
                        auVar202 = vpcmpeqd_avx(auVar202,auVar202);
                      }
                      auVar206 = vpcmpeqd_avx(local_900,_DAT_01f45a50);
                      auVar209 = auVar206 ^ auVar202;
                      if (local_900 != (undefined1  [16])0x0) {
                        auVar206 = auVar206 ^ auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])local_b10.hit);
                        *(undefined1 (*) [16])(local_b10.ray + 0xc0) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x10));
                        *(undefined1 (*) [16])(local_b10.ray + 0xd0) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x20));
                        *(undefined1 (*) [16])(local_b10.ray + 0xe0) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x30));
                        *(undefined1 (*) [16])(local_b10.ray + 0xf0) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x40));
                        *(undefined1 (*) [16])(local_b10.ray + 0x100) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x50));
                        *(undefined1 (*) [16])(local_b10.ray + 0x110) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x60));
                        *(undefined1 (*) [16])(local_b10.ray + 0x120) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x70));
                        *(undefined1 (*) [16])(local_b10.ray + 0x130) = auVar202;
                        auVar202 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                            (local_b10.hit + 0x80));
                        *(undefined1 (*) [16])(local_b10.ray + 0x140) = auVar202;
                      }
                    }
                    auVar125._8_8_ = 0x100000001;
                    auVar125._0_8_ = 0x100000001;
                    if ((auVar125 & auVar209) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar174;
                    }
                  }
                }
              }
            }
LAB_00b351c7:
            uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar343._4_4_ = uVar112;
            auVar343._0_4_ = uVar112;
            auVar343._8_4_ = uVar112;
            auVar343._12_4_ = uVar112;
            auVar343._16_4_ = uVar112;
            auVar343._20_4_ = uVar112;
            auVar343._24_4_ = uVar112;
            auVar343._28_4_ = uVar112;
            auVar249 = ZEXT3264(auVar343);
            auVar360 = vcmpps_avx(_local_860,auVar343,2);
            local_8c0 = vandps_avx(auVar360,local_8c0);
            auVar397 = ZEXT3264(auVar126);
            auVar362 = ZEXT3264(local_840);
          }
          auVar424 = ZEXT3264(auVar273);
          auVar126 = vandps_avx(local_680,local_660);
          auVar273 = vandps_avx(local_8a0,_local_880);
          auVar192._0_4_ = (float)local_9c0._0_4_ + local_460._0_4_;
          auVar192._4_4_ = (float)local_9c0._4_4_ + local_460._4_4_;
          auVar192._8_4_ = fStack_9b8 + local_460._8_4_;
          auVar192._12_4_ = fStack_9b4 + local_460._12_4_;
          auVar192._16_4_ = fStack_9b0 + local_460._16_4_;
          auVar192._20_4_ = fStack_9ac + local_460._20_4_;
          auVar192._24_4_ = fStack_9a8 + local_460._24_4_;
          auVar192._28_4_ = fStack_9a4 + local_460._28_4_;
          auVar209 = vshufps_avx(auVar249._0_16_,auVar249._0_16_,0);
          auVar247._16_16_ = auVar209;
          auVar247._0_16_ = auVar209;
          auVar360 = vcmpps_avx(auVar192,auVar247,2);
          auVar126 = vandps_avx(auVar360,auVar126);
          auVar274._0_4_ = (float)local_9c0._0_4_ + local_420._0_4_;
          auVar274._4_4_ = (float)local_9c0._4_4_ + local_420._4_4_;
          auVar274._8_4_ = fStack_9b8 + local_420._8_4_;
          auVar274._12_4_ = fStack_9b4 + local_420._12_4_;
          auVar274._16_4_ = fStack_9b0 + local_420._16_4_;
          auVar274._20_4_ = fStack_9ac + local_420._20_4_;
          auVar274._24_4_ = fStack_9a8 + local_420._24_4_;
          auVar274._28_4_ = fStack_9a4 + local_420._28_4_;
          auVar360 = vcmpps_avx(auVar274,auVar247,2);
          auVar273 = vandps_avx(auVar360,auVar273);
          auVar273 = vorps_avx(auVar126,auVar273);
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar273 >> 0xbf,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar273[0x1f] < '\0') {
            uVar108 = (ulong)uVar113;
            *(undefined1 (*) [32])(auStack_180 + uVar108 * 0x60) = auVar273;
            auVar126 = vblendvps_avx(_local_420,_local_460,auVar126);
            *(undefined1 (*) [32])(auStack_160 + uVar108 * 0x60) = auVar126;
            uVar107 = vmovlps_avx(local_630);
            (&uStack_140)[uVar108 * 0xc] = uVar107;
            auStack_138[uVar108 * 0x18] = local_cc8 + 1;
            uVar113 = uVar113 + 1;
          }
          auVar249 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          fVar144 = (float)local_9c0._0_4_;
          fVar404 = (float)local_9c0._4_4_;
          fVar407 = fStack_9b8;
          fVar410 = fStack_9b4;
          fVar413 = fStack_9b0;
          fVar417 = fStack_9ac;
          fVar425 = fStack_9a8;
          fVar283 = fStack_9a4;
        }
      }
    }
    do {
      uVar114 = uVar113;
      if (uVar114 == 0) {
        uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar143._4_4_ = uVar112;
        auVar143._0_4_ = uVar112;
        auVar143._8_4_ = uVar112;
        auVar143._12_4_ = uVar112;
        auVar143._16_4_ = uVar112;
        auVar143._20_4_ = uVar112;
        auVar143._24_4_ = uVar112;
        auVar143._28_4_ = uVar112;
        auVar126 = vcmpps_avx(local_360,auVar143,2);
        uVar109 = vmovmskps_avx(auVar126);
        uVar106 = (ulong)((uint)uVar106 - 1 & (uint)uVar106 & uVar109);
        goto LAB_00b32851;
      }
      uVar107 = (ulong)(uVar114 - 1);
      lVar110 = uVar107 * 0x60;
      auVar126 = *(undefined1 (*) [32])(auStack_160 + lVar110);
      auVar142._0_4_ = fVar144 + auVar126._0_4_;
      auVar142._4_4_ = fVar404 + auVar126._4_4_;
      auVar142._8_4_ = fVar407 + auVar126._8_4_;
      auVar142._12_4_ = fVar410 + auVar126._12_4_;
      auVar142._16_4_ = fVar413 + auVar126._16_4_;
      auVar142._20_4_ = fVar417 + auVar126._20_4_;
      auVar142._24_4_ = fVar425 + auVar126._24_4_;
      auVar142._28_4_ = fVar283 + auVar126._28_4_;
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar220._4_4_ = uVar112;
      auVar220._0_4_ = uVar112;
      auVar220._8_4_ = uVar112;
      auVar220._12_4_ = uVar112;
      auVar220._16_4_ = uVar112;
      auVar220._20_4_ = uVar112;
      auVar220._24_4_ = uVar112;
      auVar220._28_4_ = uVar112;
      auVar360 = vcmpps_avx(auVar142,auVar220,2);
      auVar273 = vandps_avx(auVar360,*(undefined1 (*) [32])(auStack_180 + lVar110));
      _local_7c0 = auVar273;
      auVar360 = *(undefined1 (*) [32])(auStack_180 + lVar110) & auVar360;
      uVar113 = uVar114 - 1;
    } while ((((((((auVar360 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar360 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar360 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar360 >> 0x7f,0) == '\0') &&
               (auVar360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar360 >> 0xbf,0) == '\0') &&
             (auVar360 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar360[0x1f]);
    auVar193._8_4_ = 0x7f800000;
    auVar193._0_8_ = 0x7f8000007f800000;
    auVar193._12_4_ = 0x7f800000;
    auVar193._16_4_ = 0x7f800000;
    auVar193._20_4_ = 0x7f800000;
    auVar193._24_4_ = 0x7f800000;
    auVar193._28_4_ = 0x7f800000;
    auVar126 = vblendvps_avx(auVar193,auVar126,auVar273);
    auVar360 = vshufps_avx(auVar126,auVar126,0xb1);
    auVar360 = vminps_avx(auVar126,auVar360);
    auVar24 = vshufpd_avx(auVar360,auVar360,5);
    auVar360 = vminps_avx(auVar360,auVar24);
    auVar24 = vperm2f128_avx(auVar360,auVar360,1);
    auVar360 = vminps_avx(auVar360,auVar24);
    auVar126 = vcmpps_avx(auVar126,auVar360,0);
    auVar360 = auVar273 & auVar126;
    if ((((((((auVar360 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar360 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar360 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar360 >> 0x7f,0) != '\0') ||
          (auVar360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar360 >> 0xbf,0) != '\0') ||
        (auVar360 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar360[0x1f] < '\0') {
      auVar273 = vandps_avx(auVar126,auVar273);
    }
    auVar160._8_8_ = 0;
    auVar160._0_8_ = (&uStack_140)[uVar107 * 0xc];
    local_cc8 = auStack_138[uVar107 * 0x18];
    uVar113 = vmovmskps_avx(auVar273);
    uVar105 = 0;
    if (uVar113 != 0) {
      for (; (uVar113 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
      }
    }
    *(undefined4 *)(local_7c0 + (ulong)uVar105 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar110) = _local_7c0;
    uVar113 = uVar114 - 1;
    if ((((((((_local_7c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7c0 >> 0x7f,0) != '\0') ||
          (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7c0 >> 0xbf,0) != '\0') ||
        (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7c0[0x1f] < '\0') {
      uVar113 = uVar114;
    }
    auVar209 = vshufps_avx(auVar160,auVar160,0);
    auVar202 = vshufps_avx(auVar160,auVar160,0x55);
    auVar202 = vsubps_avx(auVar202,auVar209);
    local_460._4_4_ = auVar209._4_4_ + auVar202._4_4_ * 0.14285715;
    local_460._0_4_ = auVar209._0_4_ + auVar202._0_4_ * 0.0;
    fStack_458 = auVar209._8_4_ + auVar202._8_4_ * 0.2857143;
    fStack_454 = auVar209._12_4_ + auVar202._12_4_ * 0.42857146;
    fStack_450 = auVar209._0_4_ + auVar202._0_4_ * 0.5714286;
    fStack_44c = auVar209._4_4_ + auVar202._4_4_ * 0.71428573;
    fStack_448 = auVar209._8_4_ + auVar202._8_4_ * 0.8571429;
    fStack_444 = auVar209._12_4_ + auVar202._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_460 + (ulong)uVar105 * 4);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }